

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_horizontal_14_quad_sse2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  ushort uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined6 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined6 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined6 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  undefined6 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  longlong lVar87;
  longlong lVar88;
  longlong lVar89;
  longlong lVar90;
  longlong lVar91;
  longlong lVar92;
  ulong uVar93;
  ulong uVar94;
  longlong lVar95;
  longlong lVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  longlong lVar99;
  longlong lVar100;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  ulong uVar104;
  longlong lVar105;
  longlong lVar106;
  undefined8 *puVar107;
  longlong *plVar108;
  ulong *puVar109;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  longlong in_RSI;
  ulong *in_RDI;
  undefined8 *in_R8;
  byte bVar111;
  short sVar112;
  byte bVar117;
  short sVar118;
  byte bVar120;
  short sVar121;
  byte bVar123;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_17;
  longlong extraout_XMM0_Qa_18;
  longlong extraout_XMM0_Qa_19;
  ulong extraout_XMM0_Qa_20;
  longlong extraout_XMM0_Qa_21;
  undefined8 extraout_XMM0_Qa_22;
  short sVar124;
  undefined8 extraout_XMM0_Qa_23;
  undefined8 extraout_XMM0_Qa_24;
  undefined8 extraout_XMM0_Qa_25;
  undefined8 extraout_XMM0_Qa_26;
  undefined8 extraout_XMM0_Qa_27;
  undefined8 extraout_XMM0_Qa_28;
  ulong extraout_XMM0_Qa_29;
  undefined8 extraout_XMM0_Qa_30;
  undefined8 extraout_XMM0_Qa_31;
  undefined8 extraout_XMM0_Qa_32;
  undefined8 extraout_XMM0_Qa_33;
  undefined8 extraout_XMM0_Qa_34;
  byte bVar126;
  short sVar127;
  byte bVar131;
  short sVar132;
  byte bVar134;
  short sVar135;
  byte bVar137;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  ulong uVar128;
  undefined1 auVar114 [16];
  ulong uVar113;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  undefined8 extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qa_13;
  undefined8 extraout_XMM0_Qa_14;
  byte bVar116;
  byte bVar119;
  byte bVar122;
  byte bVar125;
  undefined8 extraout_XMM0_Qa_15;
  undefined8 extraout_XMM0_Qa_16;
  ulong uVar129;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  undefined8 extraout_XMM0_Qb_11;
  undefined8 extraout_XMM0_Qb_12;
  undefined8 extraout_XMM0_Qb_13;
  undefined8 extraout_XMM0_Qb_14;
  byte bVar130;
  byte bVar133;
  byte bVar136;
  byte bVar139;
  undefined8 extraout_XMM0_Qb_15;
  undefined8 extraout_XMM0_Qb_16;
  undefined1 auVar115 [16];
  longlong extraout_XMM0_Qb_17;
  longlong extraout_XMM0_Qb_18;
  longlong extraout_XMM0_Qb_19;
  ulong extraout_XMM0_Qb_20;
  longlong extraout_XMM0_Qb_21;
  undefined8 extraout_XMM0_Qb_22;
  short sVar138;
  undefined8 extraout_XMM0_Qb_23;
  undefined8 extraout_XMM0_Qb_24;
  undefined8 extraout_XMM0_Qb_25;
  undefined8 extraout_XMM0_Qb_26;
  undefined8 extraout_XMM0_Qb_27;
  undefined8 extraout_XMM0_Qb_28;
  ulong extraout_XMM0_Qb_29;
  undefined8 extraout_XMM0_Qb_30;
  undefined8 extraout_XMM0_Qb_31;
  undefined8 extraout_XMM0_Qb_32;
  undefined8 extraout_XMM0_Qb_33;
  undefined8 extraout_XMM0_Qb_34;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i alVar140;
  __m128i f_hi;
  __m128i f_lo;
  __m128i q6_hi;
  __m128i q5_hi;
  __m128i q4_hi;
  __m128i p4_hi;
  __m128i p5_hi;
  __m128i p6_hi;
  __m128i q6_lo;
  __m128i q5_lo;
  __m128i q4_lo;
  __m128i p4_lo;
  __m128i p5_lo;
  __m128i p6_lo;
  __m128i eight;
  __m128i f8_hi;
  __m128i f8_lo;
  __m128i q3_hi;
  __m128i q2_hi;
  __m128i q1_hi;
  __m128i q0_hi;
  __m128i p0_hi;
  __m128i p1_hi;
  __m128i p2_hi;
  __m128i p3_hi;
  __m128i q3_lo;
  __m128i q2_lo;
  __m128i q1_lo;
  __m128i q0_lo;
  __m128i p0_lo;
  __m128i p1_lo;
  __m128i p2_lo;
  __m128i p3_lo;
  __m128i four;
  __m128i filter2;
  __m128i filter1;
  __m128i work_a;
  __m128i filt;
  __m128i ff_1;
  __m128i t7f;
  __m128i t1;
  __m128i t1f;
  __m128i te0;
  __m128i t80;
  __m128i t3;
  __m128i t4;
  __m128i work_1;
  __m128i work;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i ff;
  __m128i fe;
  __m128i abs_q1q0;
  __m128i abs_p1p0;
  __m128i max_abs_p1p0q1q0;
  __m128i oq2;
  __m128i oq1;
  __m128i oq0;
  __m128i op0;
  __m128i op1;
  __m128i op2;
  __m128i q5;
  __m128i q6;
  __m128i q4;
  __m128i q3;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i p3;
  __m128i p4;
  __m128i p5;
  __m128i p6;
  __m128i flat2;
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i thresh_v;
  __m128i limit_v;
  __m128i blimit_v;
  __m128i one;
  __m128i zero;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  undefined1 local_1c68;
  char cStack_1c67;
  undefined1 uStack_1c66;
  char cStack_1c65;
  undefined1 uStack_1c64;
  char cStack_1c63;
  undefined1 uStack_1c62;
  char cStack_1c61;
  undefined1 uStack_1c60;
  char cStack_1c5f;
  undefined1 uStack_1c5e;
  char cStack_1c5d;
  undefined1 uStack_1c5c;
  char cStack_1c5b;
  undefined1 uStack_1c5a;
  char cStack_1c59;
  undefined1 local_1c58;
  char cStack_1c57;
  undefined1 uStack_1c56;
  char cStack_1c55;
  undefined1 uStack_1c54;
  char cStack_1c53;
  undefined1 uStack_1c52;
  char cStack_1c51;
  undefined1 uStack_1c50;
  char cStack_1c4f;
  undefined1 uStack_1c4e;
  char cStack_1c4d;
  undefined1 uStack_1c4c;
  char cStack_1c4b;
  undefined1 uStack_1c4a;
  char cStack_1c49;
  undefined1 local_1c48;
  char cStack_1c47;
  undefined1 uStack_1c46;
  char cStack_1c45;
  undefined1 uStack_1c44;
  char cStack_1c43;
  undefined1 uStack_1c42;
  char cStack_1c41;
  undefined1 uStack_1c40;
  char cStack_1c3f;
  undefined1 uStack_1c3e;
  char cStack_1c3d;
  undefined1 uStack_1c3c;
  char cStack_1c3b;
  undefined1 uStack_1c3a;
  char cStack_1c39;
  undefined1 local_1c38;
  char cStack_1c37;
  undefined1 uStack_1c36;
  char cStack_1c35;
  undefined1 uStack_1c34;
  char cStack_1c33;
  undefined1 uStack_1c32;
  char cStack_1c31;
  undefined1 uStack_1c30;
  char cStack_1c2f;
  undefined1 uStack_1c2e;
  char cStack_1c2d;
  undefined1 uStack_1c2c;
  char cStack_1c2b;
  undefined1 uStack_1c2a;
  char cStack_1c29;
  undefined1 local_1c28;
  char cStack_1c27;
  undefined1 uStack_1c26;
  char cStack_1c25;
  undefined1 uStack_1c24;
  char cStack_1c23;
  undefined1 uStack_1c22;
  char cStack_1c21;
  undefined1 uStack_1c20;
  char cStack_1c1f;
  undefined1 uStack_1c1e;
  char cStack_1c1d;
  undefined1 uStack_1c1c;
  char cStack_1c1b;
  undefined1 uStack_1c1a;
  char cStack_1c19;
  undefined1 local_1c18;
  char cStack_1c17;
  undefined1 uStack_1c16;
  char cStack_1c15;
  undefined1 uStack_1c14;
  char cStack_1c13;
  undefined1 uStack_1c12;
  char cStack_1c11;
  undefined1 uStack_1c10;
  char cStack_1c0f;
  undefined1 uStack_1c0e;
  char cStack_1c0d;
  undefined1 uStack_1c0c;
  char cStack_1c0b;
  undefined1 uStack_1c0a;
  char cStack_1c09;
  undefined1 local_1c08;
  char cStack_1c07;
  undefined1 uStack_1c06;
  char cStack_1c05;
  undefined1 uStack_1c04;
  char cStack_1c03;
  undefined1 uStack_1c02;
  char cStack_1c01;
  undefined1 uStack_1c00;
  char cStack_1bff;
  undefined1 uStack_1bfe;
  char cStack_1bfd;
  undefined1 uStack_1bfc;
  char cStack_1bfb;
  undefined1 uStack_1bfa;
  char cStack_1bf9;
  undefined1 local_1bf8;
  char cStack_1bf7;
  undefined1 uStack_1bf6;
  char cStack_1bf5;
  undefined1 uStack_1bf4;
  char cStack_1bf3;
  undefined1 uStack_1bf2;
  char cStack_1bf1;
  undefined1 uStack_1bf0;
  char cStack_1bef;
  undefined1 uStack_1bee;
  char cStack_1bed;
  undefined1 uStack_1bec;
  char cStack_1beb;
  undefined1 uStack_1bea;
  char cStack_1be9;
  undefined1 local_1be8;
  char cStack_1be7;
  undefined1 uStack_1be6;
  char cStack_1be5;
  undefined1 uStack_1be4;
  char cStack_1be3;
  undefined1 uStack_1be2;
  char cStack_1be1;
  undefined1 uStack_1be0;
  char cStack_1bdf;
  undefined1 uStack_1bde;
  char cStack_1bdd;
  undefined1 uStack_1bdc;
  char cStack_1bdb;
  undefined1 uStack_1bda;
  char cStack_1bd9;
  undefined1 local_1bd8;
  char cStack_1bd7;
  undefined1 uStack_1bd6;
  char cStack_1bd5;
  undefined1 uStack_1bd4;
  char cStack_1bd3;
  undefined1 uStack_1bd2;
  char cStack_1bd1;
  undefined1 uStack_1bd0;
  char cStack_1bcf;
  undefined1 uStack_1bce;
  char cStack_1bcd;
  undefined1 uStack_1bcc;
  char cStack_1bcb;
  undefined1 uStack_1bca;
  char cStack_1bc9;
  undefined1 local_1bc8;
  char cStack_1bc7;
  undefined1 uStack_1bc6;
  char cStack_1bc5;
  undefined1 uStack_1bc4;
  char cStack_1bc3;
  undefined1 uStack_1bc2;
  char cStack_1bc1;
  undefined1 uStack_1bc0;
  char cStack_1bbf;
  undefined1 uStack_1bbe;
  char cStack_1bbd;
  undefined1 uStack_1bbc;
  char cStack_1bbb;
  undefined1 uStack_1bba;
  char cStack_1bb9;
  undefined1 local_1bb8;
  char cStack_1bb7;
  undefined1 uStack_1bb6;
  char cStack_1bb5;
  undefined1 uStack_1bb4;
  char cStack_1bb3;
  undefined1 uStack_1bb2;
  char cStack_1bb1;
  undefined1 uStack_1bb0;
  char cStack_1baf;
  undefined1 uStack_1bae;
  char cStack_1bad;
  undefined1 uStack_1bac;
  char cStack_1bab;
  undefined1 uStack_1baa;
  char cStack_1ba9;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined1 local_1b78;
  char cStack_1b77;
  undefined1 uStack_1b76;
  char cStack_1b75;
  undefined1 uStack_1b74;
  char cStack_1b73;
  undefined1 uStack_1b72;
  char cStack_1b71;
  undefined1 uStack_1b70;
  char cStack_1b6f;
  undefined1 uStack_1b6e;
  char cStack_1b6d;
  undefined1 uStack_1b6c;
  char cStack_1b6b;
  undefined1 uStack_1b6a;
  char cStack_1b69;
  undefined1 local_1b68;
  char cStack_1b67;
  undefined1 uStack_1b66;
  char cStack_1b65;
  undefined1 uStack_1b64;
  char cStack_1b63;
  undefined1 uStack_1b62;
  char cStack_1b61;
  undefined1 uStack_1b60;
  char cStack_1b5f;
  undefined1 uStack_1b5e;
  char cStack_1b5d;
  undefined1 uStack_1b5c;
  char cStack_1b5b;
  undefined1 uStack_1b5a;
  char cStack_1b59;
  undefined1 local_1b58;
  char cStack_1b57;
  undefined1 uStack_1b56;
  char cStack_1b55;
  undefined1 uStack_1b54;
  char cStack_1b53;
  undefined1 uStack_1b52;
  char cStack_1b51;
  undefined1 uStack_1b50;
  char cStack_1b4f;
  undefined1 uStack_1b4e;
  char cStack_1b4d;
  undefined1 uStack_1b4c;
  char cStack_1b4b;
  undefined1 uStack_1b4a;
  char cStack_1b49;
  undefined1 local_1b48;
  char cStack_1b47;
  undefined1 uStack_1b46;
  char cStack_1b45;
  undefined1 uStack_1b44;
  char cStack_1b43;
  undefined1 uStack_1b42;
  char cStack_1b41;
  undefined1 uStack_1b40;
  char cStack_1b3f;
  undefined1 uStack_1b3e;
  char cStack_1b3d;
  undefined1 uStack_1b3c;
  char cStack_1b3b;
  undefined1 uStack_1b3a;
  char cStack_1b39;
  undefined1 local_1b38;
  char cStack_1b37;
  undefined1 uStack_1b36;
  char cStack_1b35;
  undefined1 uStack_1b34;
  char cStack_1b33;
  undefined1 uStack_1b32;
  char cStack_1b31;
  undefined1 uStack_1b30;
  char cStack_1b2f;
  undefined1 uStack_1b2e;
  char cStack_1b2d;
  undefined1 uStack_1b2c;
  char cStack_1b2b;
  undefined1 uStack_1b2a;
  char cStack_1b29;
  undefined1 local_1b28;
  char cStack_1b27;
  undefined1 uStack_1b26;
  char cStack_1b25;
  undefined1 uStack_1b24;
  char cStack_1b23;
  undefined1 uStack_1b22;
  char cStack_1b21;
  undefined1 uStack_1b20;
  char cStack_1b1f;
  undefined1 uStack_1b1e;
  char cStack_1b1d;
  undefined1 uStack_1b1c;
  char cStack_1b1b;
  undefined1 uStack_1b1a;
  char cStack_1b19;
  undefined1 local_1b18;
  char cStack_1b17;
  undefined1 uStack_1b16;
  char cStack_1b15;
  undefined1 uStack_1b14;
  char cStack_1b13;
  undefined1 uStack_1b12;
  char cStack_1b11;
  undefined1 uStack_1b10;
  char cStack_1b0f;
  undefined1 uStack_1b0e;
  char cStack_1b0d;
  undefined1 uStack_1b0c;
  char cStack_1b0b;
  undefined1 uStack_1b0a;
  char cStack_1b09;
  undefined1 local_1b08;
  char cStack_1b07;
  undefined1 uStack_1b06;
  char cStack_1b05;
  undefined1 uStack_1b04;
  char cStack_1b03;
  undefined1 uStack_1b02;
  char cStack_1b01;
  undefined1 uStack_1b00;
  char cStack_1aff;
  undefined1 uStack_1afe;
  char cStack_1afd;
  undefined1 uStack_1afc;
  char cStack_1afb;
  undefined1 uStack_1afa;
  char cStack_1af9;
  undefined1 local_1af8;
  char cStack_1af7;
  undefined1 uStack_1af6;
  char cStack_1af5;
  undefined1 uStack_1af4;
  char cStack_1af3;
  undefined1 uStack_1af2;
  char cStack_1af1;
  undefined1 uStack_1af0;
  char cStack_1aef;
  undefined1 uStack_1aee;
  char cStack_1aed;
  undefined1 uStack_1aec;
  char cStack_1aeb;
  undefined1 uStack_1aea;
  char cStack_1ae9;
  undefined1 local_1ae8;
  char cStack_1ae7;
  undefined1 uStack_1ae6;
  char cStack_1ae5;
  undefined1 uStack_1ae4;
  char cStack_1ae3;
  undefined1 uStack_1ae2;
  char cStack_1ae1;
  undefined1 uStack_1ae0;
  char cStack_1adf;
  undefined1 uStack_1ade;
  char cStack_1add;
  undefined1 uStack_1adc;
  char cStack_1adb;
  undefined1 uStack_1ada;
  char cStack_1ad9;
  undefined1 local_1ad8;
  char cStack_1ad7;
  undefined1 uStack_1ad6;
  char cStack_1ad5;
  undefined1 uStack_1ad4;
  char cStack_1ad3;
  undefined1 uStack_1ad2;
  char cStack_1ad1;
  undefined1 uStack_1ad0;
  char cStack_1acf;
  undefined1 uStack_1ace;
  char cStack_1acd;
  undefined1 uStack_1acc;
  char cStack_1acb;
  undefined1 uStack_1aca;
  char cStack_1ac9;
  undefined1 local_1ac8;
  char cStack_1ac7;
  undefined1 uStack_1ac6;
  char cStack_1ac5;
  undefined1 uStack_1ac4;
  char cStack_1ac3;
  undefined1 uStack_1ac2;
  char cStack_1ac1;
  undefined1 uStack_1ac0;
  char cStack_1abf;
  undefined1 uStack_1abe;
  char cStack_1abd;
  undefined1 uStack_1abc;
  char cStack_1abb;
  undefined1 uStack_1aba;
  char cStack_1ab9;
  undefined1 local_1ab8;
  char cStack_1ab7;
  undefined1 uStack_1ab6;
  char cStack_1ab5;
  undefined1 uStack_1ab4;
  char cStack_1ab3;
  undefined1 uStack_1ab2;
  char cStack_1ab1;
  undefined1 uStack_1ab0;
  char cStack_1aaf;
  undefined1 uStack_1aae;
  char cStack_1aad;
  undefined1 uStack_1aac;
  char cStack_1aab;
  undefined1 uStack_1aaa;
  char cStack_1aa9;
  undefined1 local_1aa8;
  char cStack_1aa7;
  undefined1 uStack_1aa6;
  char cStack_1aa5;
  undefined1 uStack_1aa4;
  char cStack_1aa3;
  undefined1 uStack_1aa2;
  char cStack_1aa1;
  undefined1 uStack_1aa0;
  char cStack_1a9f;
  undefined1 uStack_1a9e;
  char cStack_1a9d;
  undefined1 uStack_1a9c;
  char cStack_1a9b;
  undefined1 uStack_1a9a;
  char cStack_1a99;
  undefined1 local_1a98;
  char cStack_1a97;
  undefined1 uStack_1a96;
  char cStack_1a95;
  undefined1 uStack_1a94;
  char cStack_1a93;
  undefined1 uStack_1a92;
  char cStack_1a91;
  undefined1 uStack_1a90;
  char cStack_1a8f;
  undefined1 uStack_1a8e;
  char cStack_1a8d;
  undefined1 uStack_1a8c;
  char cStack_1a8b;
  undefined1 uStack_1a8a;
  char cStack_1a89;
  undefined1 local_1a88;
  char cStack_1a87;
  undefined1 uStack_1a86;
  char cStack_1a85;
  undefined1 uStack_1a84;
  char cStack_1a83;
  undefined1 uStack_1a82;
  char cStack_1a81;
  undefined1 uStack_1a80;
  char cStack_1a7f;
  undefined1 uStack_1a7e;
  char cStack_1a7d;
  undefined1 uStack_1a7c;
  char cStack_1a7b;
  undefined1 uStack_1a7a;
  char cStack_1a79;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined1 local_1a28;
  undefined1 uStack_1a27;
  undefined1 uStack_1a26;
  undefined1 uStack_1a25;
  undefined1 uStack_1a24;
  undefined1 uStack_1a23;
  undefined1 uStack_1a22;
  undefined1 uStack_1a21;
  undefined1 uStack_1a20;
  undefined1 uStack_1a1f;
  undefined1 uStack_1a1e;
  undefined1 uStack_1a1d;
  undefined1 uStack_1a1c;
  undefined1 uStack_1a1b;
  undefined1 uStack_1a1a;
  undefined1 uStack_1a19;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  byte local_19a8;
  byte bStack_19a7;
  byte bStack_19a6;
  byte bStack_19a5;
  byte bStack_19a4;
  byte bStack_19a3;
  byte bStack_19a2;
  byte bStack_19a1;
  byte bStack_19a0;
  byte bStack_199f;
  byte bStack_199e;
  byte bStack_199d;
  byte bStack_199c;
  byte bStack_199b;
  byte bStack_199a;
  byte bStack_1999;
  byte local_1998;
  byte bStack_1997;
  byte bStack_1996;
  byte bStack_1995;
  byte bStack_1994;
  byte bStack_1993;
  byte bStack_1992;
  byte bStack_1991;
  byte bStack_1990;
  byte bStack_198f;
  byte bStack_198e;
  byte bStack_198d;
  byte bStack_198c;
  byte bStack_198b;
  byte bStack_198a;
  byte bStack_1989;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined1 local_1978 [16];
  undefined1 local_1968;
  undefined1 uStack_1967;
  undefined1 uStack_1966;
  undefined1 uStack_1965;
  undefined1 uStack_1964;
  undefined1 uStack_1963;
  undefined1 uStack_1962;
  undefined1 uStack_1961;
  undefined1 uStack_1960;
  undefined1 uStack_195f;
  undefined1 uStack_195e;
  undefined1 uStack_195d;
  undefined1 uStack_195c;
  undefined1 uStack_195b;
  undefined1 uStack_195a;
  undefined1 uStack_1959;
  ulong local_1958;
  ulong uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  byte local_1928;
  byte bStack_1927;
  byte bStack_1926;
  byte bStack_1925;
  byte bStack_1924;
  byte bStack_1923;
  byte bStack_1922;
  byte bStack_1921;
  byte bStack_1920;
  byte bStack_191f;
  byte bStack_191e;
  byte bStack_191d;
  byte bStack_191c;
  byte bStack_191b;
  byte bStack_191a;
  byte bStack_1919;
  longlong local_1918 [2];
  ulong local_1908;
  ulong uStack_1900;
  ulong local_18f8;
  ulong uStack_18f0;
  ulong local_18e8;
  ulong uStack_18e0;
  ulong local_18d8;
  ulong uStack_18d0;
  longlong local_18c8;
  longlong lStack_18c0;
  longlong local_18b8;
  longlong lStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  longlong local_1898;
  longlong lStack_1890;
  longlong local_1888;
  longlong lStack_1880;
  longlong local_1878;
  longlong lStack_1870;
  ulong local_1868;
  ulong uStack_1860;
  ulong local_1858;
  ulong uStack_1850;
  ulong local_1848;
  ulong uStack_1840;
  ulong local_1838;
  ulong uStack_1830;
  longlong local_1828;
  longlong lStack_1820;
  longlong local_1818;
  longlong lStack_1810;
  longlong local_1808;
  longlong lStack_1800;
  longlong local_17f8;
  longlong lStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined1 local_17c8 [2];
  byte bStack_17c6;
  byte bStack_17c5;
  byte bStack_17c4;
  byte bStack_17c3;
  byte bStack_17c2;
  byte bStack_17c1;
  undefined8 uStack_17c0;
  ulong local_17b8;
  ulong uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  int local_1724;
  ulong *local_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  longlong lStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  longlong lStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  longlong lStack_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  longlong lStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  longlong lStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  longlong lStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  ulong uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  ulong uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  ulong uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  ulong uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  longlong lStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  longlong lStack_1550;
  undefined8 *local_1528;
  longlong *local_1520;
  longlong *local_1518;
  longlong *local_1510;
  longlong *local_1508;
  ulong *local_1500;
  ulong *local_14f0;
  ulong *local_14e8;
  longlong *local_14e0;
  longlong *local_14d8;
  longlong *local_14d0;
  longlong *local_14c8;
  undefined8 *local_14c0;
  undefined8 *local_1340;
  undefined8 *local_1320;
  undefined8 *local_1300;
  undefined8 *local_12e0;
  ulong *local_12c0;
  undefined8 *local_12a0;
  undefined8 *local_1280;
  undefined8 *local_1260;
  undefined8 *local_1240;
  undefined8 *local_1220;
  undefined8 *local_1200;
  undefined1 local_11f1;
  undefined1 local_11f0;
  undefined1 local_11ef;
  undefined1 local_11ee;
  undefined1 local_11ed;
  undefined1 local_11ec;
  undefined1 local_11eb;
  undefined1 local_11ea;
  undefined1 local_11e9;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  byte local_1088;
  byte bStack_1087;
  byte bStack_1086;
  byte bStack_1085;
  byte bStack_1084;
  byte bStack_1083;
  byte bStack_1082;
  byte bStack_1081;
  byte bStack_1080;
  byte bStack_107f;
  byte bStack_107e;
  byte bStack_107d;
  byte bStack_107c;
  byte bStack_107b;
  byte bStack_107a;
  byte bStack_1079;
  byte local_1078;
  byte bStack_1077;
  byte bStack_1076;
  byte bStack_1075;
  byte bStack_1074;
  byte bStack_1073;
  byte bStack_1072;
  byte bStack_1071;
  byte bStack_1070;
  byte bStack_106f;
  byte bStack_106e;
  byte bStack_106d;
  byte bStack_106c;
  byte bStack_106b;
  byte bStack_106a;
  byte bStack_1069;
  longlong local_1068;
  longlong lStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  byte local_1048;
  byte bStack_1047;
  byte bStack_1046;
  byte bStack_1045;
  byte bStack_1044;
  byte bStack_1043;
  byte bStack_1042;
  byte bStack_1041;
  byte bStack_1040;
  byte bStack_103f;
  byte bStack_103e;
  byte bStack_103d;
  byte bStack_103c;
  byte bStack_103b;
  byte bStack_103a;
  byte bStack_1039;
  byte local_1038;
  byte bStack_1037;
  byte bStack_1036;
  byte bStack_1035;
  byte bStack_1034;
  byte bStack_1033;
  byte bStack_1032;
  byte bStack_1031;
  byte bStack_1030;
  byte bStack_102f;
  byte bStack_102e;
  byte bStack_102d;
  byte bStack_102c;
  byte bStack_102b;
  byte bStack_102a;
  byte bStack_1029;
  byte local_1028;
  byte bStack_1027;
  byte bStack_1026;
  byte bStack_1025;
  byte bStack_1024;
  byte bStack_1023;
  byte bStack_1022;
  byte bStack_1021;
  byte bStack_1020;
  byte bStack_101f;
  byte bStack_101e;
  byte bStack_101d;
  byte bStack_101c;
  byte bStack_101b;
  byte bStack_101a;
  byte bStack_1019;
  byte local_1018;
  byte bStack_1017;
  byte bStack_1016;
  byte bStack_1015;
  byte bStack_1014;
  byte bStack_1013;
  byte bStack_1012;
  byte bStack_1011;
  byte bStack_1010;
  byte bStack_100f;
  byte bStack_100e;
  byte bStack_100d;
  byte bStack_100c;
  byte bStack_100b;
  byte bStack_100a;
  byte bStack_1009;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  byte local_fe8;
  byte bStack_fe7;
  byte bStack_fe6;
  byte bStack_fe5;
  byte bStack_fe4;
  byte bStack_fe3;
  byte bStack_fe2;
  byte bStack_fe1;
  byte bStack_fe0;
  byte bStack_fdf;
  byte bStack_fde;
  byte bStack_fdd;
  byte bStack_fdc;
  byte bStack_fdb;
  byte bStack_fda;
  byte bStack_fd9;
  byte local_fd8;
  byte bStack_fd7;
  byte bStack_fd6;
  byte bStack_fd5;
  byte bStack_fd4;
  byte bStack_fd3;
  byte bStack_fd2;
  byte bStack_fd1;
  byte bStack_fd0;
  byte bStack_fcf;
  byte bStack_fce;
  byte bStack_fcd;
  byte bStack_fcc;
  byte bStack_fcb;
  byte bStack_fca;
  byte bStack_fc9;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  byte local_fa8;
  byte bStack_fa7;
  byte bStack_fa6;
  byte bStack_fa5;
  byte bStack_fa4;
  byte bStack_fa3;
  byte bStack_fa2;
  byte bStack_fa1;
  byte bStack_fa0;
  byte bStack_f9f;
  byte bStack_f9e;
  byte bStack_f9d;
  byte bStack_f9c;
  byte bStack_f9b;
  byte bStack_f9a;
  byte bStack_f99;
  byte local_f98;
  byte bStack_f97;
  byte bStack_f96;
  byte bStack_f95;
  byte bStack_f94;
  byte bStack_f93;
  byte bStack_f92;
  byte bStack_f91;
  byte bStack_f90;
  byte bStack_f8f;
  byte bStack_f8e;
  byte bStack_f8d;
  byte bStack_f8c;
  byte bStack_f8b;
  byte bStack_f8a;
  byte bStack_f89;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  byte local_f68;
  byte bStack_f67;
  byte bStack_f66;
  byte bStack_f65;
  byte bStack_f64;
  byte bStack_f63;
  byte bStack_f62;
  byte bStack_f61;
  byte bStack_f60;
  byte bStack_f5f;
  byte bStack_f5e;
  byte bStack_f5d;
  byte bStack_f5c;
  byte bStack_f5b;
  byte bStack_f5a;
  byte bStack_f59;
  byte local_f58;
  byte bStack_f57;
  byte bStack_f56;
  byte bStack_f55;
  byte bStack_f54;
  byte bStack_f53;
  byte bStack_f52;
  byte bStack_f51;
  byte bStack_f50;
  byte bStack_f4f;
  byte bStack_f4e;
  byte bStack_f4d;
  byte bStack_f4c;
  byte bStack_f4b;
  byte bStack_f4a;
  byte bStack_f49;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  byte local_f28;
  byte bStack_f27;
  byte bStack_f26;
  byte bStack_f25;
  byte bStack_f24;
  byte bStack_f23;
  byte bStack_f22;
  byte bStack_f21;
  byte bStack_f20;
  byte bStack_f1f;
  byte bStack_f1e;
  byte bStack_f1d;
  byte bStack_f1c;
  byte bStack_f1b;
  byte bStack_f1a;
  byte bStack_f19;
  byte local_f18;
  byte bStack_f17;
  byte bStack_f16;
  byte bStack_f15;
  byte bStack_f14;
  byte bStack_f13;
  byte bStack_f12;
  byte bStack_f11;
  byte bStack_f10;
  byte bStack_f0f;
  byte bStack_f0e;
  byte bStack_f0d;
  byte bStack_f0c;
  byte bStack_f0b;
  byte bStack_f0a;
  byte bStack_f09;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined4 local_e7c;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined4 local_e5c;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined4 local_e3c;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined4 local_e1c;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  ulong local_df8;
  ulong uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  ulong local_dd8;
  ulong uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  ulong local_db8;
  ulong uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  ulong local_d98;
  ulong uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  ulong local_d78;
  ulong uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  ulong local_d58;
  ulong uStack_d50;
  ulong local_d48;
  ulong uStack_d40;
  ulong local_d38;
  ulong uStack_d30;
  ulong local_d28;
  ulong uStack_d20;
  undefined1 local_d18 [16];
  ulong local_d08;
  ulong uStack_d00;
  ulong local_cf8;
  ulong uStack_cf0;
  ulong local_ce8;
  ulong uStack_ce0;
  ulong local_cd8;
  ulong uStack_cd0;
  ulong local_cc8;
  ulong uStack_cc0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  longlong local_c78;
  longlong lStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  longlong local_c58;
  longlong lStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined1 local_c18 [16];
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined1 local_bf8 [16];
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined1 local_bd8 [16];
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined1 local_bb8 [16];
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined1 local_b98 [16];
  undefined8 local_b88;
  undefined8 uStack_b80;
  char local_b78;
  char cStack_b77;
  char cStack_b76;
  char cStack_b75;
  char cStack_b74;
  char cStack_b73;
  char cStack_b72;
  char cStack_b71;
  char cStack_b70;
  char cStack_b6f;
  char cStack_b6e;
  char cStack_b6d;
  char cStack_b6c;
  char cStack_b6b;
  char cStack_b6a;
  char cStack_b69;
  undefined8 local_b68;
  undefined8 uStack_b60;
  ulong local_b58;
  ulong uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  ulong local_b38;
  ulong uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  ulong local_b18;
  ulong uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  ulong local_af8;
  ulong uStack_af0;
  ulong local_ae8;
  ulong uStack_ae0;
  char local_ad8;
  char cStack_ad7;
  char cStack_ad6;
  char cStack_ad5;
  char cStack_ad4;
  char cStack_ad3;
  char cStack_ad2;
  char cStack_ad1;
  char cStack_ad0;
  char cStack_acf;
  char cStack_ace;
  char cStack_acd;
  char cStack_acc;
  char cStack_acb;
  char cStack_aca;
  char cStack_ac9;
  char local_ac8;
  char cStack_ac7;
  char cStack_ac6;
  char cStack_ac5;
  char cStack_ac4;
  char cStack_ac3;
  char cStack_ac2;
  char cStack_ac1;
  char cStack_ac0;
  char cStack_abf;
  char cStack_abe;
  char cStack_abd;
  char cStack_abc;
  char cStack_abb;
  char cStack_aba;
  byte bStack_ab9;
  char local_ab8;
  char cStack_ab7;
  char cStack_ab6;
  char cStack_ab5;
  char cStack_ab4;
  char cStack_ab3;
  char cStack_ab2;
  char cStack_ab1;
  char cStack_ab0;
  char cStack_aaf;
  char cStack_aae;
  char cStack_aad;
  char cStack_aac;
  char cStack_aab;
  char cStack_aaa;
  byte bStack_aa9;
  char local_aa8;
  char cStack_aa7;
  char cStack_aa6;
  char cStack_aa5;
  char cStack_aa4;
  char cStack_aa3;
  char cStack_aa2;
  char cStack_aa1;
  char cStack_aa0;
  char cStack_a9f;
  char cStack_a9e;
  char cStack_a9d;
  char cStack_a9c;
  char cStack_a9b;
  char cStack_a9a;
  byte bStack_a99;
  ulong local_a98;
  ulong uStack_a90;
  ulong local_a88;
  ulong uStack_a80;
  ulong local_a78;
  ulong uStack_a70;
  ulong local_a68;
  ulong uStack_a60;
  ulong local_a58;
  ulong uStack_a50;
  ulong local_a48;
  ulong uStack_a40;
  ulong local_a38;
  ulong uStack_a30;
  ulong local_a28;
  ulong uStack_a20;
  ulong local_a18;
  ulong uStack_a10;
  ulong local_a08;
  ulong uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  ulong local_9e8;
  ulong uStack_9e0;
  ulong local_9d8;
  ulong uStack_9d0;
  ulong local_9c8;
  ulong uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  ulong local_9a8;
  ulong uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  ulong local_988;
  ulong uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  ulong local_928;
  ulong uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  ulong local_8b8;
  ulong uStack_8b0;
  ulong local_8a8;
  ulong uStack_8a0;
  ulong local_898;
  ulong uStack_890;
  ulong local_888;
  ulong uStack_880;
  ulong local_878;
  ulong uStack_870;
  ulong local_868;
  ulong uStack_860;
  ulong local_858;
  ulong uStack_850;
  ulong local_848;
  ulong uStack_840;
  undefined2 local_82c;
  undefined2 local_82a;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  longlong local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  longlong local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  longlong local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  longlong local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  longlong local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  longlong local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  ulong local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  ulong local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  ulong local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  ulong local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  longlong local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  longlong local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  longlong local_658;
  longlong lStack_650;
  longlong local_648;
  longlong lStack_640;
  short local_638;
  short sStack_636;
  short sStack_634;
  short sStack_632;
  short sStack_630;
  short sStack_62e;
  short sStack_62c;
  short sStack_62a;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  short local_608;
  short sStack_606;
  short sStack_604;
  short sStack_602;
  short sStack_600;
  short sStack_5fe;
  short sStack_5fc;
  short sStack_5fa;
  short local_5f8;
  short sStack_5f6;
  short sStack_5f4;
  short sStack_5f2;
  short sStack_5f0;
  short sStack_5ee;
  short sStack_5ec;
  short sStack_5ea;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  longlong local_5c8;
  longlong lStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  longlong local_5a8;
  longlong lStack_5a0;
  undefined1 local_598 [16];
  longlong local_588;
  longlong lStack_580;
  undefined1 local_578 [16];
  undefined8 local_568;
  undefined8 uStack_560;
  longlong local_558;
  longlong lStack_550;
  longlong local_548;
  longlong lStack_540;
  short local_538;
  short sStack_536;
  short sStack_534;
  short sStack_532;
  short sStack_530;
  short sStack_52e;
  short sStack_52c;
  short sStack_52a;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  short local_508;
  short sStack_506;
  short sStack_504;
  short sStack_502;
  short sStack_500;
  short sStack_4fe;
  short sStack_4fc;
  short sStack_4fa;
  short local_4f8;
  short sStack_4f6;
  short sStack_4f4;
  short sStack_4f2;
  short sStack_4f0;
  short sStack_4ee;
  short sStack_4ec;
  short sStack_4ea;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  longlong local_4c8;
  longlong lStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  longlong local_4a8;
  longlong lStack_4a0;
  undefined1 local_498 [16];
  longlong local_488;
  longlong lStack_480;
  undefined1 local_478 [16];
  longlong local_468;
  longlong lStack_460;
  short local_458;
  short sStack_456;
  short sStack_454;
  short sStack_452;
  short sStack_450;
  short sStack_44e;
  short sStack_44c;
  short sStack_44a;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  short local_428;
  short sStack_426;
  short sStack_424;
  short sStack_422;
  short sStack_420;
  short sStack_41e;
  short sStack_41c;
  short sStack_41a;
  short local_418;
  short sStack_416;
  short sStack_414;
  short sStack_412;
  short sStack_410;
  short sStack_40e;
  short sStack_40c;
  short sStack_40a;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  longlong local_3e8;
  longlong lStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  short local_3c8;
  short sStack_3c6;
  short sStack_3c4;
  short sStack_3c2;
  short sStack_3c0;
  short sStack_3be;
  short sStack_3bc;
  short sStack_3ba;
  short local_3b8;
  short sStack_3b6;
  short sStack_3b4;
  short sStack_3b2;
  short sStack_3b0;
  short sStack_3ae;
  short sStack_3ac;
  short sStack_3aa;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  longlong local_368;
  longlong lStack_360;
  short local_358;
  short sStack_356;
  short sStack_354;
  short sStack_352;
  short sStack_350;
  short sStack_34e;
  short sStack_34c;
  short sStack_34a;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  short local_328;
  short sStack_326;
  short sStack_324;
  short sStack_322;
  short sStack_320;
  short sStack_31e;
  short sStack_31c;
  short sStack_31a;
  short local_318;
  short sStack_316;
  short sStack_314;
  short sStack_312;
  short sStack_310;
  short sStack_30e;
  short sStack_30c;
  short sStack_30a;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  longlong local_2e8;
  longlong lStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  short local_2c8;
  short sStack_2c6;
  short sStack_2c4;
  short sStack_2c2;
  short sStack_2c0;
  short sStack_2be;
  short sStack_2bc;
  short sStack_2ba;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined1 local_258 [16];
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 local_238 [16];
  undefined4 local_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined4 local_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined4 local_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined4 local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158;
  undefined1 local_157;
  undefined1 local_156;
  undefined1 local_155;
  undefined1 local_154;
  undefined1 local_153;
  undefined1 local_152;
  undefined1 local_151;
  undefined1 local_150;
  undefined1 local_14f;
  undefined1 local_14e;
  undefined1 local_14d;
  undefined1 local_14c;
  undefined1 local_14b;
  undefined1 local_14a;
  undefined1 local_149;
  ulong local_148;
  ulong uStack_140;
  undefined1 local_138;
  undefined1 local_137;
  undefined1 local_136;
  undefined1 local_135;
  undefined1 local_134;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  undefined1 local_130;
  undefined1 local_12f;
  undefined1 local_12e;
  undefined1 local_12d;
  undefined1 local_12c;
  undefined1 local_12b;
  undefined1 local_12a;
  undefined1 local_129;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118;
  undefined1 local_117;
  undefined1 local_116;
  undefined1 local_115;
  undefined1 local_114;
  undefined1 local_113;
  undefined1 local_112;
  undefined1 local_111;
  undefined1 local_110;
  undefined1 local_10f;
  undefined1 local_10e;
  undefined1 local_10d;
  undefined1 local_10c;
  undefined1 local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8;
  undefined1 local_f7;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_f4;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined1 local_f0;
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  undefined1 local_b0;
  undefined1 local_af;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78;
  undefined1 local_77;
  undefined1 local_76;
  undefined1 local_75;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  undefined1 local_70;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  ulong uVar110;
  
  local_1724 = (int)in_RSI;
  local_1718 = 0;
  uStack_1710 = 0;
  local_1758 = 0;
  uStack_1750 = 0;
  local_11e9 = 1;
  local_149 = 1;
  local_14a = 1;
  local_14b = 1;
  local_14c = 1;
  local_14d = 1;
  local_14e = 1;
  local_14f = 1;
  local_150 = 1;
  local_151 = 1;
  local_152 = 1;
  local_153 = 1;
  local_154 = 1;
  local_155 = 1;
  local_156 = 1;
  local_157 = 1;
  local_158 = 1;
  local_1768 = 0x101010101010101;
  uStack_1760 = 0x101010101010101;
  local_1778 = *in_RDX;
  uStack_1770 = in_RDX[1];
  local_1788 = *in_RCX;
  uStack_1780 = in_RCX[1];
  local_1798 = *in_R8;
  uStack_1790 = in_R8[1];
  local_14c0 = (undefined8 *)((long)in_RDI - (long)(local_1724 * 7));
  local_17e8 = *local_14c0;
  uStack_17e0 = local_14c0[1];
  local_14c8 = (longlong *)((long)in_RDI - (long)(local_1724 * 6));
  local_17f8 = *local_14c8;
  lStack_17f0 = local_14c8[1];
  local_14d0 = (longlong *)((long)in_RDI - (long)(local_1724 * 5));
  local_1808 = *local_14d0;
  lStack_1800 = local_14d0[1];
  local_14d8 = (longlong *)((long)in_RDI - (long)(local_1724 << 2));
  local_1818 = *local_14d8;
  lStack_1810 = local_14d8[1];
  local_14e0 = (longlong *)((long)in_RDI - (long)(local_1724 * 3));
  local_1828 = *local_14e0;
  lStack_1820 = local_14e0[1];
  local_14e8 = (ulong *)((long)in_RDI - (long)(local_1724 * 2));
  local_1838 = *local_14e8;
  uStack_1830 = local_14e8[1];
  local_14f0 = (ulong *)((long)in_RDI - (long)local_1724);
  local_1848 = *local_14f0;
  uStack_1840 = local_14f0[1];
  local_1858 = *in_RDI;
  uStack_1850 = in_RDI[1];
  local_1500 = (ulong *)((long)in_RDI + (long)local_1724);
  local_1868 = *local_1500;
  uStack_1860 = local_1500[1];
  local_1508 = (longlong *)((long)in_RDI + (long)(local_1724 * 2));
  local_1878 = *local_1508;
  lStack_1870 = local_1508[1];
  local_1510 = (longlong *)((long)in_RDI + (long)(local_1724 * 3));
  local_1888 = *local_1510;
  lStack_1880 = local_1510[1];
  local_1518 = (longlong *)((long)in_RDI + (long)(local_1724 << 2));
  local_1898 = *local_1518;
  lStack_1890 = local_1518[1];
  local_1520 = (longlong *)((long)in_RDI + (long)(local_1724 * 5));
  local_18b8 = *local_1520;
  lStack_18b0 = local_1520[1];
  b[0] = (ulong)(uint)(local_1724 * 2);
  b[1] = (long)(local_1724 * 6);
  local_1528 = (undefined8 *)((long)in_RDI + b[1]);
  local_18a8 = *local_1528;
  uStack_18a0 = local_1528[1];
  alVar140[1] = in_RSI;
  alVar140[0] = (longlong)in_RDI;
  local_1720 = in_RDI;
  local_168 = local_1768;
  uStack_160 = uStack_1760;
  alVar140 = abs_diff(alVar140,b);
  b_00[0] = alVar140[1];
  a[1] = in_RSI;
  a[0] = (longlong)in_RDI;
  b_00[1] = b[1];
  local_1938 = extraout_XMM0_Qa;
  uStack_1930 = extraout_XMM0_Qb;
  alVar140 = abs_diff(a,b_00);
  b_01[0] = alVar140[1];
  local_11ea = 0xfe;
  local_129 = 0xfe;
  local_12a = 0xfe;
  local_12b = 0xfe;
  local_12c = 0xfe;
  local_12d = 0xfe;
  local_12e = 0xfe;
  local_12f = 0xfe;
  local_130 = 0xfe;
  local_131 = 0xfe;
  local_132 = 0xfe;
  local_133 = 0xfe;
  local_134 = 0xfe;
  local_135 = 0xfe;
  local_136 = 0xfe;
  local_137 = 0xfe;
  local_138 = 0xfe;
  local_1958 = 0xfefefefefefefefe;
  uStack_1950 = 0xfefefefefefefefe;
  local_10b8 = local_1758;
  uStack_10b0 = uStack_1750;
  local_10c8 = local_1758;
  uStack_10c0 = uStack_1750;
  local_1968 = 0xff;
  uStack_1967 = 0xff;
  uStack_1966 = 0xff;
  uStack_1965 = 0xff;
  uStack_1964 = 0xff;
  uStack_1963 = 0xff;
  uStack_1962 = 0xff;
  uStack_1961 = 0xff;
  uStack_1960 = 0xff;
  uStack_195f = 0xff;
  uStack_195e = 0xff;
  uStack_195d = 0xff;
  uStack_195c = 0xff;
  uStack_195b = 0xff;
  uStack_195a = 0xff;
  uStack_1959 = 0xff;
  a_00[1] = in_RSI;
  a_00[0] = (longlong)in_RDI;
  b_01[1] = b[1];
  local_1948 = extraout_XMM0_Qa_00;
  uStack_1940 = extraout_XMM0_Qb_00;
  local_148 = local_1958;
  uStack_140 = uStack_1950;
  alVar140 = abs_diff(a_00,b_01);
  b_02[0] = alVar140[1];
  a_01[1] = in_RSI;
  a_01[0] = (longlong)in_RDI;
  b_02[1] = b[1];
  local_1978._0_8_ = extraout_XMM0_Qa_01;
  local_1978._8_8_ = extraout_XMM0_Qb_01;
  alVar140 = abs_diff(a_01,b_02);
  b_03[0] = alVar140[1];
  local_ed8 = local_1938;
  uVar11 = local_ed8;
  uStack_ed0 = uStack_1930;
  uVar13 = uStack_ed0;
  local_ee8 = local_1948;
  uVar8 = local_ee8;
  uStack_ee0 = uStack_1940;
  uVar9 = uStack_ee0;
  local_ed8._0_1_ = (byte)local_1938;
  local_ed8._1_1_ = (byte)((ulong)local_1938 >> 8);
  local_ed8._2_1_ = (byte)((ulong)local_1938 >> 0x10);
  local_ed8._3_1_ = (byte)((ulong)local_1938 >> 0x18);
  local_ed8._4_1_ = (byte)((ulong)local_1938 >> 0x20);
  local_ed8._5_1_ = (byte)((ulong)local_1938 >> 0x28);
  local_ed8._6_1_ = (byte)((ulong)local_1938 >> 0x30);
  local_ed8._7_1_ = (byte)((ulong)local_1938 >> 0x38);
  uStack_ed0._0_1_ = (byte)uStack_1930;
  uStack_ed0._1_1_ = (byte)((ulong)uStack_1930 >> 8);
  uStack_ed0._2_1_ = (byte)((ulong)uStack_1930 >> 0x10);
  uStack_ed0._3_1_ = (byte)((ulong)uStack_1930 >> 0x18);
  uStack_ed0._4_1_ = (byte)((ulong)uStack_1930 >> 0x20);
  uStack_ed0._5_1_ = (byte)((ulong)uStack_1930 >> 0x28);
  uStack_ed0._6_1_ = (byte)((ulong)uStack_1930 >> 0x30);
  uStack_ed0._7_1_ = (byte)((ulong)uStack_1930 >> 0x38);
  local_ee8._0_1_ = (byte)local_1948;
  local_ee8._1_1_ = (byte)((ulong)local_1948 >> 8);
  local_ee8._2_1_ = (byte)((ulong)local_1948 >> 0x10);
  local_ee8._3_1_ = (byte)((ulong)local_1948 >> 0x18);
  local_ee8._4_1_ = (byte)((ulong)local_1948 >> 0x20);
  local_ee8._5_1_ = (byte)((ulong)local_1948 >> 0x28);
  local_ee8._6_1_ = (byte)((ulong)local_1948 >> 0x30);
  local_ee8._7_1_ = (byte)((ulong)local_1948 >> 0x38);
  uStack_ee0._0_1_ = (byte)uStack_1940;
  uStack_ee0._1_1_ = (byte)((ulong)uStack_1940 >> 8);
  uStack_ee0._2_1_ = (byte)((ulong)uStack_1940 >> 0x10);
  uStack_ee0._3_1_ = (byte)((ulong)uStack_1940 >> 0x18);
  uStack_ee0._4_1_ = (byte)((ulong)uStack_1940 >> 0x20);
  uStack_ee0._5_1_ = (byte)((ulong)uStack_1940 >> 0x28);
  uStack_ee0._6_1_ = (byte)((ulong)uStack_1940 >> 0x30);
  uStack_ee0._7_1_ = (byte)((ulong)uStack_1940 >> 0x38);
  local_1928 = ((byte)local_ed8 < (byte)local_ee8) * (byte)local_ee8 |
               ((byte)local_ed8 >= (byte)local_ee8) * (byte)local_ed8;
  bStack_1927 = (local_ed8._1_1_ < local_ee8._1_1_) * local_ee8._1_1_ |
                (local_ed8._1_1_ >= local_ee8._1_1_) * local_ed8._1_1_;
  bStack_1926 = (local_ed8._2_1_ < local_ee8._2_1_) * local_ee8._2_1_ |
                (local_ed8._2_1_ >= local_ee8._2_1_) * local_ed8._2_1_;
  bStack_1925 = (local_ed8._3_1_ < local_ee8._3_1_) * local_ee8._3_1_ |
                (local_ed8._3_1_ >= local_ee8._3_1_) * local_ed8._3_1_;
  bStack_1924 = (local_ed8._4_1_ < local_ee8._4_1_) * local_ee8._4_1_ |
                (local_ed8._4_1_ >= local_ee8._4_1_) * local_ed8._4_1_;
  bStack_1923 = (local_ed8._5_1_ < local_ee8._5_1_) * local_ee8._5_1_ |
                (local_ed8._5_1_ >= local_ee8._5_1_) * local_ed8._5_1_;
  bStack_1922 = (local_ed8._6_1_ < local_ee8._6_1_) * local_ee8._6_1_ |
                (local_ed8._6_1_ >= local_ee8._6_1_) * local_ed8._6_1_;
  bStack_1921 = (local_ed8._7_1_ < local_ee8._7_1_) * local_ee8._7_1_ |
                (local_ed8._7_1_ >= local_ee8._7_1_) * local_ed8._7_1_;
  bStack_1920 = ((byte)uStack_ed0 < (byte)uStack_ee0) * (byte)uStack_ee0 |
                ((byte)uStack_ed0 >= (byte)uStack_ee0) * (byte)uStack_ed0;
  bStack_191f = (uStack_ed0._1_1_ < uStack_ee0._1_1_) * uStack_ee0._1_1_ |
                (uStack_ed0._1_1_ >= uStack_ee0._1_1_) * uStack_ed0._1_1_;
  bStack_191e = (uStack_ed0._2_1_ < uStack_ee0._2_1_) * uStack_ee0._2_1_ |
                (uStack_ed0._2_1_ >= uStack_ee0._2_1_) * uStack_ed0._2_1_;
  bStack_191d = (uStack_ed0._3_1_ < uStack_ee0._3_1_) * uStack_ee0._3_1_ |
                (uStack_ed0._3_1_ >= uStack_ee0._3_1_) * uStack_ed0._3_1_;
  bStack_191c = (uStack_ed0._4_1_ < uStack_ee0._4_1_) * uStack_ee0._4_1_ |
                (uStack_ed0._4_1_ >= uStack_ee0._4_1_) * uStack_ed0._4_1_;
  bStack_191b = (uStack_ed0._5_1_ < uStack_ee0._5_1_) * uStack_ee0._5_1_ |
                (uStack_ed0._5_1_ >= uStack_ee0._5_1_) * uStack_ed0._5_1_;
  bStack_191a = (uStack_ed0._6_1_ < uStack_ee0._6_1_) * uStack_ee0._6_1_ |
                (uStack_ed0._6_1_ >= uStack_ee0._6_1_) * uStack_ed0._6_1_;
  bStack_1919 = (uStack_ed0._7_1_ < uStack_ee0._7_1_) * uStack_ee0._7_1_ |
                (uStack_ed0._7_1_ >= uStack_ee0._7_1_) * uStack_ed0._7_1_;
  local_e98 = local_1978._0_8_;
  uStack_e90 = local_1978._8_8_;
  local_ea8 = local_1978._0_8_;
  uStack_ea0 = local_1978._8_8_;
  auVar50._8_8_ = local_1978._8_8_;
  auVar50._0_8_ = local_1978._0_8_;
  auVar115._8_8_ = local_1978._8_8_;
  auVar115._0_8_ = local_1978._0_8_;
  local_1978 = paddusb(auVar50,auVar115);
  local_cc8 = local_1958;
  uStack_cc0 = uStack_1950;
  uVar110 = extraout_XMM0_Qa_02 & local_1958;
  uVar128 = extraout_XMM0_Qb_02 & uStack_1950;
  local_e1c = 1;
  local_e18._0_2_ = (ushort)uVar110;
  local_e18._2_2_ = (ushort)(uVar110 >> 0x10);
  local_e18._4_2_ = (ushort)(uVar110 >> 0x20);
  uStack_e10._0_2_ = (ushort)uVar128;
  uStack_e10._2_2_ = (ushort)(uVar128 >> 0x10);
  uStack_e10._4_2_ = (ushort)(uVar128 >> 0x20);
  local_1988 = CONCAT26((ushort)(uVar110 >> 0x31),
                        CONCAT24(local_e18._4_2_ >> 1,
                                 CONCAT22(local_e18._2_2_ >> 1,(ushort)local_e18 >> 1)));
  uStack_1980 = CONCAT26((ushort)(uVar128 >> 0x31),
                         CONCAT24(uStack_e10._4_2_ >> 1,
                                  CONCAT22(uStack_e10._2_2_ >> 1,(ushort)uStack_e10 >> 1)));
  local_eb8 = local_1978._0_8_;
  uStack_eb0 = local_1978._8_8_;
  local_ec8 = local_1988;
  uStack_ec0 = uStack_1980;
  auVar114._8_8_ = uStack_1980;
  auVar114._0_8_ = local_1988;
  local_c18 = paddusb(local_1978,auVar114);
  local_c28 = local_1778;
  uStack_c20 = uStack_1770;
  auVar58._8_8_ = uStack_1770;
  auVar58._0_8_ = local_1778;
  auVar114 = psubusb(local_c18,auVar58);
  local_17a8 = auVar114._0_8_;
  uStack_17a0 = auVar114._8_8_;
  local_10d8 = local_17a8;
  uVar2 = local_10d8;
  uStack_10d0 = uStack_17a0;
  uVar5 = uStack_10d0;
  local_10e8 = local_1758;
  uVar97 = local_10e8;
  uStack_10e0 = uStack_1750;
  uVar98 = uStack_10e0;
  local_10d8._0_1_ = auVar114[0];
  local_10d8._1_1_ = auVar114[1];
  local_10d8._2_1_ = auVar114[2];
  local_10d8._3_1_ = auVar114[3];
  local_10d8._4_1_ = auVar114[4];
  local_10d8._5_1_ = auVar114[5];
  local_10d8._6_1_ = auVar114[6];
  local_10d8._7_1_ = auVar114[7];
  uStack_10d0._0_1_ = auVar114[8];
  uStack_10d0._1_1_ = auVar114[9];
  uStack_10d0._2_1_ = auVar114[10];
  uStack_10d0._3_1_ = auVar114[0xb];
  uStack_10d0._4_1_ = auVar114[0xc];
  uStack_10d0._5_1_ = auVar114[0xd];
  uStack_10d0._6_1_ = auVar114[0xe];
  uStack_10d0._7_1_ = auVar114[0xf];
  local_10e8._0_1_ = (char)local_1758;
  local_10e8._1_1_ = (char)((ulong)local_1758 >> 8);
  local_10e8._2_1_ = (char)((ulong)local_1758 >> 0x10);
  local_10e8._3_1_ = (char)((ulong)local_1758 >> 0x18);
  local_10e8._4_1_ = (char)((ulong)local_1758 >> 0x20);
  local_10e8._5_1_ = (char)((ulong)local_1758 >> 0x28);
  local_10e8._6_1_ = (char)((ulong)local_1758 >> 0x30);
  local_10e8._7_1_ = (char)((ulong)local_1758 >> 0x38);
  uStack_10e0._0_1_ = (char)uStack_1750;
  uStack_10e0._1_1_ = (char)((ulong)uStack_1750 >> 8);
  uStack_10e0._2_1_ = (char)((ulong)uStack_1750 >> 0x10);
  uStack_10e0._3_1_ = (char)((ulong)uStack_1750 >> 0x18);
  uStack_10e0._4_1_ = (char)((ulong)uStack_1750 >> 0x20);
  uStack_10e0._5_1_ = (char)((ulong)uStack_1750 >> 0x28);
  uStack_10e0._6_1_ = (char)((ulong)uStack_1750 >> 0x30);
  uStack_10e0._7_1_ = (char)((ulong)uStack_1750 >> 0x38);
  local_ad8 = -((char)local_10d8 == (char)local_10e8);
  cStack_ad7 = -(local_10d8._1_1_ == local_10e8._1_1_);
  cStack_ad6 = -(local_10d8._2_1_ == local_10e8._2_1_);
  cStack_ad5 = -(local_10d8._3_1_ == local_10e8._3_1_);
  cStack_ad4 = -(local_10d8._4_1_ == local_10e8._4_1_);
  cStack_ad3 = -(local_10d8._5_1_ == local_10e8._5_1_);
  cStack_ad2 = -(local_10d8._6_1_ == local_10e8._6_1_);
  cStack_ad1 = -(local_10d8._7_1_ == local_10e8._7_1_);
  cStack_ad0 = -((char)uStack_10d0 == (char)uStack_10e0);
  cStack_acf = -(uStack_10d0._1_1_ == uStack_10e0._1_1_);
  cStack_ace = -(uStack_10d0._2_1_ == uStack_10e0._2_1_);
  cStack_acd = -(uStack_10d0._3_1_ == uStack_10e0._3_1_);
  cStack_acc = -(uStack_10d0._4_1_ == uStack_10e0._4_1_);
  cStack_acb = -(uStack_10d0._5_1_ == uStack_10e0._5_1_);
  cStack_aca = -(uStack_10d0._6_1_ == uStack_10e0._6_1_);
  cStack_ac9 = -(uStack_10d0._7_1_ == uStack_10e0._7_1_);
  local_ae8 = CONCAT17(uStack_1961,
                       CONCAT16(uStack_1962,
                                CONCAT15(uStack_1963,
                                         CONCAT14(uStack_1964,
                                                  CONCAT13(uStack_1965,
                                                           CONCAT12(uStack_1966,
                                                                    CONCAT11(uStack_1967,local_1968)
                                                                   ))))));
  uStack_ae0 = CONCAT17(uStack_1959,
                        CONCAT16(uStack_195a,
                                 CONCAT15(uStack_195b,
                                          CONCAT14(uStack_195c,
                                                   CONCAT13(uStack_195d,
                                                            CONCAT12(uStack_195e,
                                                                     CONCAT11(uStack_195f,
                                                                              uStack_1960)))))));
  uVar113 = CONCAT17(cStack_ad1,
                     CONCAT16(cStack_ad2,
                              CONCAT15(cStack_ad3,
                                       CONCAT14(cStack_ad4,
                                                CONCAT13(cStack_ad5,
                                                         CONCAT12(cStack_ad6,
                                                                  CONCAT11(cStack_ad7,local_ad8)))))
                             )) ^ local_ae8;
  uVar129 = CONCAT17(cStack_ac9,
                     CONCAT16(cStack_aca,
                              CONCAT15(cStack_acb,
                                       CONCAT14(cStack_acc,
                                                CONCAT13(cStack_acd,
                                                         CONCAT12(cStack_ace,
                                                                  CONCAT11(cStack_acf,cStack_ad0))))
                                      ))) ^ uStack_ae0;
  local_ef8 = CONCAT17(bStack_1921,
                       CONCAT16(bStack_1922,
                                CONCAT15(bStack_1923,
                                         CONCAT14(bStack_1924,
                                                  CONCAT13(bStack_1925,
                                                           CONCAT12(bStack_1926,
                                                                    CONCAT11(bStack_1927,local_1928)
                                                                   ))))));
  uStack_ef0 = CONCAT17(bStack_1919,
                        CONCAT16(bStack_191a,
                                 CONCAT15(bStack_191b,
                                          CONCAT14(bStack_191c,
                                                   CONCAT13(bStack_191d,
                                                            CONCAT12(bStack_191e,
                                                                     CONCAT11(bStack_191f,
                                                                              bStack_1920)))))));
  local_f08._0_1_ = (byte)uVar113;
  local_f08._1_1_ = (byte)(uVar113 >> 8);
  local_f08._2_1_ = (byte)(uVar113 >> 0x10);
  local_f08._3_1_ = (byte)(uVar113 >> 0x18);
  local_f08._4_1_ = (byte)(uVar113 >> 0x20);
  local_f08._5_1_ = (byte)(uVar113 >> 0x28);
  local_f08._6_1_ = (byte)(uVar113 >> 0x30);
  local_f08._7_1_ = (byte)(uVar113 >> 0x38);
  uStack_f00._0_1_ = (byte)uVar129;
  uStack_f00._1_1_ = (byte)(uVar129 >> 8);
  uStack_f00._2_1_ = (byte)(uVar129 >> 0x10);
  uStack_f00._3_1_ = (byte)(uVar129 >> 0x18);
  uStack_f00._4_1_ = (byte)(uVar129 >> 0x20);
  uStack_f00._5_1_ = (byte)(uVar129 >> 0x28);
  uStack_f00._6_1_ = (byte)(uVar129 >> 0x30);
  uStack_f00._7_1_ = (byte)(uVar129 >> 0x38);
  local_17a8._1_1_ =
       (bStack_1927 < local_f08._1_1_) * local_f08._1_1_ |
       (bStack_1927 >= local_f08._1_1_) * bStack_1927;
  local_17a8._0_1_ =
       (local_1928 < (byte)local_f08) * (byte)local_f08 |
       (local_1928 >= (byte)local_f08) * local_1928;
  local_17a8._2_1_ =
       (bStack_1926 < local_f08._2_1_) * local_f08._2_1_ |
       (bStack_1926 >= local_f08._2_1_) * bStack_1926;
  local_17a8._3_1_ =
       (bStack_1925 < local_f08._3_1_) * local_f08._3_1_ |
       (bStack_1925 >= local_f08._3_1_) * bStack_1925;
  local_17a8._4_1_ =
       (bStack_1924 < local_f08._4_1_) * local_f08._4_1_ |
       (bStack_1924 >= local_f08._4_1_) * bStack_1924;
  local_17a8._5_1_ =
       (bStack_1923 < local_f08._5_1_) * local_f08._5_1_ |
       (bStack_1923 >= local_f08._5_1_) * bStack_1923;
  local_17a8._6_1_ =
       (bStack_1922 < local_f08._6_1_) * local_f08._6_1_ |
       (bStack_1922 >= local_f08._6_1_) * bStack_1922;
  local_17a8._7_1_ =
       (bStack_1921 < local_f08._7_1_) * local_f08._7_1_ |
       (bStack_1921 >= local_f08._7_1_) * bStack_1921;
  uStack_17a0._0_1_ =
       (bStack_1920 < (byte)uStack_f00) * (byte)uStack_f00 |
       (bStack_1920 >= (byte)uStack_f00) * bStack_1920;
  uStack_17a0._1_1_ =
       (bStack_191f < uStack_f00._1_1_) * uStack_f00._1_1_ |
       (bStack_191f >= uStack_f00._1_1_) * bStack_191f;
  uStack_17a0._2_1_ =
       (bStack_191e < uStack_f00._2_1_) * uStack_f00._2_1_ |
       (bStack_191e >= uStack_f00._2_1_) * bStack_191e;
  uStack_17a0._3_1_ =
       (bStack_191d < uStack_f00._3_1_) * uStack_f00._3_1_ |
       (bStack_191d >= uStack_f00._3_1_) * bStack_191d;
  uStack_17a0._4_1_ =
       (bStack_191c < uStack_f00._4_1_) * uStack_f00._4_1_ |
       (bStack_191c >= uStack_f00._4_1_) * bStack_191c;
  uStack_17a0._5_1_ =
       (bStack_191b < uStack_f00._5_1_) * uStack_f00._5_1_ |
       (bStack_191b >= uStack_f00._5_1_) * bStack_191b;
  uStack_17a0._6_1_ =
       (bStack_191a < uStack_f00._6_1_) * uStack_f00._6_1_ |
       (bStack_191a >= uStack_f00._6_1_) * bStack_191a;
  uStack_17a0._7_1_ =
       (bStack_1919 < uStack_f00._7_1_) * uStack_f00._7_1_ |
       (bStack_1919 >= uStack_f00._7_1_) * bStack_1919;
  a_02[1] = in_RSI;
  a_02[0] = (longlong)in_RDI;
  b_03[1] = b[1];
  local_10e8 = uVar97;
  uStack_10e0 = uVar98;
  local_10d8 = uVar2;
  uStack_10d0 = uVar5;
  local_f08 = uVar113;
  uStack_f00 = uVar129;
  local_ee8 = uVar8;
  uStack_ee0 = uVar9;
  local_ed8 = uVar11;
  uStack_ed0 = uVar13;
  local_e18 = uVar110;
  uStack_e10 = uVar128;
  alVar140 = abs_diff(a_02,b_03);
  b_04[0] = alVar140[1];
  a_03[1] = in_RSI;
  a_03[0] = (longlong)in_RDI;
  b_04[1] = b[1];
  alVar140 = abs_diff(a_03,b_04);
  b_05[0] = alVar140[1];
  local_f18 = (byte)extraout_XMM0_Qa_03;
  bStack_f17 = (byte)((ulong)extraout_XMM0_Qa_03 >> 8);
  bStack_f16 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x10);
  bStack_f15 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x18);
  bStack_f14 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x20);
  bStack_f13 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x28);
  bStack_f12 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x30);
  bStack_f11 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x38);
  bStack_f10 = (byte)extraout_XMM0_Qb_03;
  bStack_f0f = (byte)((ulong)extraout_XMM0_Qb_03 >> 8);
  bStack_f0e = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x10);
  bStack_f0d = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x18);
  bStack_f0c = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x20);
  bStack_f0b = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x28);
  bStack_f0a = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x30);
  bStack_f09 = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x38);
  local_f28 = (byte)extraout_XMM0_Qa_04;
  bStack_f27 = (byte)((ulong)extraout_XMM0_Qa_04 >> 8);
  bStack_f26 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x10);
  bStack_f25 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x18);
  bStack_f24 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x20);
  bStack_f23 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x28);
  bStack_f22 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x30);
  bStack_f21 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x38);
  bStack_f20 = (byte)extraout_XMM0_Qb_04;
  bStack_f1f = (byte)((ulong)extraout_XMM0_Qb_04 >> 8);
  bStack_f1e = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x10);
  bStack_f1d = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x18);
  bStack_f1c = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x20);
  bStack_f1b = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x28);
  bStack_f1a = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x30);
  bStack_f19 = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x38);
  local_1998 = (local_f18 < local_f28) * local_f28 | (local_f18 >= local_f28) * local_f18;
  bStack_1997 = (bStack_f17 < bStack_f27) * bStack_f27 | (bStack_f17 >= bStack_f27) * bStack_f17;
  bStack_1996 = (bStack_f16 < bStack_f26) * bStack_f26 | (bStack_f16 >= bStack_f26) * bStack_f16;
  bStack_1995 = (bStack_f15 < bStack_f25) * bStack_f25 | (bStack_f15 >= bStack_f25) * bStack_f15;
  bStack_1994 = (bStack_f14 < bStack_f24) * bStack_f24 | (bStack_f14 >= bStack_f24) * bStack_f14;
  bStack_1993 = (bStack_f13 < bStack_f23) * bStack_f23 | (bStack_f13 >= bStack_f23) * bStack_f13;
  bStack_1992 = (bStack_f12 < bStack_f22) * bStack_f22 | (bStack_f12 >= bStack_f22) * bStack_f12;
  bStack_1991 = (bStack_f11 < bStack_f21) * bStack_f21 | (bStack_f11 >= bStack_f21) * bStack_f11;
  bStack_1990 = (bStack_f10 < bStack_f20) * bStack_f20 | (bStack_f10 >= bStack_f20) * bStack_f10;
  bStack_198f = (bStack_f0f < bStack_f1f) * bStack_f1f | (bStack_f0f >= bStack_f1f) * bStack_f0f;
  bStack_198e = (bStack_f0e < bStack_f1e) * bStack_f1e | (bStack_f0e >= bStack_f1e) * bStack_f0e;
  bStack_198d = (bStack_f0d < bStack_f1d) * bStack_f1d | (bStack_f0d >= bStack_f1d) * bStack_f0d;
  bStack_198c = (bStack_f0c < bStack_f1c) * bStack_f1c | (bStack_f0c >= bStack_f1c) * bStack_f0c;
  bStack_198b = (bStack_f0b < bStack_f1b) * bStack_f1b | (bStack_f0b >= bStack_f1b) * bStack_f0b;
  bStack_198a = (bStack_f0a < bStack_f1a) * bStack_f1a | (bStack_f0a >= bStack_f1a) * bStack_f0a;
  bStack_1989 = (bStack_f09 < bStack_f19) * bStack_f19 | (bStack_f09 >= bStack_f19) * bStack_f09;
  local_f38 = CONCAT17(bStack_1991,
                       CONCAT16(bStack_1992,
                                CONCAT15(bStack_1993,
                                         CONCAT14(bStack_1994,
                                                  CONCAT13(bStack_1995,
                                                           CONCAT12(bStack_1996,
                                                                    CONCAT11(bStack_1997,local_1998)
                                                                   ))))));
  uStack_f30 = CONCAT17(bStack_1989,
                        CONCAT16(bStack_198a,
                                 CONCAT15(bStack_198b,
                                          CONCAT14(bStack_198c,
                                                   CONCAT13(bStack_198d,
                                                            CONCAT12(bStack_198e,
                                                                     CONCAT11(bStack_198f,
                                                                              bStack_1990)))))));
  local_f48 = local_17a8;
  uVar97 = local_f48;
  uStack_f40 = uStack_17a0;
  uVar98 = uStack_f40;
  local_f48._0_1_ = (byte)local_17a8;
  local_f48._1_1_ = local_17a8._1_1_;
  local_f48._2_1_ = local_17a8._2_1_;
  local_f48._3_1_ = local_17a8._3_1_;
  local_f48._4_1_ = local_17a8._4_1_;
  local_f48._5_1_ = local_17a8._5_1_;
  local_f48._6_1_ = local_17a8._6_1_;
  local_f48._7_1_ = local_17a8._7_1_;
  uStack_f40._0_1_ = local_17a8._8_1_;
  uStack_f40._1_1_ = local_17a8._9_1_;
  uStack_f40._2_1_ = local_17a8._10_1_;
  uStack_f40._3_1_ = local_17a8._11_1_;
  uStack_f40._4_1_ = local_17a8._12_1_;
  uStack_f40._5_1_ = local_17a8._13_1_;
  uStack_f40._6_1_ = local_17a8._14_1_;
  uStack_f40._7_1_ = local_17a8._15_1_;
  local_17a8._1_1_ =
       (bStack_1997 < local_f48._1_1_) * local_f48._1_1_ |
       (bStack_1997 >= local_f48._1_1_) * bStack_1997;
  local_17a8._0_1_ =
       (local_1998 < (byte)local_f48) * (byte)local_f48 |
       (local_1998 >= (byte)local_f48) * local_1998;
  local_17a8._2_1_ =
       (bStack_1996 < local_f48._2_1_) * local_f48._2_1_ |
       (bStack_1996 >= local_f48._2_1_) * bStack_1996;
  local_17a8._3_1_ =
       (bStack_1995 < local_f48._3_1_) * local_f48._3_1_ |
       (bStack_1995 >= local_f48._3_1_) * bStack_1995;
  local_17a8._4_1_ =
       (bStack_1994 < local_f48._4_1_) * local_f48._4_1_ |
       (bStack_1994 >= local_f48._4_1_) * bStack_1994;
  local_17a8._5_1_ =
       (bStack_1993 < local_f48._5_1_) * local_f48._5_1_ |
       (bStack_1993 >= local_f48._5_1_) * bStack_1993;
  local_17a8._6_1_ =
       (bStack_1992 < local_f48._6_1_) * local_f48._6_1_ |
       (bStack_1992 >= local_f48._6_1_) * bStack_1992;
  local_17a8._7_1_ =
       (bStack_1991 < local_f48._7_1_) * local_f48._7_1_ |
       (bStack_1991 >= local_f48._7_1_) * bStack_1991;
  uStack_17a0._0_1_ =
       (bStack_1990 < (byte)uStack_f40) * (byte)uStack_f40 |
       (bStack_1990 >= (byte)uStack_f40) * bStack_1990;
  uStack_17a0._1_1_ =
       (bStack_198f < uStack_f40._1_1_) * uStack_f40._1_1_ |
       (bStack_198f >= uStack_f40._1_1_) * bStack_198f;
  uStack_17a0._2_1_ =
       (bStack_198e < uStack_f40._2_1_) * uStack_f40._2_1_ |
       (bStack_198e >= uStack_f40._2_1_) * bStack_198e;
  uStack_17a0._3_1_ =
       (bStack_198d < uStack_f40._3_1_) * uStack_f40._3_1_ |
       (bStack_198d >= uStack_f40._3_1_) * bStack_198d;
  uStack_17a0._4_1_ =
       (bStack_198c < uStack_f40._4_1_) * uStack_f40._4_1_ |
       (bStack_198c >= uStack_f40._4_1_) * bStack_198c;
  uStack_17a0._5_1_ =
       (bStack_198b < uStack_f40._5_1_) * uStack_f40._5_1_ |
       (bStack_198b >= uStack_f40._5_1_) * bStack_198b;
  uStack_17a0._6_1_ =
       (bStack_198a < uStack_f40._6_1_) * uStack_f40._6_1_ |
       (bStack_198a >= uStack_f40._6_1_) * bStack_198a;
  uStack_17a0._7_1_ =
       (bStack_1989 < uStack_f40._7_1_) * uStack_f40._7_1_ |
       (bStack_1989 >= uStack_f40._7_1_) * bStack_1989;
  a_04[1] = in_RSI;
  a_04[0] = (longlong)in_RDI;
  b_05[1] = b[1];
  local_f48 = uVar97;
  uStack_f40 = uVar98;
  alVar140 = abs_diff(a_04,b_05);
  b_06[0] = alVar140[1];
  a_05[1] = in_RSI;
  a_05[0] = (longlong)in_RDI;
  b_06[1] = b[1];
  alVar140 = abs_diff(a_05,b_06);
  b_07[0] = alVar140[1];
  local_f58 = (byte)extraout_XMM0_Qa_05;
  bStack_f57 = (byte)((ulong)extraout_XMM0_Qa_05 >> 8);
  bStack_f56 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x10);
  bStack_f55 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x18);
  bStack_f54 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x20);
  bStack_f53 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x28);
  bStack_f52 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x30);
  bStack_f51 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x38);
  bStack_f50 = (byte)extraout_XMM0_Qb_05;
  bStack_f4f = (byte)((ulong)extraout_XMM0_Qb_05 >> 8);
  bStack_f4e = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x10);
  bStack_f4d = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x18);
  bStack_f4c = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x20);
  bStack_f4b = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x28);
  bStack_f4a = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x30);
  bStack_f49 = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x38);
  local_f68 = (byte)extraout_XMM0_Qa_06;
  bStack_f67 = (byte)((ulong)extraout_XMM0_Qa_06 >> 8);
  bStack_f66 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x10);
  bStack_f65 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x18);
  bStack_f64 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x20);
  bStack_f63 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x28);
  bStack_f62 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x30);
  bStack_f61 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x38);
  bStack_f60 = (byte)extraout_XMM0_Qb_06;
  bStack_f5f = (byte)((ulong)extraout_XMM0_Qb_06 >> 8);
  bStack_f5e = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x10);
  bStack_f5d = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x18);
  bStack_f5c = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x20);
  bStack_f5b = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x28);
  bStack_f5a = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x30);
  bStack_f59 = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x38);
  local_1998 = (local_f58 < local_f68) * local_f68 | (local_f58 >= local_f68) * local_f58;
  bStack_1997 = (bStack_f57 < bStack_f67) * bStack_f67 | (bStack_f57 >= bStack_f67) * bStack_f57;
  bStack_1996 = (bStack_f56 < bStack_f66) * bStack_f66 | (bStack_f56 >= bStack_f66) * bStack_f56;
  bStack_1995 = (bStack_f55 < bStack_f65) * bStack_f65 | (bStack_f55 >= bStack_f65) * bStack_f55;
  bStack_1994 = (bStack_f54 < bStack_f64) * bStack_f64 | (bStack_f54 >= bStack_f64) * bStack_f54;
  bStack_1993 = (bStack_f53 < bStack_f63) * bStack_f63 | (bStack_f53 >= bStack_f63) * bStack_f53;
  bStack_1992 = (bStack_f52 < bStack_f62) * bStack_f62 | (bStack_f52 >= bStack_f62) * bStack_f52;
  bStack_1991 = (bStack_f51 < bStack_f61) * bStack_f61 | (bStack_f51 >= bStack_f61) * bStack_f51;
  bStack_1990 = (bStack_f50 < bStack_f60) * bStack_f60 | (bStack_f50 >= bStack_f60) * bStack_f50;
  bStack_198f = (bStack_f4f < bStack_f5f) * bStack_f5f | (bStack_f4f >= bStack_f5f) * bStack_f4f;
  bStack_198e = (bStack_f4e < bStack_f5e) * bStack_f5e | (bStack_f4e >= bStack_f5e) * bStack_f4e;
  bStack_198d = (bStack_f4d < bStack_f5d) * bStack_f5d | (bStack_f4d >= bStack_f5d) * bStack_f4d;
  bStack_198c = (bStack_f4c < bStack_f5c) * bStack_f5c | (bStack_f4c >= bStack_f5c) * bStack_f4c;
  bStack_198b = (bStack_f4b < bStack_f5b) * bStack_f5b | (bStack_f4b >= bStack_f5b) * bStack_f4b;
  bStack_198a = (bStack_f4a < bStack_f5a) * bStack_f5a | (bStack_f4a >= bStack_f5a) * bStack_f4a;
  bStack_1989 = (bStack_f49 < bStack_f59) * bStack_f59 | (bStack_f49 >= bStack_f59) * bStack_f49;
  local_f78 = CONCAT17(bStack_1991,
                       CONCAT16(bStack_1992,
                                CONCAT15(bStack_1993,
                                         CONCAT14(bStack_1994,
                                                  CONCAT13(bStack_1995,
                                                           CONCAT12(bStack_1996,
                                                                    CONCAT11(bStack_1997,local_1998)
                                                                   ))))));
  uStack_f70 = CONCAT17(bStack_1989,
                        CONCAT16(bStack_198a,
                                 CONCAT15(bStack_198b,
                                          CONCAT14(bStack_198c,
                                                   CONCAT13(bStack_198d,
                                                            CONCAT12(bStack_198e,
                                                                     CONCAT11(bStack_198f,
                                                                              bStack_1990)))))));
  local_f88 = local_17a8;
  uVar8 = local_f88;
  uStack_f80 = uStack_17a0;
  uVar9 = uStack_f80;
  local_f88._0_1_ = (byte)local_17a8;
  local_f88._1_1_ = local_17a8._1_1_;
  local_f88._2_1_ = local_17a8._2_1_;
  local_f88._3_1_ = local_17a8._3_1_;
  local_f88._4_1_ = local_17a8._4_1_;
  local_f88._5_1_ = local_17a8._5_1_;
  local_f88._6_1_ = local_17a8._6_1_;
  local_f88._7_1_ = local_17a8._7_1_;
  uStack_f80._0_1_ = local_17a8._8_1_;
  uStack_f80._1_1_ = local_17a8._9_1_;
  uStack_f80._2_1_ = local_17a8._10_1_;
  uStack_f80._3_1_ = local_17a8._11_1_;
  uStack_f80._4_1_ = local_17a8._12_1_;
  uStack_f80._5_1_ = local_17a8._13_1_;
  uStack_f80._6_1_ = local_17a8._14_1_;
  uStack_f80._7_1_ = local_17a8._15_1_;
  local_17a8._0_2_ =
       CONCAT11((bStack_1997 < local_f88._1_1_) * local_f88._1_1_ |
                (bStack_1997 >= local_f88._1_1_) * bStack_1997,
                (local_1998 < (byte)local_f88) * (byte)local_f88 |
                (local_1998 >= (byte)local_f88) * local_1998);
  local_17a8._0_3_ =
       CONCAT12((bStack_1996 < local_f88._2_1_) * local_f88._2_1_ |
                (bStack_1996 >= local_f88._2_1_) * bStack_1996,(undefined2)local_17a8);
  local_17a8._0_4_ =
       CONCAT13((bStack_1995 < local_f88._3_1_) * local_f88._3_1_ |
                (bStack_1995 >= local_f88._3_1_) * bStack_1995,(undefined3)local_17a8);
  local_17a8._0_5_ =
       CONCAT14((bStack_1994 < local_f88._4_1_) * local_f88._4_1_ |
                (bStack_1994 >= local_f88._4_1_) * bStack_1994,(undefined4)local_17a8);
  local_17a8._0_6_ =
       CONCAT15((bStack_1993 < local_f88._5_1_) * local_f88._5_1_ |
                (bStack_1993 >= local_f88._5_1_) * bStack_1993,(undefined5)local_17a8);
  local_17a8._0_7_ =
       CONCAT16((bStack_1992 < local_f88._6_1_) * local_f88._6_1_ |
                (bStack_1992 >= local_f88._6_1_) * bStack_1992,(undefined6)local_17a8);
  local_17a8 = CONCAT17((bStack_1991 < local_f88._7_1_) * local_f88._7_1_ |
                        (bStack_1991 >= local_f88._7_1_) * bStack_1991,(undefined7)local_17a8);
  uStack_17a0._0_1_ =
       (bStack_1990 < (byte)uStack_f80) * (byte)uStack_f80 |
       (bStack_1990 >= (byte)uStack_f80) * bStack_1990;
  uStack_17a0._1_1_ =
       (bStack_198f < uStack_f80._1_1_) * uStack_f80._1_1_ |
       (bStack_198f >= uStack_f80._1_1_) * bStack_198f;
  uStack_17a0._2_1_ =
       (bStack_198e < uStack_f80._2_1_) * uStack_f80._2_1_ |
       (bStack_198e >= uStack_f80._2_1_) * bStack_198e;
  uStack_17a0._3_1_ =
       (bStack_198d < uStack_f80._3_1_) * uStack_f80._3_1_ |
       (bStack_198d >= uStack_f80._3_1_) * bStack_198d;
  uStack_17a0._4_1_ =
       (bStack_198c < uStack_f80._4_1_) * uStack_f80._4_1_ |
       (bStack_198c >= uStack_f80._4_1_) * bStack_198c;
  uStack_17a0._5_1_ =
       (bStack_198b < uStack_f80._5_1_) * uStack_f80._5_1_ |
       (bStack_198b >= uStack_f80._5_1_) * bStack_198b;
  uStack_17a0._6_1_ =
       (bStack_198a < uStack_f80._6_1_) * uStack_f80._6_1_ |
       (bStack_198a >= uStack_f80._6_1_) * bStack_198a;
  uStack_17a0._7_1_ =
       (bStack_1989 < uStack_f80._7_1_) * uStack_f80._7_1_ |
       (bStack_1989 >= uStack_f80._7_1_) * bStack_1989;
  local_c38 = local_17a8;
  uStack_c30 = uStack_17a0;
  local_c48 = local_1788;
  uStack_c40 = uStack_1780;
  auVar57._8_8_ = uStack_17a0;
  auVar57._0_8_ = local_17a8;
  auVar56._8_8_ = uStack_1780;
  auVar56._0_8_ = local_1788;
  auVar114 = psubusb(auVar57,auVar56);
  local_17a8 = auVar114._0_8_;
  uStack_17a0 = auVar114._8_8_;
  local_10f8 = local_17a8;
  uVar2 = local_10f8;
  uStack_10f0 = uStack_17a0;
  uVar5 = uStack_10f0;
  local_1108 = local_1758;
  uVar97 = local_1108;
  uStack_1100 = uStack_1750;
  uVar98 = uStack_1100;
  local_10f8._0_1_ = auVar114[0];
  local_10f8._1_1_ = auVar114[1];
  local_10f8._2_1_ = auVar114[2];
  local_10f8._3_1_ = auVar114[3];
  local_10f8._4_1_ = auVar114[4];
  local_10f8._5_1_ = auVar114[5];
  local_10f8._6_1_ = auVar114[6];
  local_10f8._7_1_ = auVar114[7];
  uStack_10f0._0_1_ = auVar114[8];
  uStack_10f0._1_1_ = auVar114[9];
  uStack_10f0._2_1_ = auVar114[10];
  uStack_10f0._3_1_ = auVar114[0xb];
  uStack_10f0._4_1_ = auVar114[0xc];
  uStack_10f0._5_1_ = auVar114[0xd];
  uStack_10f0._6_1_ = auVar114[0xe];
  uStack_10f0._7_1_ = auVar114[0xf];
  local_1108._0_1_ = (char)local_1758;
  local_1108._1_1_ = (char)((ulong)local_1758 >> 8);
  local_1108._2_1_ = (char)((ulong)local_1758 >> 0x10);
  local_1108._3_1_ = (char)((ulong)local_1758 >> 0x18);
  local_1108._4_1_ = (char)((ulong)local_1758 >> 0x20);
  local_1108._5_1_ = (char)((ulong)local_1758 >> 0x28);
  local_1108._6_1_ = (char)((ulong)local_1758 >> 0x30);
  local_1108._7_1_ = (char)((ulong)local_1758 >> 0x38);
  uStack_1100._0_1_ = (char)uStack_1750;
  uStack_1100._1_1_ = (char)((ulong)uStack_1750 >> 8);
  uStack_1100._2_1_ = (char)((ulong)uStack_1750 >> 0x10);
  uStack_1100._3_1_ = (char)((ulong)uStack_1750 >> 0x18);
  uStack_1100._4_1_ = (char)((ulong)uStack_1750 >> 0x20);
  uStack_1100._5_1_ = (char)((ulong)uStack_1750 >> 0x28);
  uStack_1100._6_1_ = (char)((ulong)uStack_1750 >> 0x30);
  uStack_1100._7_1_ = (char)((ulong)uStack_1750 >> 0x38);
  local_17a8._0_2_ =
       CONCAT11(-(local_10f8._1_1_ == local_1108._1_1_),-((char)local_10f8 == (char)local_1108));
  local_17a8._0_3_ = CONCAT12(-(local_10f8._2_1_ == local_1108._2_1_),(undefined2)local_17a8);
  local_17a8._0_4_ = CONCAT13(-(local_10f8._3_1_ == local_1108._3_1_),(undefined3)local_17a8);
  local_17a8._0_5_ = CONCAT14(-(local_10f8._4_1_ == local_1108._4_1_),(undefined4)local_17a8);
  local_17a8._0_6_ = CONCAT15(-(local_10f8._5_1_ == local_1108._5_1_),(undefined5)local_17a8);
  local_17a8._0_7_ = CONCAT16(-(local_10f8._6_1_ == local_1108._6_1_),(undefined6)local_17a8);
  local_17a8 = CONCAT17(-(local_10f8._7_1_ == local_1108._7_1_),(undefined7)local_17a8);
  uStack_17a0._0_1_ = -((char)uStack_10f0 == (char)uStack_1100);
  uStack_17a0._1_1_ = -(uStack_10f0._1_1_ == uStack_1100._1_1_);
  uStack_17a0._2_1_ = -(uStack_10f0._2_1_ == uStack_1100._2_1_);
  uStack_17a0._3_1_ = -(uStack_10f0._3_1_ == uStack_1100._3_1_);
  uStack_17a0._4_1_ = -(uStack_10f0._4_1_ == uStack_1100._4_1_);
  uStack_17a0._5_1_ = -(uStack_10f0._5_1_ == uStack_1100._5_1_);
  uStack_17a0._6_1_ = -(uStack_10f0._6_1_ == uStack_1100._6_1_);
  uStack_17a0._7_1_ = -(uStack_10f0._7_1_ == uStack_1100._7_1_);
  local_1118 = local_17a8;
  uStack_1110 = uStack_17a0;
  local_1128 = local_1758;
  uStack_1120 = uStack_1750;
  local_aa8 = -(-((char)local_10f8 == (char)local_1108) == (char)local_1108);
  cStack_aa7 = -(-(local_10f8._1_1_ == local_1108._1_1_) == local_1108._1_1_);
  cStack_aa6 = -(-(local_10f8._2_1_ == local_1108._2_1_) == local_1108._2_1_);
  cStack_aa5 = -(-(local_10f8._3_1_ == local_1108._3_1_) == local_1108._3_1_);
  cStack_aa4 = -(-(local_10f8._4_1_ == local_1108._4_1_) == local_1108._4_1_);
  cStack_aa3 = -(-(local_10f8._5_1_ == local_1108._5_1_) == local_1108._5_1_);
  cStack_aa2 = -(-(local_10f8._6_1_ == local_1108._6_1_) == local_1108._6_1_);
  cStack_aa1 = -(-(local_10f8._7_1_ == local_1108._7_1_) == local_1108._7_1_);
  cStack_aa0 = -(-((char)uStack_10f0 == (char)uStack_1100) == (char)uStack_1100);
  cStack_a9f = -(-(uStack_10f0._1_1_ == uStack_1100._1_1_) == uStack_1100._1_1_);
  cStack_a9e = -(-(uStack_10f0._2_1_ == uStack_1100._2_1_) == uStack_1100._2_1_);
  cStack_a9d = -(-(uStack_10f0._3_1_ == uStack_1100._3_1_) == uStack_1100._3_1_);
  cStack_a9c = -(-(uStack_10f0._4_1_ == uStack_1100._4_1_) == uStack_1100._4_1_);
  cStack_a9b = -(-(uStack_10f0._5_1_ == uStack_1100._5_1_) == uStack_1100._5_1_);
  cStack_a9a = -(-(uStack_10f0._6_1_ == uStack_1100._6_1_) == uStack_1100._6_1_);
  bStack_a99 = -(-(uStack_10f0._7_1_ == uStack_1100._7_1_) == uStack_1100._7_1_);
  auVar61[1] = cStack_aa7;
  auVar61[0] = local_aa8;
  auVar61[2] = cStack_aa6;
  auVar61[3] = cStack_aa5;
  auVar61[4] = cStack_aa4;
  auVar61[5] = cStack_aa3;
  auVar61[6] = cStack_aa2;
  auVar61[7] = cStack_aa1;
  auVar61[8] = cStack_aa0;
  auVar61[9] = cStack_a9f;
  auVar61[10] = cStack_a9e;
  auVar61[0xb] = cStack_a9d;
  auVar61[0xc] = cStack_a9c;
  auVar61[0xd] = cStack_a9b;
  auVar61[0xe] = cStack_a9a;
  auVar61[0xf] = bStack_a99;
  uVar1 = (ushort)(SUB161(auVar61 >> 7,0) & 1) | (ushort)(SUB161(auVar61 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar61 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar61 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar61 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar61 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar61 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar61 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar61 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar61 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar61 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar61 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar61 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_a99 >> 7) << 0xf;
  if (uVar1 != 0xffff) {
    a_06[1] = in_RSI;
    a_06[0] = (longlong)in_RDI;
    b_07[1]._0_2_ = uVar1;
    b_07[1]._2_6_ = 0;
    uVar110 = (ulong)uVar1;
    local_1108 = uVar97;
    uStack_1100 = uVar98;
    local_10f8 = uVar2;
    uStack_10f0 = uVar5;
    local_f88 = uVar8;
    uStack_f80 = uVar9;
    alVar140 = abs_diff(a_06,b_07);
    b_08[0] = alVar140[1];
    a_07[1] = in_RSI;
    a_07[0] = (longlong)in_RDI;
    b_08[1] = uVar110;
    alVar140 = abs_diff(a_07,b_08);
    b_09[0] = alVar140[1];
    local_f98 = (byte)extraout_XMM0_Qa_07;
    bStack_f97 = (byte)((ulong)extraout_XMM0_Qa_07 >> 8);
    bStack_f96 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x10);
    bStack_f95 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x18);
    bStack_f94 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x20);
    bStack_f93 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x28);
    bStack_f92 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x30);
    bStack_f91 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x38);
    bStack_f90 = (byte)extraout_XMM0_Qb_07;
    bStack_f8f = (byte)((ulong)extraout_XMM0_Qb_07 >> 8);
    bStack_f8e = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x10);
    bStack_f8d = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x18);
    bStack_f8c = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x20);
    bStack_f8b = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x28);
    bStack_f8a = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x30);
    bStack_f89 = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x38);
    local_fa8 = (byte)extraout_XMM0_Qa_08;
    bStack_fa7 = (byte)((ulong)extraout_XMM0_Qa_08 >> 8);
    bStack_fa6 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x10);
    bStack_fa5 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x18);
    bStack_fa4 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x20);
    bStack_fa3 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x28);
    bStack_fa2 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x30);
    bStack_fa1 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x38);
    bStack_fa0 = (byte)extraout_XMM0_Qb_08;
    bStack_f9f = (byte)((ulong)extraout_XMM0_Qb_08 >> 8);
    bStack_f9e = (byte)((ulong)extraout_XMM0_Qb_08 >> 0x10);
    bStack_f9d = (byte)((ulong)extraout_XMM0_Qb_08 >> 0x18);
    bStack_f9c = (byte)((ulong)extraout_XMM0_Qb_08 >> 0x20);
    bStack_f9b = (byte)((ulong)extraout_XMM0_Qb_08 >> 0x28);
    bStack_f9a = (byte)((ulong)extraout_XMM0_Qb_08 >> 0x30);
    bStack_f99 = (byte)((ulong)extraout_XMM0_Qb_08 >> 0x38);
    local_19a8 = (local_f98 < local_fa8) * local_fa8 | (local_f98 >= local_fa8) * local_f98;
    bStack_19a7 = (bStack_f97 < bStack_fa7) * bStack_fa7 | (bStack_f97 >= bStack_fa7) * bStack_f97;
    bStack_19a6 = (bStack_f96 < bStack_fa6) * bStack_fa6 | (bStack_f96 >= bStack_fa6) * bStack_f96;
    bStack_19a5 = (bStack_f95 < bStack_fa5) * bStack_fa5 | (bStack_f95 >= bStack_fa5) * bStack_f95;
    bStack_19a4 = (bStack_f94 < bStack_fa4) * bStack_fa4 | (bStack_f94 >= bStack_fa4) * bStack_f94;
    bStack_19a3 = (bStack_f93 < bStack_fa3) * bStack_fa3 | (bStack_f93 >= bStack_fa3) * bStack_f93;
    bStack_19a2 = (bStack_f92 < bStack_fa2) * bStack_fa2 | (bStack_f92 >= bStack_fa2) * bStack_f92;
    bStack_19a1 = (bStack_f91 < bStack_fa1) * bStack_fa1 | (bStack_f91 >= bStack_fa1) * bStack_f91;
    bStack_19a0 = (bStack_f90 < bStack_fa0) * bStack_fa0 | (bStack_f90 >= bStack_fa0) * bStack_f90;
    bStack_199f = (bStack_f8f < bStack_f9f) * bStack_f9f | (bStack_f8f >= bStack_f9f) * bStack_f8f;
    bStack_199e = (bStack_f8e < bStack_f9e) * bStack_f9e | (bStack_f8e >= bStack_f9e) * bStack_f8e;
    bStack_199d = (bStack_f8d < bStack_f9d) * bStack_f9d | (bStack_f8d >= bStack_f9d) * bStack_f8d;
    bStack_199c = (bStack_f8c < bStack_f9c) * bStack_f9c | (bStack_f8c >= bStack_f9c) * bStack_f8c;
    bStack_199b = (bStack_f8b < bStack_f9b) * bStack_f9b | (bStack_f8b >= bStack_f9b) * bStack_f8b;
    bStack_199a = (bStack_f8a < bStack_f9a) * bStack_f9a | (bStack_f8a >= bStack_f9a) * bStack_f8a;
    bStack_1999 = (bStack_f89 < bStack_f99) * bStack_f99 | (bStack_f89 >= bStack_f99) * bStack_f89;
    local_fb8 = CONCAT17(bStack_19a1,
                         CONCAT16(bStack_19a2,
                                  CONCAT15(bStack_19a3,
                                           CONCAT14(bStack_19a4,
                                                    CONCAT13(bStack_19a5,
                                                             CONCAT12(bStack_19a6,
                                                                      CONCAT11(bStack_19a7,
                                                                               local_19a8)))))));
    uStack_fb0 = CONCAT17(bStack_1999,
                          CONCAT16(bStack_199a,
                                   CONCAT15(bStack_199b,
                                            CONCAT14(bStack_199c,
                                                     CONCAT13(bStack_199d,
                                                              CONCAT12(bStack_199e,
                                                                       CONCAT11(bStack_199f,
                                                                                bStack_19a0)))))));
    local_fc8 = CONCAT17(bStack_1921,
                         CONCAT16(bStack_1922,
                                  CONCAT15(bStack_1923,
                                           CONCAT14(bStack_1924,
                                                    CONCAT13(bStack_1925,
                                                             CONCAT12(bStack_1926,
                                                                      CONCAT11(bStack_1927,
                                                                               local_1928)))))));
    uStack_fc0 = CONCAT17(bStack_1919,
                          CONCAT16(bStack_191a,
                                   CONCAT15(bStack_191b,
                                            CONCAT14(bStack_191c,
                                                     CONCAT13(bStack_191d,
                                                              CONCAT12(bStack_191e,
                                                                       CONCAT11(bStack_191f,
                                                                                bStack_1920)))))));
    local_17c8[1] =
         (bStack_19a7 < bStack_1927) * bStack_1927 | (bStack_19a7 >= bStack_1927) * bStack_19a7;
    local_17c8[0] = (local_19a8 < local_1928) * local_1928 | (local_19a8 >= local_1928) * local_19a8
    ;
    bStack_17c6 = (bStack_19a6 < bStack_1926) * bStack_1926 |
                  (bStack_19a6 >= bStack_1926) * bStack_19a6;
    bStack_17c5 = (bStack_19a5 < bStack_1925) * bStack_1925 |
                  (bStack_19a5 >= bStack_1925) * bStack_19a5;
    bStack_17c4 = (bStack_19a4 < bStack_1924) * bStack_1924 |
                  (bStack_19a4 >= bStack_1924) * bStack_19a4;
    bStack_17c3 = (bStack_19a3 < bStack_1923) * bStack_1923 |
                  (bStack_19a3 >= bStack_1923) * bStack_19a3;
    bStack_17c2 = (bStack_19a2 < bStack_1922) * bStack_1922 |
                  (bStack_19a2 >= bStack_1922) * bStack_19a2;
    bStack_17c1 = (bStack_19a1 < bStack_1921) * bStack_1921 |
                  (bStack_19a1 >= bStack_1921) * bStack_19a1;
    uStack_17c0._0_1_ =
         (bStack_19a0 < bStack_1920) * bStack_1920 | (bStack_19a0 >= bStack_1920) * bStack_19a0;
    uStack_17c0._1_1_ =
         (bStack_199f < bStack_191f) * bStack_191f | (bStack_199f >= bStack_191f) * bStack_199f;
    uStack_17c0._2_1_ =
         (bStack_199e < bStack_191e) * bStack_191e | (bStack_199e >= bStack_191e) * bStack_199e;
    uStack_17c0._3_1_ =
         (bStack_199d < bStack_191d) * bStack_191d | (bStack_199d >= bStack_191d) * bStack_199d;
    uStack_17c0._4_1_ =
         (bStack_199c < bStack_191c) * bStack_191c | (bStack_199c >= bStack_191c) * bStack_199c;
    uStack_17c0._5_1_ =
         (bStack_199b < bStack_191b) * bStack_191b | (bStack_199b >= bStack_191b) * bStack_199b;
    uStack_17c0._6_1_ =
         (bStack_199a < bStack_191a) * bStack_191a | (bStack_199a >= bStack_191a) * bStack_199a;
    uStack_17c0._7_1_ =
         (bStack_1999 < bStack_1919) * bStack_1919 | (bStack_1999 >= bStack_1919) * bStack_1999;
    a_08[1] = in_RSI;
    a_08[0] = (longlong)in_RDI;
    b_09[1] = uVar110;
    alVar140 = abs_diff(a_08,b_09);
    b_10[0] = alVar140[1];
    a_09[1] = in_RSI;
    a_09[0] = (longlong)in_RDI;
    b_10[1] = uVar110;
    alVar140 = abs_diff(a_09,b_10);
    b_11[0] = alVar140[1];
    local_fd8 = (byte)extraout_XMM0_Qa_09;
    bStack_fd7 = (byte)((ulong)extraout_XMM0_Qa_09 >> 8);
    bStack_fd6 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x10);
    bStack_fd5 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x18);
    bStack_fd4 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x20);
    bStack_fd3 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x28);
    bStack_fd2 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x30);
    bStack_fd1 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x38);
    bStack_fd0 = (byte)extraout_XMM0_Qb_09;
    bStack_fcf = (byte)((ulong)extraout_XMM0_Qb_09 >> 8);
    bStack_fce = (byte)((ulong)extraout_XMM0_Qb_09 >> 0x10);
    bStack_fcd = (byte)((ulong)extraout_XMM0_Qb_09 >> 0x18);
    bStack_fcc = (byte)((ulong)extraout_XMM0_Qb_09 >> 0x20);
    bStack_fcb = (byte)((ulong)extraout_XMM0_Qb_09 >> 0x28);
    bStack_fca = (byte)((ulong)extraout_XMM0_Qb_09 >> 0x30);
    bStack_fc9 = (byte)((ulong)extraout_XMM0_Qb_09 >> 0x38);
    local_fe8 = (byte)extraout_XMM0_Qa_10;
    bStack_fe7 = (byte)((ulong)extraout_XMM0_Qa_10 >> 8);
    bStack_fe6 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x10);
    bStack_fe5 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x18);
    bStack_fe4 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x20);
    bStack_fe3 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x28);
    bStack_fe2 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x30);
    bStack_fe1 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x38);
    bStack_fe0 = (byte)extraout_XMM0_Qb_10;
    bStack_fdf = (byte)((ulong)extraout_XMM0_Qb_10 >> 8);
    bStack_fde = (byte)((ulong)extraout_XMM0_Qb_10 >> 0x10);
    bStack_fdd = (byte)((ulong)extraout_XMM0_Qb_10 >> 0x18);
    bStack_fdc = (byte)((ulong)extraout_XMM0_Qb_10 >> 0x20);
    bStack_fdb = (byte)((ulong)extraout_XMM0_Qb_10 >> 0x28);
    bStack_fda = (byte)((ulong)extraout_XMM0_Qb_10 >> 0x30);
    bStack_fd9 = (byte)((ulong)extraout_XMM0_Qb_10 >> 0x38);
    local_19a8 = (local_fd8 < local_fe8) * local_fe8 | (local_fd8 >= local_fe8) * local_fd8;
    bStack_19a7 = (bStack_fd7 < bStack_fe7) * bStack_fe7 | (bStack_fd7 >= bStack_fe7) * bStack_fd7;
    bStack_19a6 = (bStack_fd6 < bStack_fe6) * bStack_fe6 | (bStack_fd6 >= bStack_fe6) * bStack_fd6;
    bStack_19a5 = (bStack_fd5 < bStack_fe5) * bStack_fe5 | (bStack_fd5 >= bStack_fe5) * bStack_fd5;
    bStack_19a4 = (bStack_fd4 < bStack_fe4) * bStack_fe4 | (bStack_fd4 >= bStack_fe4) * bStack_fd4;
    bStack_19a3 = (bStack_fd3 < bStack_fe3) * bStack_fe3 | (bStack_fd3 >= bStack_fe3) * bStack_fd3;
    bStack_19a2 = (bStack_fd2 < bStack_fe2) * bStack_fe2 | (bStack_fd2 >= bStack_fe2) * bStack_fd2;
    bStack_19a1 = (bStack_fd1 < bStack_fe1) * bStack_fe1 | (bStack_fd1 >= bStack_fe1) * bStack_fd1;
    bStack_19a0 = (bStack_fd0 < bStack_fe0) * bStack_fe0 | (bStack_fd0 >= bStack_fe0) * bStack_fd0;
    bStack_199f = (bStack_fcf < bStack_fdf) * bStack_fdf | (bStack_fcf >= bStack_fdf) * bStack_fcf;
    bStack_199e = (bStack_fce < bStack_fde) * bStack_fde | (bStack_fce >= bStack_fde) * bStack_fce;
    bStack_199d = (bStack_fcd < bStack_fdd) * bStack_fdd | (bStack_fcd >= bStack_fdd) * bStack_fcd;
    bStack_199c = (bStack_fcc < bStack_fdc) * bStack_fdc | (bStack_fcc >= bStack_fdc) * bStack_fcc;
    bStack_199b = (bStack_fcb < bStack_fdb) * bStack_fdb | (bStack_fcb >= bStack_fdb) * bStack_fcb;
    bStack_199a = (bStack_fca < bStack_fda) * bStack_fda | (bStack_fca >= bStack_fda) * bStack_fca;
    bStack_1999 = (bStack_fc9 < bStack_fd9) * bStack_fd9 | (bStack_fc9 >= bStack_fd9) * bStack_fc9;
    local_ff8 = CONCAT17(bStack_19a1,
                         CONCAT16(bStack_19a2,
                                  CONCAT15(bStack_19a3,
                                           CONCAT14(bStack_19a4,
                                                    CONCAT13(bStack_19a5,
                                                             CONCAT12(bStack_19a6,
                                                                      CONCAT11(bStack_19a7,
                                                                               local_19a8)))))));
    uStack_ff0 = CONCAT17(bStack_1999,
                          CONCAT16(bStack_199a,
                                   CONCAT15(bStack_199b,
                                            CONCAT14(bStack_199c,
                                                     CONCAT13(bStack_199d,
                                                              CONCAT12(bStack_199e,
                                                                       CONCAT11(bStack_199f,
                                                                                bStack_19a0)))))));
    local_1008 = _local_17c8;
    lVar87 = local_1008;
    uStack_1000 = uStack_17c0;
    lVar88 = uStack_1000;
    local_1008._0_1_ = local_17c8[0];
    local_1008._1_1_ = local_17c8[1];
    local_1008._2_1_ = local_17c8[2];
    local_1008._3_1_ = local_17c8[3];
    local_1008._4_1_ = local_17c8[4];
    local_1008._5_1_ = local_17c8[5];
    local_1008._6_1_ = local_17c8[6];
    local_1008._7_1_ = local_17c8[7];
    uStack_1000._0_1_ = local_17c8[8];
    uStack_1000._1_1_ = local_17c8[9];
    uStack_1000._2_1_ = local_17c8[10];
    uStack_1000._3_1_ = local_17c8[0xb];
    uStack_1000._4_1_ = local_17c8[0xc];
    uStack_1000._5_1_ = local_17c8[0xd];
    uStack_1000._6_1_ = local_17c8[0xe];
    uStack_1000._7_1_ = local_17c8[0xf];
    local_17c8[1] =
         (bStack_19a7 < local_1008._1_1_) * local_1008._1_1_ |
         (bStack_19a7 >= local_1008._1_1_) * bStack_19a7;
    local_17c8[0] =
         (local_19a8 < (byte)local_1008) * (byte)local_1008 |
         (local_19a8 >= (byte)local_1008) * local_19a8;
    bStack_17c6 = (bStack_19a6 < local_1008._2_1_) * local_1008._2_1_ |
                  (bStack_19a6 >= local_1008._2_1_) * bStack_19a6;
    bStack_17c5 = (bStack_19a5 < local_1008._3_1_) * local_1008._3_1_ |
                  (bStack_19a5 >= local_1008._3_1_) * bStack_19a5;
    bStack_17c4 = (bStack_19a4 < local_1008._4_1_) * local_1008._4_1_ |
                  (bStack_19a4 >= local_1008._4_1_) * bStack_19a4;
    bStack_17c3 = (bStack_19a3 < local_1008._5_1_) * local_1008._5_1_ |
                  (bStack_19a3 >= local_1008._5_1_) * bStack_19a3;
    bStack_17c2 = (bStack_19a2 < local_1008._6_1_) * local_1008._6_1_ |
                  (bStack_19a2 >= local_1008._6_1_) * bStack_19a2;
    bStack_17c1 = (bStack_19a1 < local_1008._7_1_) * local_1008._7_1_ |
                  (bStack_19a1 >= local_1008._7_1_) * bStack_19a1;
    uStack_17c0._0_1_ =
         (bStack_19a0 < (byte)uStack_1000) * (byte)uStack_1000 |
         (bStack_19a0 >= (byte)uStack_1000) * bStack_19a0;
    uStack_17c0._1_1_ =
         (bStack_199f < uStack_1000._1_1_) * uStack_1000._1_1_ |
         (bStack_199f >= uStack_1000._1_1_) * bStack_199f;
    uStack_17c0._2_1_ =
         (bStack_199e < uStack_1000._2_1_) * uStack_1000._2_1_ |
         (bStack_199e >= uStack_1000._2_1_) * bStack_199e;
    uStack_17c0._3_1_ =
         (bStack_199d < uStack_1000._3_1_) * uStack_1000._3_1_ |
         (bStack_199d >= uStack_1000._3_1_) * bStack_199d;
    uStack_17c0._4_1_ =
         (bStack_199c < uStack_1000._4_1_) * uStack_1000._4_1_ |
         (bStack_199c >= uStack_1000._4_1_) * bStack_199c;
    uStack_17c0._5_1_ =
         (bStack_199b < uStack_1000._5_1_) * uStack_1000._5_1_ |
         (bStack_199b >= uStack_1000._5_1_) * bStack_199b;
    uStack_17c0._6_1_ =
         (bStack_199a < uStack_1000._6_1_) * uStack_1000._6_1_ |
         (bStack_199a >= uStack_1000._6_1_) * bStack_199a;
    uStack_17c0._7_1_ =
         (bStack_1999 < uStack_1000._7_1_) * uStack_1000._7_1_ |
         (bStack_1999 >= uStack_1000._7_1_) * bStack_1999;
    a_10[1] = in_RSI;
    a_10[0] = (longlong)in_RDI;
    b_11[1] = uVar110;
    local_1008 = lVar87;
    uStack_1000 = lVar88;
    alVar140 = abs_diff(a_10,b_11);
    b_12[0] = alVar140[1];
    a_11[1] = in_RSI;
    a_11[0] = (longlong)in_RDI;
    b_12[1] = uVar110;
    alVar140 = abs_diff(a_11,b_12);
    b_13[0] = alVar140[1];
    local_1018 = (byte)extraout_XMM0_Qa_11;
    bStack_1017 = (byte)((ulong)extraout_XMM0_Qa_11 >> 8);
    bStack_1016 = (byte)((ulong)extraout_XMM0_Qa_11 >> 0x10);
    bStack_1015 = (byte)((ulong)extraout_XMM0_Qa_11 >> 0x18);
    bStack_1014 = (byte)((ulong)extraout_XMM0_Qa_11 >> 0x20);
    bStack_1013 = (byte)((ulong)extraout_XMM0_Qa_11 >> 0x28);
    bStack_1012 = (byte)((ulong)extraout_XMM0_Qa_11 >> 0x30);
    bStack_1011 = (byte)((ulong)extraout_XMM0_Qa_11 >> 0x38);
    bStack_1010 = (byte)extraout_XMM0_Qb_11;
    bStack_100f = (byte)((ulong)extraout_XMM0_Qb_11 >> 8);
    bStack_100e = (byte)((ulong)extraout_XMM0_Qb_11 >> 0x10);
    bStack_100d = (byte)((ulong)extraout_XMM0_Qb_11 >> 0x18);
    bStack_100c = (byte)((ulong)extraout_XMM0_Qb_11 >> 0x20);
    bStack_100b = (byte)((ulong)extraout_XMM0_Qb_11 >> 0x28);
    bStack_100a = (byte)((ulong)extraout_XMM0_Qb_11 >> 0x30);
    bStack_1009 = (byte)((ulong)extraout_XMM0_Qb_11 >> 0x38);
    local_1028 = (byte)extraout_XMM0_Qa_12;
    bStack_1027 = (byte)((ulong)extraout_XMM0_Qa_12 >> 8);
    bStack_1026 = (byte)((ulong)extraout_XMM0_Qa_12 >> 0x10);
    bStack_1025 = (byte)((ulong)extraout_XMM0_Qa_12 >> 0x18);
    bStack_1024 = (byte)((ulong)extraout_XMM0_Qa_12 >> 0x20);
    bStack_1023 = (byte)((ulong)extraout_XMM0_Qa_12 >> 0x28);
    bStack_1022 = (byte)((ulong)extraout_XMM0_Qa_12 >> 0x30);
    bStack_1021 = (byte)((ulong)extraout_XMM0_Qa_12 >> 0x38);
    bStack_1020 = (byte)extraout_XMM0_Qb_12;
    bStack_101f = (byte)((ulong)extraout_XMM0_Qb_12 >> 8);
    bStack_101e = (byte)((ulong)extraout_XMM0_Qb_12 >> 0x10);
    bStack_101d = (byte)((ulong)extraout_XMM0_Qb_12 >> 0x18);
    bStack_101c = (byte)((ulong)extraout_XMM0_Qb_12 >> 0x20);
    bStack_101b = (byte)((ulong)extraout_XMM0_Qb_12 >> 0x28);
    bStack_101a = (byte)((ulong)extraout_XMM0_Qb_12 >> 0x30);
    bStack_1019 = (byte)((ulong)extraout_XMM0_Qb_12 >> 0x38);
    local_19a8 = (local_1018 < local_1028) * local_1028 | (local_1018 >= local_1028) * local_1018;
    bStack_19a7 = (bStack_1017 < bStack_1027) * bStack_1027 |
                  (bStack_1017 >= bStack_1027) * bStack_1017;
    bStack_19a6 = (bStack_1016 < bStack_1026) * bStack_1026 |
                  (bStack_1016 >= bStack_1026) * bStack_1016;
    bStack_19a5 = (bStack_1015 < bStack_1025) * bStack_1025 |
                  (bStack_1015 >= bStack_1025) * bStack_1015;
    bStack_19a4 = (bStack_1014 < bStack_1024) * bStack_1024 |
                  (bStack_1014 >= bStack_1024) * bStack_1014;
    bStack_19a3 = (bStack_1013 < bStack_1023) * bStack_1023 |
                  (bStack_1013 >= bStack_1023) * bStack_1013;
    bStack_19a2 = (bStack_1012 < bStack_1022) * bStack_1022 |
                  (bStack_1012 >= bStack_1022) * bStack_1012;
    bStack_19a1 = (bStack_1011 < bStack_1021) * bStack_1021 |
                  (bStack_1011 >= bStack_1021) * bStack_1011;
    bStack_19a0 = (bStack_1010 < bStack_1020) * bStack_1020 |
                  (bStack_1010 >= bStack_1020) * bStack_1010;
    bStack_199f = (bStack_100f < bStack_101f) * bStack_101f |
                  (bStack_100f >= bStack_101f) * bStack_100f;
    bStack_199e = (bStack_100e < bStack_101e) * bStack_101e |
                  (bStack_100e >= bStack_101e) * bStack_100e;
    bStack_199d = (bStack_100d < bStack_101d) * bStack_101d |
                  (bStack_100d >= bStack_101d) * bStack_100d;
    bStack_199c = (bStack_100c < bStack_101c) * bStack_101c |
                  (bStack_100c >= bStack_101c) * bStack_100c;
    bStack_199b = (bStack_100b < bStack_101b) * bStack_101b |
                  (bStack_100b >= bStack_101b) * bStack_100b;
    bStack_199a = (bStack_100a < bStack_101a) * bStack_101a |
                  (bStack_100a >= bStack_101a) * bStack_100a;
    bStack_1999 = (bStack_1009 < bStack_1019) * bStack_1019 |
                  (bStack_1009 >= bStack_1019) * bStack_1009;
    local_c58 = _local_17c8;
    lStack_c50 = uStack_17c0;
    local_c68 = local_1768;
    uStack_c60 = uStack_1760;
    auVar55._8_8_ = uStack_1760;
    auVar55._0_8_ = local_1768;
    auVar114 = psubusb((undefined1  [16])_local_17c8,auVar55);
    _local_17c8 = auVar114._0_8_;
    uStack_17c0 = auVar114._8_8_;
    local_1138 = _local_17c8;
    lVar87 = local_1138;
    uStack_1130 = uStack_17c0;
    lVar88 = uStack_1130;
    local_1148 = local_1758;
    uVar97 = local_1148;
    uStack_1140 = uStack_1750;
    uVar98 = uStack_1140;
    local_1138._0_1_ = auVar114[0];
    local_1138._1_1_ = auVar114[1];
    local_1138._2_1_ = auVar114[2];
    local_1138._3_1_ = auVar114[3];
    local_1138._4_1_ = auVar114[4];
    local_1138._5_1_ = auVar114[5];
    local_1138._6_1_ = auVar114[6];
    local_1138._7_1_ = auVar114[7];
    uStack_1130._0_1_ = auVar114[8];
    uStack_1130._1_1_ = auVar114[9];
    uStack_1130._2_1_ = auVar114[10];
    uStack_1130._3_1_ = auVar114[0xb];
    uStack_1130._4_1_ = auVar114[0xc];
    uStack_1130._5_1_ = auVar114[0xd];
    uStack_1130._6_1_ = auVar114[0xe];
    uStack_1130._7_1_ = auVar114[0xf];
    local_1148._0_1_ = (char)local_1758;
    local_1148._1_1_ = (char)((ulong)local_1758 >> 8);
    local_1148._2_1_ = (char)((ulong)local_1758 >> 0x10);
    local_1148._3_1_ = (char)((ulong)local_1758 >> 0x18);
    local_1148._4_1_ = (char)((ulong)local_1758 >> 0x20);
    local_1148._5_1_ = (char)((ulong)local_1758 >> 0x28);
    local_1148._6_1_ = (char)((ulong)local_1758 >> 0x30);
    local_1148._7_1_ = (char)((ulong)local_1758 >> 0x38);
    uStack_1140._0_1_ = (char)uStack_1750;
    uStack_1140._1_1_ = (char)((ulong)uStack_1750 >> 8);
    uStack_1140._2_1_ = (char)((ulong)uStack_1750 >> 0x10);
    uStack_1140._3_1_ = (char)((ulong)uStack_1750 >> 0x18);
    uStack_1140._4_1_ = (char)((ulong)uStack_1750 >> 0x20);
    uStack_1140._5_1_ = (char)((ulong)uStack_1750 >> 0x28);
    uStack_1140._6_1_ = (char)((ulong)uStack_1750 >> 0x30);
    uStack_1140._7_1_ = (char)((ulong)uStack_1750 >> 0x38);
    local_17c8 = (undefined1  [2])
                 CONCAT11(-(local_1138._1_1_ == local_1148._1_1_),
                          -((char)local_1138 == (char)local_1148));
    _local_17c8 = CONCAT12(-(local_1138._2_1_ == local_1148._2_1_),local_17c8);
    _local_17c8 = CONCAT13(-(local_1138._3_1_ == local_1148._3_1_),_local_17c8);
    _local_17c8 = CONCAT14(-(local_1138._4_1_ == local_1148._4_1_),_local_17c8);
    _local_17c8 = CONCAT15(-(local_1138._5_1_ == local_1148._5_1_),_local_17c8);
    _local_17c8 = CONCAT16(-(local_1138._6_1_ == local_1148._6_1_),_local_17c8);
    _local_17c8 = CONCAT17(-(local_1138._7_1_ == local_1148._7_1_),_local_17c8);
    uStack_17c0._0_1_ = -((char)uStack_1130 == (char)uStack_1140);
    uStack_17c0._1_1_ = -(uStack_1130._1_1_ == uStack_1140._1_1_);
    uStack_17c0._2_1_ = -(uStack_1130._2_1_ == uStack_1140._2_1_);
    uStack_17c0._3_1_ = -(uStack_1130._3_1_ == uStack_1140._3_1_);
    uStack_17c0._4_1_ = -(uStack_1130._4_1_ == uStack_1140._4_1_);
    uStack_17c0._5_1_ = -(uStack_1130._5_1_ == uStack_1140._5_1_);
    uStack_17c0._6_1_ = -(uStack_1130._6_1_ == uStack_1140._6_1_);
    uStack_17c0._7_1_ = -(uStack_1130._7_1_ == uStack_1140._7_1_);
    local_cd8 = _local_17c8;
    uStack_cd0 = uStack_17c0;
    local_ce8 = local_17a8;
    uStack_ce0 = uStack_17a0;
    _local_17c8 = _local_17c8 & local_17a8;
    uStack_17c0 = uStack_17c0 & uStack_17a0;
    a_12[1] = in_RSI;
    a_12[0] = (longlong)in_RDI;
    b_13[1] = uVar110;
    local_1148 = uVar97;
    uStack_1140 = uVar98;
    local_1138 = lVar87;
    uStack_1130 = lVar88;
    alVar140 = abs_diff(a_12,b_13);
    b_14[0] = alVar140[1];
    a_13[1] = in_RSI;
    a_13[0] = (longlong)in_RDI;
    b_14[1] = uVar110;
    alVar140 = abs_diff(a_13,b_14);
    b_15[0] = alVar140[1];
    local_1038 = (byte)extraout_XMM0_Qa_13;
    bStack_1037 = (byte)((ulong)extraout_XMM0_Qa_13 >> 8);
    bStack_1036 = (byte)((ulong)extraout_XMM0_Qa_13 >> 0x10);
    bStack_1035 = (byte)((ulong)extraout_XMM0_Qa_13 >> 0x18);
    bStack_1034 = (byte)((ulong)extraout_XMM0_Qa_13 >> 0x20);
    bStack_1033 = (byte)((ulong)extraout_XMM0_Qa_13 >> 0x28);
    bStack_1032 = (byte)((ulong)extraout_XMM0_Qa_13 >> 0x30);
    bStack_1031 = (byte)((ulong)extraout_XMM0_Qa_13 >> 0x38);
    bStack_1030 = (byte)extraout_XMM0_Qb_13;
    bStack_102f = (byte)((ulong)extraout_XMM0_Qb_13 >> 8);
    bStack_102e = (byte)((ulong)extraout_XMM0_Qb_13 >> 0x10);
    bStack_102d = (byte)((ulong)extraout_XMM0_Qb_13 >> 0x18);
    bStack_102c = (byte)((ulong)extraout_XMM0_Qb_13 >> 0x20);
    bStack_102b = (byte)((ulong)extraout_XMM0_Qb_13 >> 0x28);
    bStack_102a = (byte)((ulong)extraout_XMM0_Qb_13 >> 0x30);
    bStack_1029 = (byte)((ulong)extraout_XMM0_Qb_13 >> 0x38);
    local_1048 = (byte)extraout_XMM0_Qa_14;
    bStack_1047 = (byte)((ulong)extraout_XMM0_Qa_14 >> 8);
    bStack_1046 = (byte)((ulong)extraout_XMM0_Qa_14 >> 0x10);
    bStack_1045 = (byte)((ulong)extraout_XMM0_Qa_14 >> 0x18);
    bStack_1044 = (byte)((ulong)extraout_XMM0_Qa_14 >> 0x20);
    bStack_1043 = (byte)((ulong)extraout_XMM0_Qa_14 >> 0x28);
    bStack_1042 = (byte)((ulong)extraout_XMM0_Qa_14 >> 0x30);
    bStack_1041 = (byte)((ulong)extraout_XMM0_Qa_14 >> 0x38);
    bStack_1040 = (byte)extraout_XMM0_Qb_14;
    bStack_103f = (byte)((ulong)extraout_XMM0_Qb_14 >> 8);
    bStack_103e = (byte)((ulong)extraout_XMM0_Qb_14 >> 0x10);
    bStack_103d = (byte)((ulong)extraout_XMM0_Qb_14 >> 0x18);
    bStack_103c = (byte)((ulong)extraout_XMM0_Qb_14 >> 0x20);
    bStack_103b = (byte)((ulong)extraout_XMM0_Qb_14 >> 0x28);
    bStack_103a = (byte)((ulong)extraout_XMM0_Qb_14 >> 0x30);
    bStack_1039 = (byte)((ulong)extraout_XMM0_Qb_14 >> 0x38);
    bVar111 = (local_1038 < local_1048) * local_1048 | (local_1038 >= local_1048) * local_1038;
    bVar116 = (bStack_1037 < bStack_1047) * bStack_1047 | (bStack_1037 >= bStack_1047) * bStack_1037
    ;
    bVar117 = (bStack_1036 < bStack_1046) * bStack_1046 | (bStack_1036 >= bStack_1046) * bStack_1036
    ;
    bVar119 = (bStack_1035 < bStack_1045) * bStack_1045 | (bStack_1035 >= bStack_1045) * bStack_1035
    ;
    bVar120 = (bStack_1034 < bStack_1044) * bStack_1044 | (bStack_1034 >= bStack_1044) * bStack_1034
    ;
    bVar122 = (bStack_1033 < bStack_1043) * bStack_1043 | (bStack_1033 >= bStack_1043) * bStack_1033
    ;
    bVar123 = (bStack_1032 < bStack_1042) * bStack_1042 | (bStack_1032 >= bStack_1042) * bStack_1032
    ;
    bVar125 = (bStack_1031 < bStack_1041) * bStack_1041 | (bStack_1031 >= bStack_1041) * bStack_1031
    ;
    bVar126 = (bStack_1030 < bStack_1040) * bStack_1040 | (bStack_1030 >= bStack_1040) * bStack_1030
    ;
    bVar130 = (bStack_102f < bStack_103f) * bStack_103f | (bStack_102f >= bStack_103f) * bStack_102f
    ;
    bVar131 = (bStack_102e < bStack_103e) * bStack_103e | (bStack_102e >= bStack_103e) * bStack_102e
    ;
    bVar133 = (bStack_102d < bStack_103d) * bStack_103d | (bStack_102d >= bStack_103d) * bStack_102d
    ;
    bVar134 = (bStack_102c < bStack_103c) * bStack_103c | (bStack_102c >= bStack_103c) * bStack_102c
    ;
    bVar136 = (bStack_102b < bStack_103b) * bStack_103b | (bStack_102b >= bStack_103b) * bStack_102b
    ;
    bVar137 = (bStack_102a < bStack_103a) * bStack_103a | (bStack_102a >= bStack_103a) * bStack_102a
    ;
    bVar139 = (bStack_1029 < bStack_1039) * bStack_1039 | (bStack_1029 >= bStack_1039) * bStack_1029
    ;
    local_17d8._0_2_ = CONCAT11(bVar116,bVar111);
    local_17d8._0_3_ = CONCAT12(bVar117,(undefined2)local_17d8);
    local_17d8._0_4_ = CONCAT13(bVar119,(undefined3)local_17d8);
    local_17d8._0_5_ = CONCAT14(bVar120,(undefined4)local_17d8);
    local_17d8._0_6_ = CONCAT15(bVar122,(undefined5)local_17d8);
    local_17d8._0_7_ = CONCAT16(bVar123,(undefined6)local_17d8);
    local_17d8 = CONCAT17(bVar125,(undefined7)local_17d8);
    uStack_17d0._0_1_ = bVar126;
    uStack_17d0._1_1_ = bVar130;
    uStack_17d0._2_1_ = bVar131;
    uStack_17d0._3_1_ = bVar133;
    uStack_17d0._4_1_ = bVar134;
    uStack_17d0._5_1_ = bVar136;
    uStack_17d0._6_1_ = bVar137;
    uStack_17d0._7_1_ = bVar139;
    local_1058 = CONCAT17(bStack_19a1,
                          CONCAT16(bStack_19a2,
                                   CONCAT15(bStack_19a3,
                                            CONCAT14(bStack_19a4,
                                                     CONCAT13(bStack_19a5,
                                                              CONCAT12(bStack_19a6,
                                                                       CONCAT11(bStack_19a7,
                                                                                local_19a8)))))));
    uStack_1050 = CONCAT17(bStack_1999,
                           CONCAT16(bStack_199a,
                                    CONCAT15(bStack_199b,
                                             CONCAT14(bStack_199c,
                                                      CONCAT13(bStack_199d,
                                                               CONCAT12(bStack_199e,
                                                                        CONCAT11(bStack_199f,
                                                                                 bStack_19a0)))))));
    local_1068 = local_17d8;
    lStack_1060 = uStack_17d0;
    local_17d8._1_1_ = (bStack_19a7 < bVar116) * bVar116 | (bStack_19a7 >= bVar116) * bStack_19a7;
    local_17d8._0_1_ = (local_19a8 < bVar111) * bVar111 | (local_19a8 >= bVar111) * local_19a8;
    local_17d8._2_1_ = (bStack_19a6 < bVar117) * bVar117 | (bStack_19a6 >= bVar117) * bStack_19a6;
    local_17d8._3_1_ = (bStack_19a5 < bVar119) * bVar119 | (bStack_19a5 >= bVar119) * bStack_19a5;
    local_17d8._4_1_ = (bStack_19a4 < bVar120) * bVar120 | (bStack_19a4 >= bVar120) * bStack_19a4;
    local_17d8._5_1_ = (bStack_19a3 < bVar122) * bVar122 | (bStack_19a3 >= bVar122) * bStack_19a3;
    local_17d8._6_1_ = (bStack_19a2 < bVar123) * bVar123 | (bStack_19a2 >= bVar123) * bStack_19a2;
    local_17d8._7_1_ = (bStack_19a1 < bVar125) * bVar125 | (bStack_19a1 >= bVar125) * bStack_19a1;
    uStack_17d0._0_1_ = (bStack_19a0 < bVar126) * bVar126 | (bStack_19a0 >= bVar126) * bStack_19a0;
    uStack_17d0._1_1_ = (bStack_199f < bVar130) * bVar130 | (bStack_199f >= bVar130) * bStack_199f;
    uStack_17d0._2_1_ = (bStack_199e < bVar131) * bVar131 | (bStack_199e >= bVar131) * bStack_199e;
    uStack_17d0._3_1_ = (bStack_199d < bVar133) * bVar133 | (bStack_199d >= bVar133) * bStack_199d;
    uStack_17d0._4_1_ = (bStack_199c < bVar134) * bVar134 | (bStack_199c >= bVar134) * bStack_199c;
    uStack_17d0._5_1_ = (bStack_199b < bVar136) * bVar136 | (bStack_199b >= bVar136) * bStack_199b;
    uStack_17d0._6_1_ = (bStack_199a < bVar137) * bVar137 | (bStack_199a >= bVar137) * bStack_199a;
    uStack_17d0._7_1_ = (bStack_1999 < bVar139) * bVar139 | (bStack_1999 >= bVar139) * bStack_1999;
    a_14[1] = in_RSI;
    a_14[0] = (longlong)in_RDI;
    b_15[1] = uVar110;
    alVar140 = abs_diff(a_14,b_15);
    b_16[0] = alVar140[1];
    a_15[1] = in_RSI;
    a_15[0] = (longlong)in_RDI;
    b_16[1] = uVar110;
    abs_diff(a_15,b_16);
    local_1078 = (byte)extraout_XMM0_Qa_15;
    bStack_1077 = (byte)((ulong)extraout_XMM0_Qa_15 >> 8);
    bStack_1076 = (byte)((ulong)extraout_XMM0_Qa_15 >> 0x10);
    bStack_1075 = (byte)((ulong)extraout_XMM0_Qa_15 >> 0x18);
    bStack_1074 = (byte)((ulong)extraout_XMM0_Qa_15 >> 0x20);
    bStack_1073 = (byte)((ulong)extraout_XMM0_Qa_15 >> 0x28);
    bStack_1072 = (byte)((ulong)extraout_XMM0_Qa_15 >> 0x30);
    bStack_1071 = (byte)((ulong)extraout_XMM0_Qa_15 >> 0x38);
    bStack_1070 = (byte)extraout_XMM0_Qb_15;
    bStack_106f = (byte)((ulong)extraout_XMM0_Qb_15 >> 8);
    bStack_106e = (byte)((ulong)extraout_XMM0_Qb_15 >> 0x10);
    bStack_106d = (byte)((ulong)extraout_XMM0_Qb_15 >> 0x18);
    bStack_106c = (byte)((ulong)extraout_XMM0_Qb_15 >> 0x20);
    bStack_106b = (byte)((ulong)extraout_XMM0_Qb_15 >> 0x28);
    bStack_106a = (byte)((ulong)extraout_XMM0_Qb_15 >> 0x30);
    bStack_1069 = (byte)((ulong)extraout_XMM0_Qb_15 >> 0x38);
    local_1088 = (byte)extraout_XMM0_Qa_16;
    bStack_1087 = (byte)((ulong)extraout_XMM0_Qa_16 >> 8);
    bStack_1086 = (byte)((ulong)extraout_XMM0_Qa_16 >> 0x10);
    bStack_1085 = (byte)((ulong)extraout_XMM0_Qa_16 >> 0x18);
    bStack_1084 = (byte)((ulong)extraout_XMM0_Qa_16 >> 0x20);
    bStack_1083 = (byte)((ulong)extraout_XMM0_Qa_16 >> 0x28);
    bStack_1082 = (byte)((ulong)extraout_XMM0_Qa_16 >> 0x30);
    bStack_1081 = (byte)((ulong)extraout_XMM0_Qa_16 >> 0x38);
    bStack_1080 = (byte)extraout_XMM0_Qb_16;
    bStack_107f = (byte)((ulong)extraout_XMM0_Qb_16 >> 8);
    bStack_107e = (byte)((ulong)extraout_XMM0_Qb_16 >> 0x10);
    bStack_107d = (byte)((ulong)extraout_XMM0_Qb_16 >> 0x18);
    bStack_107c = (byte)((ulong)extraout_XMM0_Qb_16 >> 0x20);
    bStack_107b = (byte)((ulong)extraout_XMM0_Qb_16 >> 0x28);
    bStack_107a = (byte)((ulong)extraout_XMM0_Qb_16 >> 0x30);
    bStack_1079 = (byte)((ulong)extraout_XMM0_Qb_16 >> 0x38);
    local_19a8 = (local_1078 < local_1088) * local_1088 | (local_1078 >= local_1088) * local_1078;
    bStack_19a7 = (bStack_1077 < bStack_1087) * bStack_1087 |
                  (bStack_1077 >= bStack_1087) * bStack_1077;
    bStack_19a6 = (bStack_1076 < bStack_1086) * bStack_1086 |
                  (bStack_1076 >= bStack_1086) * bStack_1076;
    bStack_19a5 = (bStack_1075 < bStack_1085) * bStack_1085 |
                  (bStack_1075 >= bStack_1085) * bStack_1075;
    bStack_19a4 = (bStack_1074 < bStack_1084) * bStack_1084 |
                  (bStack_1074 >= bStack_1084) * bStack_1074;
    bStack_19a3 = (bStack_1073 < bStack_1083) * bStack_1083 |
                  (bStack_1073 >= bStack_1083) * bStack_1073;
    bStack_19a2 = (bStack_1072 < bStack_1082) * bStack_1082 |
                  (bStack_1072 >= bStack_1082) * bStack_1072;
    bStack_19a1 = (bStack_1071 < bStack_1081) * bStack_1081 |
                  (bStack_1071 >= bStack_1081) * bStack_1071;
    bStack_19a0 = (bStack_1070 < bStack_1080) * bStack_1080 |
                  (bStack_1070 >= bStack_1080) * bStack_1070;
    bStack_199f = (bStack_106f < bStack_107f) * bStack_107f |
                  (bStack_106f >= bStack_107f) * bStack_106f;
    bStack_199e = (bStack_106e < bStack_107e) * bStack_107e |
                  (bStack_106e >= bStack_107e) * bStack_106e;
    bStack_199d = (bStack_106d < bStack_107d) * bStack_107d |
                  (bStack_106d >= bStack_107d) * bStack_106d;
    bStack_199c = (bStack_106c < bStack_107c) * bStack_107c |
                  (bStack_106c >= bStack_107c) * bStack_106c;
    bStack_199b = (bStack_106b < bStack_107b) * bStack_107b |
                  (bStack_106b >= bStack_107b) * bStack_106b;
    bStack_199a = (bStack_106a < bStack_107a) * bStack_107a |
                  (bStack_106a >= bStack_107a) * bStack_106a;
    bStack_1999 = (bStack_1069 < bStack_1079) * bStack_1079 |
                  (bStack_1069 >= bStack_1079) * bStack_1069;
    local_1098 = CONCAT17(bStack_19a1,
                          CONCAT16(bStack_19a2,
                                   CONCAT15(bStack_19a3,
                                            CONCAT14(bStack_19a4,
                                                     CONCAT13(bStack_19a5,
                                                              CONCAT12(bStack_19a6,
                                                                       CONCAT11(bStack_19a7,
                                                                                local_19a8)))))));
    uStack_1090 = CONCAT17(bStack_1999,
                           CONCAT16(bStack_199a,
                                    CONCAT15(bStack_199b,
                                             CONCAT14(bStack_199c,
                                                      CONCAT13(bStack_199d,
                                                               CONCAT12(bStack_199e,
                                                                        CONCAT11(bStack_199f,
                                                                                 bStack_19a0)))))));
    local_10a8 = local_17d8;
    lVar89 = local_10a8;
    uStack_10a0 = uStack_17d0;
    lVar90 = uStack_10a0;
    local_10a8._0_1_ = (byte)local_17d8;
    local_10a8._1_1_ = local_17d8._1_1_;
    local_10a8._2_1_ = local_17d8._2_1_;
    local_10a8._3_1_ = local_17d8._3_1_;
    local_10a8._4_1_ = local_17d8._4_1_;
    local_10a8._5_1_ = local_17d8._5_1_;
    local_10a8._6_1_ = local_17d8._6_1_;
    local_10a8._7_1_ = local_17d8._7_1_;
    uStack_10a0._0_1_ = local_17d8._8_1_;
    uStack_10a0._1_1_ = local_17d8._9_1_;
    uStack_10a0._2_1_ = local_17d8._10_1_;
    uStack_10a0._3_1_ = local_17d8._11_1_;
    uStack_10a0._4_1_ = local_17d8._12_1_;
    uStack_10a0._5_1_ = local_17d8._13_1_;
    uStack_10a0._6_1_ = local_17d8._14_1_;
    uStack_10a0._7_1_ = local_17d8._15_1_;
    local_17d8._0_2_ =
         CONCAT11((bStack_19a7 < local_10a8._1_1_) * local_10a8._1_1_ |
                  (bStack_19a7 >= local_10a8._1_1_) * bStack_19a7,
                  (local_19a8 < (byte)local_10a8) * (byte)local_10a8 |
                  (local_19a8 >= (byte)local_10a8) * local_19a8);
    local_17d8._0_3_ =
         CONCAT12((bStack_19a6 < local_10a8._2_1_) * local_10a8._2_1_ |
                  (bStack_19a6 >= local_10a8._2_1_) * bStack_19a6,(undefined2)local_17d8);
    local_17d8._0_4_ =
         CONCAT13((bStack_19a5 < local_10a8._3_1_) * local_10a8._3_1_ |
                  (bStack_19a5 >= local_10a8._3_1_) * bStack_19a5,(undefined3)local_17d8);
    local_17d8._0_5_ =
         CONCAT14((bStack_19a4 < local_10a8._4_1_) * local_10a8._4_1_ |
                  (bStack_19a4 >= local_10a8._4_1_) * bStack_19a4,(undefined4)local_17d8);
    local_17d8._0_6_ =
         CONCAT15((bStack_19a3 < local_10a8._5_1_) * local_10a8._5_1_ |
                  (bStack_19a3 >= local_10a8._5_1_) * bStack_19a3,(undefined5)local_17d8);
    local_17d8._0_7_ =
         CONCAT16((bStack_19a2 < local_10a8._6_1_) * local_10a8._6_1_ |
                  (bStack_19a2 >= local_10a8._6_1_) * bStack_19a2,(undefined6)local_17d8);
    local_17d8 = CONCAT17((bStack_19a1 < local_10a8._7_1_) * local_10a8._7_1_ |
                          (bStack_19a1 >= local_10a8._7_1_) * bStack_19a1,(undefined7)local_17d8);
    uStack_17d0._0_1_ =
         (bStack_19a0 < (byte)uStack_10a0) * (byte)uStack_10a0 |
         (bStack_19a0 >= (byte)uStack_10a0) * bStack_19a0;
    uStack_17d0._1_1_ =
         (bStack_199f < uStack_10a0._1_1_) * uStack_10a0._1_1_ |
         (bStack_199f >= uStack_10a0._1_1_) * bStack_199f;
    uStack_17d0._2_1_ =
         (bStack_199e < uStack_10a0._2_1_) * uStack_10a0._2_1_ |
         (bStack_199e >= uStack_10a0._2_1_) * bStack_199e;
    uStack_17d0._3_1_ =
         (bStack_199d < uStack_10a0._3_1_) * uStack_10a0._3_1_ |
         (bStack_199d >= uStack_10a0._3_1_) * bStack_199d;
    uStack_17d0._4_1_ =
         (bStack_199c < uStack_10a0._4_1_) * uStack_10a0._4_1_ |
         (bStack_199c >= uStack_10a0._4_1_) * bStack_199c;
    uStack_17d0._5_1_ =
         (bStack_199b < uStack_10a0._5_1_) * uStack_10a0._5_1_ |
         (bStack_199b >= uStack_10a0._5_1_) * bStack_199b;
    uStack_17d0._6_1_ =
         (bStack_199a < uStack_10a0._6_1_) * uStack_10a0._6_1_ |
         (bStack_199a >= uStack_10a0._6_1_) * bStack_199a;
    uStack_17d0._7_1_ =
         (bStack_1999 < uStack_10a0._7_1_) * uStack_10a0._7_1_ |
         (bStack_1999 >= uStack_10a0._7_1_) * bStack_1999;
    local_c78 = local_17d8;
    lStack_c70 = uStack_17d0;
    local_c88 = local_1768;
    uStack_c80 = uStack_1760;
    auVar54._8_8_ = uStack_17d0;
    auVar54._0_8_ = local_17d8;
    auVar53._8_8_ = uStack_1760;
    auVar53._0_8_ = local_1768;
    auVar114 = psubusb(auVar54,auVar53);
    local_17d8 = auVar114._0_8_;
    uStack_17d0 = auVar114._8_8_;
    local_1158 = local_17d8;
    lVar87 = local_1158;
    uStack_1150 = uStack_17d0;
    lVar88 = uStack_1150;
    local_1168 = local_1758;
    uVar2 = local_1168;
    uStack_1160 = uStack_1750;
    uVar5 = uStack_1160;
    local_1158._0_1_ = auVar114[0];
    local_1158._1_1_ = auVar114[1];
    local_1158._2_1_ = auVar114[2];
    local_1158._3_1_ = auVar114[3];
    local_1158._4_1_ = auVar114[4];
    local_1158._5_1_ = auVar114[5];
    local_1158._6_1_ = auVar114[6];
    local_1158._7_1_ = auVar114[7];
    uStack_1150._0_1_ = auVar114[8];
    uStack_1150._1_1_ = auVar114[9];
    uStack_1150._2_1_ = auVar114[10];
    uStack_1150._3_1_ = auVar114[0xb];
    uStack_1150._4_1_ = auVar114[0xc];
    uStack_1150._5_1_ = auVar114[0xd];
    uStack_1150._6_1_ = auVar114[0xe];
    uStack_1150._7_1_ = auVar114[0xf];
    local_1168._0_1_ = (char)local_1758;
    local_1168._1_1_ = (char)((ulong)local_1758 >> 8);
    local_1168._2_1_ = (char)((ulong)local_1758 >> 0x10);
    local_1168._3_1_ = (char)((ulong)local_1758 >> 0x18);
    local_1168._4_1_ = (char)((ulong)local_1758 >> 0x20);
    local_1168._5_1_ = (char)((ulong)local_1758 >> 0x28);
    local_1168._6_1_ = (char)((ulong)local_1758 >> 0x30);
    local_1168._7_1_ = (char)((ulong)local_1758 >> 0x38);
    uStack_1160._0_1_ = (char)uStack_1750;
    uStack_1160._1_1_ = (char)((ulong)uStack_1750 >> 8);
    uStack_1160._2_1_ = (char)((ulong)uStack_1750 >> 0x10);
    uStack_1160._3_1_ = (char)((ulong)uStack_1750 >> 0x18);
    uStack_1160._4_1_ = (char)((ulong)uStack_1750 >> 0x20);
    uStack_1160._5_1_ = (char)((ulong)uStack_1750 >> 0x28);
    uStack_1160._6_1_ = (char)((ulong)uStack_1750 >> 0x30);
    uStack_1160._7_1_ = (char)((ulong)uStack_1750 >> 0x38);
    local_17d8._0_2_ =
         CONCAT11(-(local_1158._1_1_ == local_1168._1_1_),-((char)local_1158 == (char)local_1168));
    local_17d8._0_3_ = CONCAT12(-(local_1158._2_1_ == local_1168._2_1_),(undefined2)local_17d8);
    local_17d8._0_4_ = CONCAT13(-(local_1158._3_1_ == local_1168._3_1_),(undefined3)local_17d8);
    local_17d8._0_5_ = CONCAT14(-(local_1158._4_1_ == local_1168._4_1_),(undefined4)local_17d8);
    local_17d8._0_6_ = CONCAT15(-(local_1158._5_1_ == local_1168._5_1_),(undefined5)local_17d8);
    local_17d8._0_7_ = CONCAT16(-(local_1158._6_1_ == local_1168._6_1_),(undefined6)local_17d8);
    local_17d8 = CONCAT17(-(local_1158._7_1_ == local_1168._7_1_),(undefined7)local_17d8);
    uStack_17d0._0_1_ = -((char)uStack_1150 == (char)uStack_1160);
    uStack_17d0._1_1_ = -(uStack_1150._1_1_ == uStack_1160._1_1_);
    uStack_17d0._2_1_ = -(uStack_1150._2_1_ == uStack_1160._2_1_);
    uStack_17d0._3_1_ = -(uStack_1150._3_1_ == uStack_1160._3_1_);
    uStack_17d0._4_1_ = -(uStack_1150._4_1_ == uStack_1160._4_1_);
    uStack_17d0._5_1_ = -(uStack_1150._5_1_ == uStack_1160._5_1_);
    uStack_17d0._6_1_ = -(uStack_1150._6_1_ == uStack_1160._6_1_);
    uStack_17d0._7_1_ = -(uStack_1150._7_1_ == uStack_1160._7_1_);
    local_cf8 = local_17d8;
    uStack_cf0 = uStack_17d0;
    local_d08 = _local_17c8;
    uStack_d00 = uStack_17c0;
    local_17d8 = local_17d8 & _local_17c8;
    uStack_17d0 = uStack_17d0 & uStack_17c0;
    local_11eb = 4;
    local_109 = 4;
    local_10a = 4;
    local_10b = 4;
    local_10c = 4;
    local_10d = 4;
    local_10e = 4;
    local_10f = 4;
    local_110 = 4;
    local_111 = 4;
    local_112 = 4;
    local_113 = 4;
    local_114 = 4;
    local_115 = 4;
    local_116 = 4;
    local_117 = 4;
    local_118 = 4;
    local_19b8 = 0x404040404040404;
    uStack_19b0 = 0x404040404040404;
    local_11ec = 3;
    local_e9 = 3;
    local_ea = 3;
    local_eb = 3;
    local_ec = 3;
    local_ed = 3;
    local_ee = 3;
    local_ef = 3;
    local_f0 = 3;
    local_f1 = 3;
    local_f2 = 3;
    local_f3 = 3;
    local_f4 = 3;
    local_f5 = 3;
    local_f6 = 3;
    local_f7 = 3;
    local_f8 = 3;
    local_19c8 = 0x303030303030303;
    uStack_19c0 = 0x303030303030303;
    local_11ed = 0x80;
    local_c9 = 0x80;
    local_ca = 0x80;
    local_cb = 0x80;
    local_cc = 0x80;
    local_cd = 0x80;
    local_ce = 0x80;
    local_cf = 0x80;
    local_d0 = 0x80;
    local_d1 = 0x80;
    local_d2 = 0x80;
    local_d3 = 0x80;
    local_d4 = 0x80;
    local_d5 = 0x80;
    local_d6 = 0x80;
    local_d7 = 0x80;
    local_d8 = 0x80;
    local_19d8 = 0x8080808080808080;
    uStack_19d0 = 0x8080808080808080;
    local_11ee = 0xe0;
    local_a9 = 0xe0;
    local_aa = 0xe0;
    local_ab = 0xe0;
    local_ac = 0xe0;
    local_ad = 0xe0;
    local_ae = 0xe0;
    local_af = 0xe0;
    local_b0 = 0xe0;
    local_b1 = 0xe0;
    local_b2 = 0xe0;
    local_b3 = 0xe0;
    local_b4 = 0xe0;
    local_b5 = 0xe0;
    local_b6 = 0xe0;
    local_b7 = 0xe0;
    local_b8 = 0xe0;
    local_19e8 = 0xe0e0e0e0e0e0e0e0;
    uStack_19e0 = 0xe0e0e0e0e0e0e0e0;
    local_11ef = 0x1f;
    local_89 = 0x1f;
    local_8a = 0x1f;
    local_8b = 0x1f;
    local_8c = 0x1f;
    local_8d = 0x1f;
    local_8e = 0x1f;
    local_8f = 0x1f;
    local_90 = 0x1f;
    local_91 = 0x1f;
    local_92 = 0x1f;
    local_93 = 0x1f;
    local_94 = 0x1f;
    local_95 = 0x1f;
    local_96 = 0x1f;
    local_97 = 0x1f;
    local_98 = 0x1f;
    local_19f8 = 0x1f1f1f1f1f1f1f1f;
    uStack_19f0 = 0x1f1f1f1f1f1f1f1f;
    local_11f0 = 1;
    local_69 = 1;
    local_6a = 1;
    local_6b = 1;
    local_6c = 1;
    local_6d = 1;
    local_6e = 1;
    local_6f = 1;
    local_70 = 1;
    local_71 = 1;
    local_72 = 1;
    local_73 = 1;
    local_74 = 1;
    local_75 = 1;
    local_76 = 1;
    local_77 = 1;
    local_78 = 1;
    local_1a08 = 0x101010101010101;
    uStack_1a00 = 0x101010101010101;
    local_11f1 = 0x7f;
    local_49 = 0x7f;
    local_4a = 0x7f;
    local_4b = 0x7f;
    local_4c = 0x7f;
    local_4d = 0x7f;
    local_4e = 0x7f;
    local_4f = 0x7f;
    local_50 = 0x7f;
    local_51 = 0x7f;
    local_52 = 0x7f;
    local_53 = 0x7f;
    local_54 = 0x7f;
    local_55 = 0x7f;
    local_56 = 0x7f;
    local_57 = 0x7f;
    local_58 = 0x7f;
    local_1a18 = 0x7f7f7f7f7f7f7f7f;
    uStack_1a10 = 0x7f7f7f7f7f7f7f7f;
    local_1a28 = 0xff;
    uStack_1a27 = 0xff;
    uStack_1a26 = 0xff;
    uStack_1a25 = 0xff;
    uStack_1a24 = 0xff;
    uStack_1a23 = 0xff;
    uStack_1a22 = 0xff;
    uStack_1a21 = 0xff;
    uStack_1a20 = 0xff;
    uStack_1a1f = 0xff;
    uStack_1a1e = 0xff;
    uStack_1a1d = 0xff;
    uStack_1a1c = 0xff;
    uStack_1a1b = 0xff;
    uStack_1a1a = 0xff;
    uStack_1a19 = 0xff;
    local_af8 = local_1838;
    uStack_af0 = uStack_1830;
    local_a28 = local_1838 ^ 0x8080808080808080;
    uStack_a20 = uStack_1830 ^ 0x8080808080808080;
    local_b18 = local_1848;
    uStack_b10 = uStack_1840;
    local_a58 = local_1848 ^ 0x8080808080808080;
    uStack_a50 = uStack_1840 ^ 0x8080808080808080;
    local_b38 = local_1858;
    uStack_b30 = uStack_1850;
    local_a68 = local_1858 ^ 0x8080808080808080;
    uStack_a60 = uStack_1850 ^ 0x8080808080808080;
    local_b58 = local_1868;
    uStack_b50 = uStack_1860;
    local_a88 = local_1868 ^ 0x8080808080808080;
    uStack_a80 = uStack_1860 ^ 0x8080808080808080;
    local_c98 = CONCAT17(bStack_1921,
                         CONCAT16(bStack_1922,
                                  CONCAT15(bStack_1923,
                                           CONCAT14(bStack_1924,
                                                    CONCAT13(bStack_1925,
                                                             CONCAT12(bStack_1926,
                                                                      CONCAT11(bStack_1927,
                                                                               local_1928)))))));
    uStack_c90 = CONCAT17(bStack_1919,
                          CONCAT16(bStack_191a,
                                   CONCAT15(bStack_191b,
                                            CONCAT14(bStack_191c,
                                                     CONCAT13(bStack_191d,
                                                              CONCAT12(bStack_191e,
                                                                       CONCAT11(bStack_191f,
                                                                                bStack_1920)))))));
    local_ca8 = local_1798;
    uStack_ca0 = uStack_1790;
    auVar52._8_8_ = uStack_c90;
    auVar52._0_8_ = local_c98;
    auVar51._8_8_ = uStack_1790;
    auVar51._0_8_ = local_1798;
    auVar114 = psubusb(auVar52,auVar51);
    local_17b8 = auVar114._0_8_;
    uStack_17b0 = auVar114._8_8_;
    local_1198 = local_17b8;
    uVar97 = local_1198;
    uStack_1190 = uStack_17b0;
    uVar98 = uStack_1190;
    local_11a8 = local_1758;
    uStack_11a0 = uStack_1750;
    local_1198._0_1_ = auVar114[0];
    local_1198._1_1_ = auVar114[1];
    local_1198._2_1_ = auVar114[2];
    local_1198._3_1_ = auVar114[3];
    local_1198._4_1_ = auVar114[4];
    local_1198._5_1_ = auVar114[5];
    local_1198._6_1_ = auVar114[6];
    local_1198._7_1_ = auVar114[7];
    uStack_1190._0_1_ = auVar114[8];
    uStack_1190._1_1_ = auVar114[9];
    uStack_1190._2_1_ = auVar114[10];
    uStack_1190._3_1_ = auVar114[0xb];
    uStack_1190._4_1_ = auVar114[0xc];
    uStack_1190._5_1_ = auVar114[0xd];
    uStack_1190._6_1_ = auVar114[0xe];
    uStack_1190._7_1_ = auVar114[0xf];
    local_b78 = -((char)local_1198 == (char)local_1168);
    cStack_b77 = -(local_1198._1_1_ == local_1168._1_1_);
    cStack_b76 = -(local_1198._2_1_ == local_1168._2_1_);
    cStack_b75 = -(local_1198._3_1_ == local_1168._3_1_);
    cStack_b74 = -(local_1198._4_1_ == local_1168._4_1_);
    cStack_b73 = -(local_1198._5_1_ == local_1168._5_1_);
    cStack_b72 = -(local_1198._6_1_ == local_1168._6_1_);
    cStack_b71 = -(local_1198._7_1_ == local_1168._7_1_);
    cStack_b70 = -((char)uStack_1190 == (char)uStack_1160);
    cStack_b6f = -(uStack_1190._1_1_ == uStack_1160._1_1_);
    cStack_b6e = -(uStack_1190._2_1_ == uStack_1160._2_1_);
    cStack_b6d = -(uStack_1190._3_1_ == uStack_1160._3_1_);
    cStack_b6c = -(uStack_1190._4_1_ == uStack_1160._4_1_);
    cStack_b6b = -(uStack_1190._5_1_ == uStack_1160._5_1_);
    cStack_b6a = -(uStack_1190._6_1_ == uStack_1160._6_1_);
    cStack_b69 = -(uStack_1190._7_1_ == uStack_1160._7_1_);
    local_b88 = 0xffffffffffffffff;
    uStack_b80 = 0xffffffffffffffff;
    local_d28 = CONCAT17(cStack_b71,
                         CONCAT16(cStack_b72,
                                  CONCAT15(cStack_b73,
                                           CONCAT14(cStack_b74,
                                                    CONCAT13(cStack_b75,
                                                             CONCAT12(cStack_b76,
                                                                      CONCAT11(cStack_b77,local_b78)
                                                                     )))))) ^ 0xffffffffffffffff;
    uStack_d20 = CONCAT17(cStack_b69,
                          CONCAT16(cStack_b6a,
                                   CONCAT15(cStack_b6b,
                                            CONCAT14(cStack_b6c,
                                                     CONCAT13(cStack_b6d,
                                                              CONCAT12(cStack_b6e,
                                                                       CONCAT11(cStack_b6f,
                                                                                cStack_b70))))))) ^
                 0xffffffffffffffff;
    uStack_17b0 = uStack_d20;
    local_17b8 = local_d28;
    auVar69._8_8_ = uStack_a20;
    auVar69._0_8_ = local_a28;
    auVar68._8_8_ = uStack_a80;
    auVar68._0_8_ = local_a88;
    local_d18 = psubsb(auVar69,auVar68);
    local_928 = local_d18._0_8_ & local_d28;
    uStack_920 = local_d18._8_8_ & uStack_d20;
    auVar67._8_8_ = uStack_a60;
    auVar67._0_8_ = local_a68;
    auVar66._8_8_ = uStack_a50;
    auVar66._0_8_ = local_a58;
    auVar114 = psubsb(auVar67,auVar66);
    local_1a48 = auVar114._0_8_;
    uStack_1a40 = auVar114._8_8_;
    local_938 = local_1a48;
    uStack_930 = uStack_1a40;
    auVar80._8_8_ = uStack_920;
    auVar80._0_8_ = local_928;
    auVar115 = paddsb(auVar80,auVar114);
    local_1a38 = auVar115._0_8_;
    uStack_1a30 = auVar115._8_8_;
    local_948 = local_1a38;
    uStack_940 = uStack_1a30;
    local_958 = local_1a48;
    uStack_950 = uStack_1a40;
    auVar115 = paddsb(auVar115,auVar114);
    local_1a38 = auVar115._0_8_;
    uStack_1a30 = auVar115._8_8_;
    local_968 = local_1a38;
    uStack_960 = uStack_1a30;
    local_978 = local_1a48;
    uStack_970 = uStack_1a40;
    auVar114 = paddsb(auVar115,auVar114);
    local_1a38 = auVar114._0_8_;
    uStack_1a30 = auVar114._8_8_;
    local_d38 = local_1a38;
    uStack_d30 = uStack_1a30;
    local_d48 = local_17a8;
    uStack_d40 = uStack_17a0;
    local_9a8 = local_1a38 & local_17a8;
    uStack_9a0 = uStack_1a30 & uStack_17a0;
    auVar79._8_8_ = uStack_9a0;
    auVar79._0_8_ = local_9a8;
    auVar78._8_8_ = 0x404040404040404;
    auVar78._0_8_ = 0x404040404040404;
    auVar114 = paddsb(auVar79,auVar78);
    auVar77._8_8_ = uStack_9a0;
    auVar77._0_8_ = local_9a8;
    auVar76._8_8_ = 0x303030303030303;
    auVar76._0_8_ = 0x303030303030303;
    auVar115 = paddsb(auVar77,auVar76);
    local_1a58 = auVar114._0_8_;
    uStack_1a50 = auVar114._8_8_;
    local_8c8 = local_1758;
    uStack_8c0 = uStack_1750;
    local_8d8 = local_1a58;
    uVar17 = local_8d8;
    uStack_8d0 = uStack_1a50;
    uVar21 = uStack_8d0;
    local_8d8._0_1_ = auVar114[0];
    local_8d8._1_1_ = auVar114[1];
    local_8d8._2_1_ = auVar114[2];
    local_8d8._3_1_ = auVar114[3];
    local_8d8._4_1_ = auVar114[4];
    local_8d8._5_1_ = auVar114[5];
    local_8d8._6_1_ = auVar114[6];
    local_8d8._7_1_ = auVar114[7];
    uStack_8d0._0_1_ = auVar114[8];
    uStack_8d0._1_1_ = auVar114[9];
    uStack_8d0._2_1_ = auVar114[10];
    uStack_8d0._3_1_ = auVar114[0xb];
    uStack_8d0._4_1_ = auVar114[0xc];
    uStack_8d0._5_1_ = auVar114[0xd];
    uStack_8d0._6_1_ = auVar114[0xe];
    uStack_8d0._7_1_ = auVar114[0xf];
    local_1a48._0_2_ =
         CONCAT11(-(local_8d8._1_1_ < local_1168._1_1_),-((char)local_8d8 < (char)local_1168));
    local_1a48._0_3_ = CONCAT12(-(local_8d8._2_1_ < local_1168._2_1_),(undefined2)local_1a48);
    local_1a48._0_4_ = CONCAT13(-(local_8d8._3_1_ < local_1168._3_1_),(undefined3)local_1a48);
    local_1a48._0_5_ = CONCAT14(-(local_8d8._4_1_ < local_1168._4_1_),(undefined4)local_1a48);
    local_1a48._0_6_ = CONCAT15(-(local_8d8._5_1_ < local_1168._5_1_),(undefined5)local_1a48);
    local_1a48._0_7_ = CONCAT16(-(local_8d8._6_1_ < local_1168._6_1_),(undefined6)local_1a48);
    local_1a48 = CONCAT17(-(local_8d8._7_1_ < local_1168._7_1_),(undefined7)local_1a48);
    uStack_1a40._0_1_ = -((char)uStack_8d0 < (char)uStack_1160);
    uStack_1a40._1_1_ = -(uStack_8d0._1_1_ < uStack_1160._1_1_);
    uStack_1a40._2_1_ = -(uStack_8d0._2_1_ < uStack_1160._2_1_);
    uStack_1a40._3_1_ = -(uStack_8d0._3_1_ < uStack_1160._3_1_);
    uStack_1a40._4_1_ = -(uStack_8d0._4_1_ < uStack_1160._4_1_);
    uStack_1a40._5_1_ = -(uStack_8d0._5_1_ < uStack_1160._5_1_);
    uStack_1a40._6_1_ = -(uStack_8d0._6_1_ < uStack_1160._6_1_);
    uStack_1a40._7_1_ = -(uStack_8d0._7_1_ < uStack_1160._7_1_);
    local_e38 = local_1a58;
    uStack_e30 = uStack_1a50;
    local_e3c = 3;
    local_e38._0_2_ = auVar114._0_2_;
    local_e38._2_2_ = auVar114._2_2_;
    local_e38._4_2_ = auVar114._4_2_;
    local_e38._6_2_ = auVar114._6_2_;
    uStack_e30._0_2_ = auVar114._8_2_;
    uStack_e30._2_2_ = auVar114._10_2_;
    uStack_e30._4_2_ = auVar114._12_2_;
    uStack_e30._6_2_ = auVar114._14_2_;
    local_1a58._0_4_ = CONCAT22(local_e38._2_2_ >> 3,(ushort)local_e38 >> 3);
    local_1a58._0_6_ = CONCAT24(local_e38._4_2_ >> 3,(undefined4)local_1a58);
    local_1a58 = CONCAT26(local_e38._6_2_ >> 3,(undefined6)local_1a58);
    uStack_1a50._0_2_ = (ushort)uStack_e30 >> 3;
    uStack_1a50._2_2_ = uStack_e30._2_2_ >> 3;
    uStack_1a50._4_2_ = uStack_e30._4_2_ >> 3;
    uStack_1a50._6_2_ = uStack_e30._6_2_ >> 3;
    local_d58 = local_1a48;
    uStack_d50 = uStack_1a40;
    local_878 = local_1a48 & 0xe0e0e0e0e0e0e0e0;
    uStack_870 = uStack_1a40 & 0xe0e0e0e0e0e0e0e0;
    local_d78 = local_1a58;
    uStack_d70 = uStack_1a50;
    local_868 = local_1a58 & 0x1f1f1f1f1f1f1f1f;
    uStack_860 = uStack_1a50 & 0x1f1f1f1f1f1f1f1f;
    local_a78 = local_868 | local_878;
    uStack_a70 = uStack_860 | uStack_870;
    uStack_1a50 = uStack_a70;
    local_1a58 = local_a78;
    auVar65._8_8_ = uStack_a60;
    auVar65._0_8_ = local_a68;
    auVar64._8_8_ = uStack_a70;
    auVar64._0_8_ = local_a78;
    local_b98 = psubsb(auVar65,auVar64);
    local_18f8 = local_b98._0_8_ ^ 0x8080808080808080;
    uStack_18f0 = local_b98._8_8_ ^ 0x8080808080808080;
    local_1a68 = auVar115._0_8_;
    uStack_1a60 = auVar115._8_8_;
    local_8e8 = local_1758;
    uStack_8e0 = uStack_1750;
    local_8f8 = local_1a68;
    uVar11 = local_8f8;
    uStack_8f0 = uStack_1a60;
    uVar13 = uStack_8f0;
    local_8f8._0_1_ = auVar115[0];
    local_8f8._1_1_ = auVar115[1];
    local_8f8._2_1_ = auVar115[2];
    local_8f8._3_1_ = auVar115[3];
    local_8f8._4_1_ = auVar115[4];
    local_8f8._5_1_ = auVar115[5];
    local_8f8._6_1_ = auVar115[6];
    local_8f8._7_1_ = auVar115[7];
    uStack_8f0._0_1_ = auVar115[8];
    uStack_8f0._1_1_ = auVar115[9];
    uStack_8f0._2_1_ = auVar115[10];
    uStack_8f0._3_1_ = auVar115[0xb];
    uStack_8f0._4_1_ = auVar115[0xc];
    uStack_8f0._5_1_ = auVar115[0xd];
    uStack_8f0._6_1_ = auVar115[0xe];
    uStack_8f0._7_1_ = auVar115[0xf];
    local_1a48._0_2_ =
         CONCAT11(-(local_8f8._1_1_ < local_1168._1_1_),-((char)local_8f8 < (char)local_1168));
    local_1a48._0_3_ = CONCAT12(-(local_8f8._2_1_ < local_1168._2_1_),(undefined2)local_1a48);
    local_1a48._0_4_ = CONCAT13(-(local_8f8._3_1_ < local_1168._3_1_),(undefined3)local_1a48);
    local_1a48._0_5_ = CONCAT14(-(local_8f8._4_1_ < local_1168._4_1_),(undefined4)local_1a48);
    local_1a48._0_6_ = CONCAT15(-(local_8f8._5_1_ < local_1168._5_1_),(undefined5)local_1a48);
    local_1a48._0_7_ = CONCAT16(-(local_8f8._6_1_ < local_1168._6_1_),(undefined6)local_1a48);
    local_1a48 = CONCAT17(-(local_8f8._7_1_ < local_1168._7_1_),(undefined7)local_1a48);
    uStack_1a40._0_1_ = -((char)uStack_8f0 < (char)uStack_1160);
    uStack_1a40._1_1_ = -(uStack_8f0._1_1_ < uStack_1160._1_1_);
    uStack_1a40._2_1_ = -(uStack_8f0._2_1_ < uStack_1160._2_1_);
    uStack_1a40._3_1_ = -(uStack_8f0._3_1_ < uStack_1160._3_1_);
    uStack_1a40._4_1_ = -(uStack_8f0._4_1_ < uStack_1160._4_1_);
    uStack_1a40._5_1_ = -(uStack_8f0._5_1_ < uStack_1160._5_1_);
    uStack_1a40._6_1_ = -(uStack_8f0._6_1_ < uStack_1160._6_1_);
    uStack_1a40._7_1_ = -(uStack_8f0._7_1_ < uStack_1160._7_1_);
    local_e58 = local_1a68;
    uStack_e50 = uStack_1a60;
    local_e5c = 3;
    local_e58._0_2_ = auVar115._0_2_;
    local_e58._2_2_ = auVar115._2_2_;
    local_e58._4_2_ = auVar115._4_2_;
    local_e58._6_2_ = auVar115._6_2_;
    uStack_e50._0_2_ = auVar115._8_2_;
    uStack_e50._2_2_ = auVar115._10_2_;
    uStack_e50._4_2_ = auVar115._12_2_;
    uStack_e50._6_2_ = auVar115._14_2_;
    local_1a68._0_4_ = CONCAT22(local_e58._2_2_ >> 3,(ushort)local_e58 >> 3);
    local_1a68._0_6_ = CONCAT24(local_e58._4_2_ >> 3,(undefined4)local_1a68);
    local_1a68 = CONCAT26(local_e58._6_2_ >> 3,(undefined6)local_1a68);
    uStack_1a60._0_2_ = (ushort)uStack_e50 >> 3;
    uStack_1a60._2_2_ = uStack_e50._2_2_ >> 3;
    uStack_1a60._4_2_ = uStack_e50._4_2_ >> 3;
    uStack_1a60._6_2_ = uStack_e50._6_2_ >> 3;
    local_d98 = local_1a48;
    uStack_d90 = uStack_1a40;
    local_898 = local_1a48 & 0xe0e0e0e0e0e0e0e0;
    uStack_890 = uStack_1a40 & 0xe0e0e0e0e0e0e0e0;
    local_db8 = local_1a68;
    uStack_db0 = uStack_1a60;
    local_888 = local_1a68 & 0x1f1f1f1f1f1f1f1f;
    uStack_880 = uStack_1a60 & 0x1f1f1f1f1f1f1f1f;
    local_9d8 = local_888 | local_898;
    uStack_9d0 = uStack_880 | uStack_890;
    uStack_1a60 = uStack_9d0;
    local_1a68 = local_9d8;
    auVar75._8_8_ = uStack_a50;
    auVar75._0_8_ = local_a58;
    auVar74._8_8_ = uStack_9d0;
    auVar74._0_8_ = local_9d8;
    local_bb8 = paddsb(auVar75,auVar74);
    local_18e8 = local_bb8._0_8_ ^ 0x8080808080808080;
    uStack_18e0 = local_bb8._8_8_ ^ 0x8080808080808080;
    auVar73._8_8_ = uStack_a70;
    auVar73._0_8_ = local_a78;
    auVar72._8_8_ = 0x101010101010101;
    auVar72._0_8_ = 0x101010101010101;
    auVar114 = paddsb(auVar73,auVar72);
    local_1a38 = auVar114._0_8_;
    uStack_1a30 = auVar114._8_8_;
    local_908 = local_1758;
    uStack_900 = uStack_1750;
    local_918 = local_1a38;
    uVar8 = local_918;
    uStack_910 = uStack_1a30;
    uVar9 = uStack_910;
    local_918._0_1_ = auVar114[0];
    local_918._1_1_ = auVar114[1];
    local_918._2_1_ = auVar114[2];
    local_918._3_1_ = auVar114[3];
    local_918._4_1_ = auVar114[4];
    local_918._5_1_ = auVar114[5];
    local_918._6_1_ = auVar114[6];
    local_918._7_1_ = auVar114[7];
    uStack_910._0_1_ = auVar114[8];
    uStack_910._1_1_ = auVar114[9];
    uStack_910._2_1_ = auVar114[10];
    uStack_910._3_1_ = auVar114[0xb];
    uStack_910._4_1_ = auVar114[0xc];
    uStack_910._5_1_ = auVar114[0xd];
    uStack_910._6_1_ = auVar114[0xe];
    uStack_910._7_1_ = auVar114[0xf];
    local_1a48._0_2_ =
         CONCAT11(-(local_918._1_1_ < local_1168._1_1_),-((char)local_918 < (char)local_1168));
    local_1a48._0_3_ = CONCAT12(-(local_918._2_1_ < local_1168._2_1_),(undefined2)local_1a48);
    local_1a48._0_4_ = CONCAT13(-(local_918._3_1_ < local_1168._3_1_),(undefined3)local_1a48);
    local_1a48._0_5_ = CONCAT14(-(local_918._4_1_ < local_1168._4_1_),(undefined4)local_1a48);
    local_1a48._0_6_ = CONCAT15(-(local_918._5_1_ < local_1168._5_1_),(undefined5)local_1a48);
    local_1a48._0_7_ = CONCAT16(-(local_918._6_1_ < local_1168._6_1_),(undefined6)local_1a48);
    local_1a48 = CONCAT17(-(local_918._7_1_ < local_1168._7_1_),(undefined7)local_1a48);
    uStack_1a40._0_1_ = -((char)uStack_910 < (char)uStack_1160);
    uStack_1a40._1_1_ = -(uStack_910._1_1_ < uStack_1160._1_1_);
    uStack_1a40._2_1_ = -(uStack_910._2_1_ < uStack_1160._2_1_);
    uStack_1a40._3_1_ = -(uStack_910._3_1_ < uStack_1160._3_1_);
    uStack_1a40._4_1_ = -(uStack_910._4_1_ < uStack_1160._4_1_);
    uStack_1a40._5_1_ = -(uStack_910._5_1_ < uStack_1160._5_1_);
    uStack_1a40._6_1_ = -(uStack_910._6_1_ < uStack_1160._6_1_);
    uStack_1a40._7_1_ = -(uStack_910._7_1_ < uStack_1160._7_1_);
    local_e78 = local_1a38;
    uStack_e70 = uStack_1a30;
    local_e7c = 1;
    local_e78._0_2_ = auVar114._0_2_;
    local_e78._2_2_ = auVar114._2_2_;
    local_e78._4_2_ = auVar114._4_2_;
    local_e78._6_2_ = auVar114._6_2_;
    uStack_e70._0_2_ = auVar114._8_2_;
    uStack_e70._2_2_ = auVar114._10_2_;
    uStack_e70._4_2_ = auVar114._12_2_;
    uStack_e70._6_2_ = auVar114._14_2_;
    local_1a38._0_4_ = CONCAT22(local_e78._2_2_ >> 1,(ushort)local_e78 >> 1);
    local_1a38._0_6_ = CONCAT24(local_e78._4_2_ >> 1,(undefined4)local_1a38);
    local_1a38 = CONCAT26(local_e78._6_2_ >> 1,(undefined6)local_1a38);
    uStack_1a30._0_2_ = (ushort)uStack_e70 >> 1;
    uStack_1a30._2_2_ = uStack_e70._2_2_ >> 1;
    uStack_1a30._4_2_ = uStack_e70._4_2_ >> 1;
    uStack_1a30._6_2_ = uStack_e70._6_2_ >> 1;
    local_dd8 = local_1a48;
    uStack_dd0 = uStack_1a40;
    local_8b8 = local_1a48 & 0x8080808080808080;
    uStack_8b0 = uStack_1a40 & 0x8080808080808080;
    uStack_1a40 = uStack_8b0;
    local_1a48 = local_8b8;
    local_df8 = local_1a38;
    uStack_df0 = uStack_1a30;
    local_8a8 = local_1a38 & 0x7f7f7f7f7f7f7f7f;
    uStack_8a0 = uStack_1a30 & 0x7f7f7f7f7f7f7f7f;
    local_858 = local_8a8 | local_8b8;
    uStack_850 = uStack_8a0 | uStack_8b0;
    local_a98 = ~local_d28 & local_858;
    uStack_a90 = ~uStack_d20 & uStack_850;
    uStack_1a30 = uStack_a90;
    local_1a38 = local_a98;
    auVar71._8_8_ = uStack_a20;
    auVar71._0_8_ = local_a28;
    auVar70._8_8_ = uStack_a90;
    auVar70._0_8_ = local_a98;
    local_bd8 = paddsb(auVar71,auVar70);
    local_18d8 = local_bd8._0_8_ ^ 0x8080808080808080;
    uStack_18d0 = local_bd8._8_8_ ^ 0x8080808080808080;
    auVar63._8_8_ = uStack_a80;
    auVar63._0_8_ = local_a88;
    auVar62._8_8_ = uStack_a90;
    auVar62._0_8_ = local_a98;
    local_bf8 = psubsb(auVar63,auVar62);
    local_1908 = local_bf8._0_8_ ^ 0x8080808080808080;
    uStack_1900 = local_bf8._8_8_ ^ 0x8080808080808080;
    local_11b8 = _local_17c8;
    uVar110 = local_11b8;
    uStack_11b0 = uStack_17c0;
    uVar113 = uStack_11b0;
    local_11c8 = local_1758;
    uStack_11c0 = uStack_1750;
    local_11b8._0_1_ = (char)_local_17c8;
    local_11b8._1_1_ = (char)(_local_17c8 >> 8);
    local_11b8._2_1_ = (char)(_local_17c8 >> 0x10);
    local_11b8._3_1_ = (char)(_local_17c8 >> 0x18);
    local_11b8._4_1_ = (char)(_local_17c8 >> 0x20);
    local_11b8._5_1_ = (char)(_local_17c8 >> 0x28);
    local_11b8._6_1_ = (char)(_local_17c8 >> 0x30);
    local_11b8._7_1_ = (char)(_local_17c8 >> 0x38);
    uStack_11b0._0_1_ = (char)uStack_17c0;
    uStack_11b0._1_1_ = (char)(uStack_17c0 >> 8);
    uStack_11b0._2_1_ = (char)(uStack_17c0 >> 0x10);
    uStack_11b0._3_1_ = (char)(uStack_17c0 >> 0x18);
    uStack_11b0._4_1_ = (char)(uStack_17c0 >> 0x20);
    uStack_11b0._5_1_ = (char)(uStack_17c0 >> 0x28);
    uStack_11b0._6_1_ = (char)(uStack_17c0 >> 0x30);
    uStack_11b0._7_1_ = (char)(uStack_17c0 >> 0x38);
    local_ab8 = -((char)local_11b8 == (char)local_1168);
    cStack_ab7 = -(local_11b8._1_1_ == local_1168._1_1_);
    cStack_ab6 = -(local_11b8._2_1_ == local_1168._2_1_);
    cStack_ab5 = -(local_11b8._3_1_ == local_1168._3_1_);
    cStack_ab4 = -(local_11b8._4_1_ == local_1168._4_1_);
    cStack_ab3 = -(local_11b8._5_1_ == local_1168._5_1_);
    cStack_ab2 = -(local_11b8._6_1_ == local_1168._6_1_);
    cStack_ab1 = -(local_11b8._7_1_ == local_1168._7_1_);
    cStack_ab0 = -((char)uStack_11b0 == (char)uStack_1160);
    cStack_aaf = -(uStack_11b0._1_1_ == uStack_1160._1_1_);
    cStack_aae = -(uStack_11b0._2_1_ == uStack_1160._2_1_);
    cStack_aad = -(uStack_11b0._3_1_ == uStack_1160._3_1_);
    cStack_aac = -(uStack_11b0._4_1_ == uStack_1160._4_1_);
    cStack_aab = -(uStack_11b0._5_1_ == uStack_1160._5_1_);
    cStack_aaa = -(uStack_11b0._6_1_ == uStack_1160._6_1_);
    bStack_aa9 = -(uStack_11b0._7_1_ == uStack_1160._7_1_);
    auVar60[1] = cStack_ab7;
    auVar60[0] = local_ab8;
    auVar60[2] = cStack_ab6;
    auVar60[3] = cStack_ab5;
    auVar60[4] = cStack_ab4;
    auVar60[5] = cStack_ab3;
    auVar60[6] = cStack_ab2;
    auVar60[7] = cStack_ab1;
    auVar60[8] = cStack_ab0;
    auVar60[9] = cStack_aaf;
    auVar60[10] = cStack_aae;
    auVar60[0xb] = cStack_aad;
    auVar60[0xc] = cStack_aac;
    auVar60[0xd] = cStack_aab;
    auVar60[0xe] = cStack_aaa;
    auVar60[0xf] = bStack_aa9;
    if ((ushort)((ushort)(SUB161(auVar60 >> 7,0) & 1) | (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar60 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_aa9 >> 7) << 0xf)
        == 0xffff) {
      puVar109 = (ulong *)((long)local_1720 - (long)(local_1724 << 1));
      *puVar109 = local_18d8;
      puVar109[1] = uStack_18d0;
      *(ulong *)((long)local_1720 - (long)local_1724) = local_18e8;
      ((ulong *)((long)local_1720 - (long)local_1724))[1] = uStack_18e0;
      *local_1720 = local_18f8;
      local_1720[1] = uStack_18f0;
      *(ulong *)((long)local_1720 + (long)local_1724) = local_1908;
      ((ulong *)((long)local_1720 + (long)local_1724))[1] = uStack_1900;
    }
    else {
      local_82a = 4;
      local_2a = 4;
      local_2c = 4;
      local_2e = 4;
      local_30 = 4;
      local_32 = 4;
      local_34 = 4;
      local_36 = 4;
      local_38 = 4;
      local_1a78 = 0x4000400040004;
      uStack_1a70 = 0x4000400040004;
      local_1558 = local_1818;
      lVar96 = local_1558;
      lStack_1550 = lStack_1810;
      local_1568 = local_1758;
      uStack_1560 = uStack_1750;
      local_1558._0_1_ = (undefined1)local_1818;
      local_1558._1_1_ = (undefined1)((ulong)local_1818 >> 8);
      local_1558._2_1_ = (undefined1)((ulong)local_1818 >> 0x10);
      local_1558._3_1_ = (undefined1)((ulong)local_1818 >> 0x18);
      local_1558._4_1_ = (undefined1)((ulong)local_1818 >> 0x20);
      local_1558._5_1_ = (undefined1)((ulong)local_1818 >> 0x28);
      local_1558._6_1_ = (undefined1)((ulong)local_1818 >> 0x30);
      local_1558._7_1_ = (undefined1)((ulong)local_1818 >> 0x38);
      local_1a88 = (undefined1)local_1558;
      cStack_1a87 = (char)local_1168;
      uStack_1a86 = local_1558._1_1_;
      cStack_1a85 = local_1168._1_1_;
      uStack_1a84 = local_1558._2_1_;
      cStack_1a83 = local_1168._2_1_;
      uStack_1a82 = local_1558._3_1_;
      cStack_1a81 = local_1168._3_1_;
      uStack_1a80 = local_1558._4_1_;
      cStack_1a7f = local_1168._4_1_;
      uStack_1a7e = local_1558._5_1_;
      cStack_1a7d = local_1168._5_1_;
      uStack_1a7c = local_1558._6_1_;
      cStack_1a7b = local_1168._6_1_;
      uStack_1a7a = local_1558._7_1_;
      cStack_1a79 = local_1168._7_1_;
      local_1578 = local_1828;
      lVar95 = local_1578;
      lStack_1570 = lStack_1820;
      local_1588 = local_1758;
      uStack_1580 = uStack_1750;
      local_1578._0_1_ = (undefined1)local_1828;
      local_1578._1_1_ = (undefined1)((ulong)local_1828 >> 8);
      local_1578._2_1_ = (undefined1)((ulong)local_1828 >> 0x10);
      local_1578._3_1_ = (undefined1)((ulong)local_1828 >> 0x18);
      local_1578._4_1_ = (undefined1)((ulong)local_1828 >> 0x20);
      local_1578._5_1_ = (undefined1)((ulong)local_1828 >> 0x28);
      local_1578._6_1_ = (undefined1)((ulong)local_1828 >> 0x30);
      local_1578._7_1_ = (undefined1)((ulong)local_1828 >> 0x38);
      local_1a98 = (undefined1)local_1578;
      cStack_1a97 = (char)local_1168;
      uStack_1a96 = local_1578._1_1_;
      cStack_1a95 = local_1168._1_1_;
      uStack_1a94 = local_1578._2_1_;
      cStack_1a93 = local_1168._2_1_;
      uStack_1a92 = local_1578._3_1_;
      cStack_1a91 = local_1168._3_1_;
      uStack_1a90 = local_1578._4_1_;
      cStack_1a8f = local_1168._4_1_;
      uStack_1a8e = local_1578._5_1_;
      cStack_1a8d = local_1168._5_1_;
      uStack_1a8c = local_1578._6_1_;
      cStack_1a8b = local_1168._6_1_;
      uStack_1a8a = local_1578._7_1_;
      cStack_1a89 = local_1168._7_1_;
      local_1598 = local_1838;
      uVar94 = local_1598;
      uStack_1590 = uStack_1830;
      local_15a8 = local_1758;
      uStack_15a0 = uStack_1750;
      local_1598._0_1_ = (undefined1)local_1838;
      local_1598._1_1_ = (undefined1)(local_1838 >> 8);
      local_1598._2_1_ = (undefined1)(local_1838 >> 0x10);
      local_1598._3_1_ = (undefined1)(local_1838 >> 0x18);
      local_1598._4_1_ = (undefined1)(local_1838 >> 0x20);
      local_1598._5_1_ = (undefined1)(local_1838 >> 0x28);
      local_1598._6_1_ = (undefined1)(local_1838 >> 0x30);
      local_1598._7_1_ = (undefined1)(local_1838 >> 0x38);
      local_1aa8 = (undefined1)local_1598;
      cStack_1aa7 = (char)local_1168;
      uStack_1aa6 = local_1598._1_1_;
      cStack_1aa5 = local_1168._1_1_;
      uStack_1aa4 = local_1598._2_1_;
      cStack_1aa3 = local_1168._2_1_;
      uStack_1aa2 = local_1598._3_1_;
      cStack_1aa1 = local_1168._3_1_;
      uStack_1aa0 = local_1598._4_1_;
      cStack_1a9f = local_1168._4_1_;
      uStack_1a9e = local_1598._5_1_;
      cStack_1a9d = local_1168._5_1_;
      uStack_1a9c = local_1598._6_1_;
      cStack_1a9b = local_1168._6_1_;
      uStack_1a9a = local_1598._7_1_;
      cStack_1a99 = local_1168._7_1_;
      local_15b8 = local_1848;
      uVar93 = local_15b8;
      uStack_15b0 = uStack_1840;
      local_15c8 = local_1758;
      uStack_15c0 = uStack_1750;
      local_15b8._0_1_ = (undefined1)local_1848;
      local_15b8._1_1_ = (undefined1)(local_1848 >> 8);
      local_15b8._2_1_ = (undefined1)(local_1848 >> 0x10);
      local_15b8._3_1_ = (undefined1)(local_1848 >> 0x18);
      local_15b8._4_1_ = (undefined1)(local_1848 >> 0x20);
      local_15b8._5_1_ = (undefined1)(local_1848 >> 0x28);
      local_15b8._6_1_ = (undefined1)(local_1848 >> 0x30);
      local_15b8._7_1_ = (undefined1)(local_1848 >> 0x38);
      local_1ab8 = (undefined1)local_15b8;
      cStack_1ab7 = (char)local_1168;
      uStack_1ab6 = local_15b8._1_1_;
      cStack_1ab5 = local_1168._1_1_;
      uStack_1ab4 = local_15b8._2_1_;
      cStack_1ab3 = local_1168._2_1_;
      uStack_1ab2 = local_15b8._3_1_;
      cStack_1ab1 = local_1168._3_1_;
      uStack_1ab0 = local_15b8._4_1_;
      cStack_1aaf = local_1168._4_1_;
      uStack_1aae = local_15b8._5_1_;
      cStack_1aad = local_1168._5_1_;
      uStack_1aac = local_15b8._6_1_;
      cStack_1aab = local_1168._6_1_;
      uStack_1aaa = local_15b8._7_1_;
      cStack_1aa9 = local_1168._7_1_;
      local_15d8 = local_1858;
      uVar129 = local_15d8;
      uStack_15d0 = uStack_1850;
      local_15e8 = local_1758;
      uStack_15e0 = uStack_1750;
      local_15d8._0_1_ = (undefined1)local_1858;
      local_15d8._1_1_ = (undefined1)(local_1858 >> 8);
      local_15d8._2_1_ = (undefined1)(local_1858 >> 0x10);
      local_15d8._3_1_ = (undefined1)(local_1858 >> 0x18);
      local_15d8._4_1_ = (undefined1)(local_1858 >> 0x20);
      local_15d8._5_1_ = (undefined1)(local_1858 >> 0x28);
      local_15d8._6_1_ = (undefined1)(local_1858 >> 0x30);
      local_15d8._7_1_ = (undefined1)(local_1858 >> 0x38);
      local_1ac8 = (undefined1)local_15d8;
      cStack_1ac7 = (char)local_1168;
      uStack_1ac6 = local_15d8._1_1_;
      cStack_1ac5 = local_1168._1_1_;
      uStack_1ac4 = local_15d8._2_1_;
      cStack_1ac3 = local_1168._2_1_;
      uStack_1ac2 = local_15d8._3_1_;
      cStack_1ac1 = local_1168._3_1_;
      uStack_1ac0 = local_15d8._4_1_;
      cStack_1abf = local_1168._4_1_;
      uStack_1abe = local_15d8._5_1_;
      cStack_1abd = local_1168._5_1_;
      uStack_1abc = local_15d8._6_1_;
      cStack_1abb = local_1168._6_1_;
      uStack_1aba = local_15d8._7_1_;
      cStack_1ab9 = local_1168._7_1_;
      local_15f8 = local_1868;
      uVar128 = local_15f8;
      uStack_15f0 = uStack_1860;
      local_1608 = local_1758;
      uStack_1600 = uStack_1750;
      local_15f8._0_1_ = (undefined1)local_1868;
      local_15f8._1_1_ = (undefined1)(local_1868 >> 8);
      local_15f8._2_1_ = (undefined1)(local_1868 >> 0x10);
      local_15f8._3_1_ = (undefined1)(local_1868 >> 0x18);
      local_15f8._4_1_ = (undefined1)(local_1868 >> 0x20);
      local_15f8._5_1_ = (undefined1)(local_1868 >> 0x28);
      local_15f8._6_1_ = (undefined1)(local_1868 >> 0x30);
      local_15f8._7_1_ = (undefined1)(local_1868 >> 0x38);
      local_1ad8 = (undefined1)local_15f8;
      cStack_1ad7 = (char)local_1168;
      uStack_1ad6 = local_15f8._1_1_;
      cStack_1ad5 = local_1168._1_1_;
      uStack_1ad4 = local_15f8._2_1_;
      cStack_1ad3 = local_1168._2_1_;
      uStack_1ad2 = local_15f8._3_1_;
      cStack_1ad1 = local_1168._3_1_;
      uStack_1ad0 = local_15f8._4_1_;
      cStack_1acf = local_1168._4_1_;
      uStack_1ace = local_15f8._5_1_;
      cStack_1acd = local_1168._5_1_;
      uStack_1acc = local_15f8._6_1_;
      cStack_1acb = local_1168._6_1_;
      uStack_1aca = local_15f8._7_1_;
      cStack_1ac9 = local_1168._7_1_;
      local_1618 = local_1878;
      lVar92 = local_1618;
      lStack_1610 = lStack_1870;
      local_1628 = local_1758;
      uStack_1620 = uStack_1750;
      local_1618._0_1_ = (undefined1)local_1878;
      local_1618._1_1_ = (undefined1)((ulong)local_1878 >> 8);
      local_1618._2_1_ = (undefined1)((ulong)local_1878 >> 0x10);
      local_1618._3_1_ = (undefined1)((ulong)local_1878 >> 0x18);
      local_1618._4_1_ = (undefined1)((ulong)local_1878 >> 0x20);
      local_1618._5_1_ = (undefined1)((ulong)local_1878 >> 0x28);
      local_1618._6_1_ = (undefined1)((ulong)local_1878 >> 0x30);
      local_1618._7_1_ = (undefined1)((ulong)local_1878 >> 0x38);
      local_1ae8 = (undefined1)local_1618;
      cStack_1ae7 = (char)local_1168;
      uStack_1ae6 = local_1618._1_1_;
      cStack_1ae5 = local_1168._1_1_;
      uStack_1ae4 = local_1618._2_1_;
      cStack_1ae3 = local_1168._2_1_;
      uStack_1ae2 = local_1618._3_1_;
      cStack_1ae1 = local_1168._3_1_;
      uStack_1ae0 = local_1618._4_1_;
      cStack_1adf = local_1168._4_1_;
      uStack_1ade = local_1618._5_1_;
      cStack_1add = local_1168._5_1_;
      uStack_1adc = local_1618._6_1_;
      cStack_1adb = local_1168._6_1_;
      uStack_1ada = local_1618._7_1_;
      cStack_1ad9 = local_1168._7_1_;
      local_1638 = local_1888;
      lVar91 = local_1638;
      lStack_1630 = lStack_1880;
      local_1648 = local_1758;
      uStack_1640 = uStack_1750;
      local_1638._0_1_ = (undefined1)local_1888;
      local_1638._1_1_ = (undefined1)((ulong)local_1888 >> 8);
      local_1638._2_1_ = (undefined1)((ulong)local_1888 >> 0x10);
      local_1638._3_1_ = (undefined1)((ulong)local_1888 >> 0x18);
      local_1638._4_1_ = (undefined1)((ulong)local_1888 >> 0x20);
      local_1638._5_1_ = (undefined1)((ulong)local_1888 >> 0x28);
      local_1638._6_1_ = (undefined1)((ulong)local_1888 >> 0x30);
      local_1638._7_1_ = (undefined1)((ulong)local_1888 >> 0x38);
      local_1af8 = (undefined1)local_1638;
      cStack_1af7 = (char)local_1168;
      uStack_1af6 = local_1638._1_1_;
      cStack_1af5 = local_1168._1_1_;
      uStack_1af4 = local_1638._2_1_;
      cStack_1af3 = local_1168._2_1_;
      uStack_1af2 = local_1638._3_1_;
      cStack_1af1 = local_1168._3_1_;
      uStack_1af0 = local_1638._4_1_;
      cStack_1aef = local_1168._4_1_;
      uStack_1aee = local_1638._5_1_;
      cStack_1aed = local_1168._5_1_;
      uStack_1aec = local_1638._6_1_;
      cStack_1aeb = local_1168._6_1_;
      uStack_1aea = local_1638._7_1_;
      cStack_1ae9 = local_1168._7_1_;
      local_678 = local_1818;
      uStack_670 = lStack_1810;
      lVar106 = uStack_670;
      local_688 = local_1758;
      uStack_680 = uStack_1750;
      uStack_670._0_1_ = (undefined1)lStack_1810;
      uStack_670._1_1_ = (undefined1)((ulong)lStack_1810 >> 8);
      uStack_670._2_1_ = (undefined1)((ulong)lStack_1810 >> 0x10);
      uStack_670._3_1_ = (undefined1)((ulong)lStack_1810 >> 0x18);
      uStack_670._4_1_ = (undefined1)((ulong)lStack_1810 >> 0x20);
      uStack_670._5_1_ = (undefined1)((ulong)lStack_1810 >> 0x28);
      uStack_670._6_1_ = (undefined1)((ulong)lStack_1810 >> 0x30);
      uStack_670._7_1_ = (undefined1)((ulong)lStack_1810 >> 0x38);
      local_1b08 = (undefined1)uStack_670;
      cStack_1b07 = (char)uStack_1160;
      uStack_1b06 = uStack_670._1_1_;
      cStack_1b05 = uStack_1160._1_1_;
      uStack_1b04 = uStack_670._2_1_;
      cStack_1b03 = uStack_1160._2_1_;
      uStack_1b02 = uStack_670._3_1_;
      cStack_1b01 = uStack_1160._3_1_;
      uStack_1b00 = uStack_670._4_1_;
      cStack_1aff = uStack_1160._4_1_;
      uStack_1afe = uStack_670._5_1_;
      cStack_1afd = uStack_1160._5_1_;
      uStack_1afc = uStack_670._6_1_;
      cStack_1afb = uStack_1160._6_1_;
      uStack_1afa = uStack_670._7_1_;
      cStack_1af9 = uStack_1160._7_1_;
      local_698 = local_1828;
      uStack_690 = lStack_1820;
      lVar105 = uStack_690;
      local_6a8 = local_1758;
      uStack_6a0 = uStack_1750;
      uStack_690._0_1_ = (undefined1)lStack_1820;
      uStack_690._1_1_ = (undefined1)((ulong)lStack_1820 >> 8);
      uStack_690._2_1_ = (undefined1)((ulong)lStack_1820 >> 0x10);
      uStack_690._3_1_ = (undefined1)((ulong)lStack_1820 >> 0x18);
      uStack_690._4_1_ = (undefined1)((ulong)lStack_1820 >> 0x20);
      uStack_690._5_1_ = (undefined1)((ulong)lStack_1820 >> 0x28);
      uStack_690._6_1_ = (undefined1)((ulong)lStack_1820 >> 0x30);
      uStack_690._7_1_ = (undefined1)((ulong)lStack_1820 >> 0x38);
      local_1b18 = (undefined1)uStack_690;
      cStack_1b17 = (char)uStack_1160;
      uStack_1b16 = uStack_690._1_1_;
      cStack_1b15 = uStack_1160._1_1_;
      uStack_1b14 = uStack_690._2_1_;
      cStack_1b13 = uStack_1160._2_1_;
      uStack_1b12 = uStack_690._3_1_;
      cStack_1b11 = uStack_1160._3_1_;
      uStack_1b10 = uStack_690._4_1_;
      cStack_1b0f = uStack_1160._4_1_;
      uStack_1b0e = uStack_690._5_1_;
      cStack_1b0d = uStack_1160._5_1_;
      uStack_1b0c = uStack_690._6_1_;
      cStack_1b0b = uStack_1160._6_1_;
      uStack_1b0a = uStack_690._7_1_;
      cStack_1b09 = uStack_1160._7_1_;
      local_6b8 = local_1838;
      uStack_6b0 = uStack_1830;
      uVar104 = uStack_6b0;
      local_6c8 = local_1758;
      uStack_6c0 = uStack_1750;
      uStack_6b0._0_1_ = (undefined1)uStack_1830;
      uStack_6b0._1_1_ = (undefined1)(uStack_1830 >> 8);
      uStack_6b0._2_1_ = (undefined1)(uStack_1830 >> 0x10);
      uStack_6b0._3_1_ = (undefined1)(uStack_1830 >> 0x18);
      uStack_6b0._4_1_ = (undefined1)(uStack_1830 >> 0x20);
      uStack_6b0._5_1_ = (undefined1)(uStack_1830 >> 0x28);
      uStack_6b0._6_1_ = (undefined1)(uStack_1830 >> 0x30);
      uStack_6b0._7_1_ = (undefined1)(uStack_1830 >> 0x38);
      local_1b28 = (undefined1)uStack_6b0;
      cStack_1b27 = (char)uStack_1160;
      uStack_1b26 = uStack_6b0._1_1_;
      cStack_1b25 = uStack_1160._1_1_;
      uStack_1b24 = uStack_6b0._2_1_;
      cStack_1b23 = uStack_1160._2_1_;
      uStack_1b22 = uStack_6b0._3_1_;
      cStack_1b21 = uStack_1160._3_1_;
      uStack_1b20 = uStack_6b0._4_1_;
      cStack_1b1f = uStack_1160._4_1_;
      uStack_1b1e = uStack_6b0._5_1_;
      cStack_1b1d = uStack_1160._5_1_;
      uStack_1b1c = uStack_6b0._6_1_;
      cStack_1b1b = uStack_1160._6_1_;
      uStack_1b1a = uStack_6b0._7_1_;
      cStack_1b19 = uStack_1160._7_1_;
      local_6d8 = local_1848;
      uStack_6d0 = uStack_1840;
      uVar103 = uStack_6d0;
      local_6e8 = local_1758;
      uStack_6e0 = uStack_1750;
      uStack_6d0._0_1_ = (undefined1)uStack_1840;
      uStack_6d0._1_1_ = (undefined1)(uStack_1840 >> 8);
      uStack_6d0._2_1_ = (undefined1)(uStack_1840 >> 0x10);
      uStack_6d0._3_1_ = (undefined1)(uStack_1840 >> 0x18);
      uStack_6d0._4_1_ = (undefined1)(uStack_1840 >> 0x20);
      uStack_6d0._5_1_ = (undefined1)(uStack_1840 >> 0x28);
      uStack_6d0._6_1_ = (undefined1)(uStack_1840 >> 0x30);
      uStack_6d0._7_1_ = (undefined1)(uStack_1840 >> 0x38);
      local_1b38 = (undefined1)uStack_6d0;
      cStack_1b37 = (char)uStack_1160;
      uStack_1b36 = uStack_6d0._1_1_;
      cStack_1b35 = uStack_1160._1_1_;
      uStack_1b34 = uStack_6d0._2_1_;
      cStack_1b33 = uStack_1160._2_1_;
      uStack_1b32 = uStack_6d0._3_1_;
      cStack_1b31 = uStack_1160._3_1_;
      uStack_1b30 = uStack_6d0._4_1_;
      cStack_1b2f = uStack_1160._4_1_;
      uStack_1b2e = uStack_6d0._5_1_;
      cStack_1b2d = uStack_1160._5_1_;
      uStack_1b2c = uStack_6d0._6_1_;
      cStack_1b2b = uStack_1160._6_1_;
      uStack_1b2a = uStack_6d0._7_1_;
      cStack_1b29 = uStack_1160._7_1_;
      local_6f8 = local_1858;
      uStack_6f0 = uStack_1850;
      uVar102 = uStack_6f0;
      local_708 = local_1758;
      uStack_700 = uStack_1750;
      uStack_6f0._0_1_ = (undefined1)uStack_1850;
      uStack_6f0._1_1_ = (undefined1)(uStack_1850 >> 8);
      uStack_6f0._2_1_ = (undefined1)(uStack_1850 >> 0x10);
      uStack_6f0._3_1_ = (undefined1)(uStack_1850 >> 0x18);
      uStack_6f0._4_1_ = (undefined1)(uStack_1850 >> 0x20);
      uStack_6f0._5_1_ = (undefined1)(uStack_1850 >> 0x28);
      uStack_6f0._6_1_ = (undefined1)(uStack_1850 >> 0x30);
      uStack_6f0._7_1_ = (undefined1)(uStack_1850 >> 0x38);
      local_1b48 = (undefined1)uStack_6f0;
      cStack_1b47 = (char)uStack_1160;
      uStack_1b46 = uStack_6f0._1_1_;
      cStack_1b45 = uStack_1160._1_1_;
      uStack_1b44 = uStack_6f0._2_1_;
      cStack_1b43 = uStack_1160._2_1_;
      uStack_1b42 = uStack_6f0._3_1_;
      cStack_1b41 = uStack_1160._3_1_;
      uStack_1b40 = uStack_6f0._4_1_;
      cStack_1b3f = uStack_1160._4_1_;
      uStack_1b3e = uStack_6f0._5_1_;
      cStack_1b3d = uStack_1160._5_1_;
      uStack_1b3c = uStack_6f0._6_1_;
      cStack_1b3b = uStack_1160._6_1_;
      uStack_1b3a = uStack_6f0._7_1_;
      cStack_1b39 = uStack_1160._7_1_;
      local_718 = local_1868;
      uStack_710 = uStack_1860;
      uVar101 = uStack_710;
      local_728 = local_1758;
      uStack_720 = uStack_1750;
      uStack_710._0_1_ = (undefined1)uStack_1860;
      uStack_710._1_1_ = (undefined1)(uStack_1860 >> 8);
      uStack_710._2_1_ = (undefined1)(uStack_1860 >> 0x10);
      uStack_710._3_1_ = (undefined1)(uStack_1860 >> 0x18);
      uStack_710._4_1_ = (undefined1)(uStack_1860 >> 0x20);
      uStack_710._5_1_ = (undefined1)(uStack_1860 >> 0x28);
      uStack_710._6_1_ = (undefined1)(uStack_1860 >> 0x30);
      uStack_710._7_1_ = (undefined1)(uStack_1860 >> 0x38);
      local_1b58 = (undefined1)uStack_710;
      cStack_1b57 = (char)uStack_1160;
      uStack_1b56 = uStack_710._1_1_;
      cStack_1b55 = uStack_1160._1_1_;
      uStack_1b54 = uStack_710._2_1_;
      cStack_1b53 = uStack_1160._2_1_;
      uStack_1b52 = uStack_710._3_1_;
      cStack_1b51 = uStack_1160._3_1_;
      uStack_1b50 = uStack_710._4_1_;
      cStack_1b4f = uStack_1160._4_1_;
      uStack_1b4e = uStack_710._5_1_;
      cStack_1b4d = uStack_1160._5_1_;
      uStack_1b4c = uStack_710._6_1_;
      cStack_1b4b = uStack_1160._6_1_;
      uStack_1b4a = uStack_710._7_1_;
      cStack_1b49 = uStack_1160._7_1_;
      local_738 = local_1878;
      uStack_730 = lStack_1870;
      lVar100 = uStack_730;
      local_748 = local_1758;
      uStack_740 = uStack_1750;
      uStack_730._0_1_ = (undefined1)lStack_1870;
      uStack_730._1_1_ = (undefined1)((ulong)lStack_1870 >> 8);
      uStack_730._2_1_ = (undefined1)((ulong)lStack_1870 >> 0x10);
      uStack_730._3_1_ = (undefined1)((ulong)lStack_1870 >> 0x18);
      uStack_730._4_1_ = (undefined1)((ulong)lStack_1870 >> 0x20);
      uStack_730._5_1_ = (undefined1)((ulong)lStack_1870 >> 0x28);
      uStack_730._6_1_ = (undefined1)((ulong)lStack_1870 >> 0x30);
      uStack_730._7_1_ = (undefined1)((ulong)lStack_1870 >> 0x38);
      local_1b68 = (undefined1)uStack_730;
      cStack_1b67 = (char)uStack_1160;
      uStack_1b66 = uStack_730._1_1_;
      cStack_1b65 = uStack_1160._1_1_;
      uStack_1b64 = uStack_730._2_1_;
      cStack_1b63 = uStack_1160._2_1_;
      uStack_1b62 = uStack_730._3_1_;
      cStack_1b61 = uStack_1160._3_1_;
      uStack_1b60 = uStack_730._4_1_;
      cStack_1b5f = uStack_1160._4_1_;
      uStack_1b5e = uStack_730._5_1_;
      cStack_1b5d = uStack_1160._5_1_;
      uStack_1b5c = uStack_730._6_1_;
      cStack_1b5b = uStack_1160._6_1_;
      uStack_1b5a = uStack_730._7_1_;
      cStack_1b59 = uStack_1160._7_1_;
      local_758 = local_1888;
      uStack_750 = lStack_1880;
      lVar99 = uStack_750;
      local_768 = local_1758;
      uStack_760 = uStack_1750;
      uStack_750._0_1_ = (undefined1)lStack_1880;
      uStack_750._1_1_ = (undefined1)((ulong)lStack_1880 >> 8);
      uStack_750._2_1_ = (undefined1)((ulong)lStack_1880 >> 0x10);
      uStack_750._3_1_ = (undefined1)((ulong)lStack_1880 >> 0x18);
      uStack_750._4_1_ = (undefined1)((ulong)lStack_1880 >> 0x20);
      uStack_750._5_1_ = (undefined1)((ulong)lStack_1880 >> 0x28);
      uStack_750._6_1_ = (undefined1)((ulong)lStack_1880 >> 0x30);
      uStack_750._7_1_ = (undefined1)((ulong)lStack_1880 >> 0x38);
      local_1b78 = (undefined1)uStack_750;
      cStack_1b77 = (char)uStack_1160;
      uStack_1b76 = uStack_750._1_1_;
      cStack_1b75 = uStack_1160._1_1_;
      uStack_1b74 = uStack_750._2_1_;
      cStack_1b73 = uStack_1160._2_1_;
      uStack_1b72 = uStack_750._3_1_;
      cStack_1b71 = uStack_1160._3_1_;
      uStack_1b70 = uStack_750._4_1_;
      cStack_1b6f = uStack_1160._4_1_;
      uStack_1b6e = uStack_750._5_1_;
      cStack_1b6d = uStack_1160._5_1_;
      uStack_1b6c = uStack_750._6_1_;
      cStack_1b6b = uStack_1160._6_1_;
      uStack_1b6a = uStack_750._7_1_;
      cStack_1b69 = uStack_1160._7_1_;
      uVar3 = CONCAT13(local_1168._1_1_,
                       CONCAT12(local_1558._1_1_,CONCAT11((char)local_1168,(undefined1)local_1558)))
      ;
      uVar4 = CONCAT15(local_1168._2_1_,CONCAT14(local_1558._2_1_,uVar3));
      uVar44 = CONCAT17(local_1168._3_1_,CONCAT16(local_1558._3_1_,uVar4));
      uVar6 = CONCAT13(local_1168._5_1_,
                       CONCAT12(local_1558._5_1_,CONCAT11(local_1168._4_1_,local_1558._4_1_)));
      uVar7 = CONCAT15(local_1168._6_1_,CONCAT14(local_1558._6_1_,uVar6));
      uVar47 = CONCAT17(local_1168._7_1_,CONCAT16(local_1558._7_1_,uVar7));
      local_278._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_278._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_278._6_2_ = (short)((ulong)uVar44 >> 0x30);
      uStack_270._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_270._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_270._6_2_ = (short)((ulong)uVar47 >> 0x30);
      local_2b8 = CONCAT11((char)local_1168,(undefined1)local_1558) + 4;
      sStack_2b6 = local_278._2_2_ + 4;
      sStack_2b4 = local_278._4_2_ + 4;
      sStack_2b2 = local_278._6_2_ + 4;
      sStack_2b0 = CONCAT11(local_1168._4_1_,local_1558._4_1_) + 4;
      sStack_2ae = uStack_270._2_2_ + 4;
      sStack_2ac = uStack_270._4_2_ + 4;
      sStack_2aa = uStack_270._6_2_ + 4;
      uVar15 = CONCAT13(local_1168._1_1_,
                        CONCAT12(local_1558._1_1_,CONCAT11((char)local_1168,(undefined1)local_1558))
                       );
      uVar16 = CONCAT15(local_1168._2_1_,CONCAT14(local_1558._2_1_,uVar15));
      uVar45 = CONCAT17(local_1168._3_1_,CONCAT16(local_1558._3_1_,uVar16));
      uVar19 = CONCAT13(local_1168._5_1_,
                        CONCAT12(local_1558._5_1_,CONCAT11(local_1168._4_1_,local_1558._4_1_)));
      uVar20 = CONCAT15(local_1168._6_1_,CONCAT14(local_1558._6_1_,uVar19));
      uVar48 = CONCAT17(local_1168._7_1_,CONCAT16(local_1558._7_1_,uVar20));
      uVar3 = CONCAT13(local_1168._1_1_,
                       CONCAT12(local_1578._1_1_,CONCAT11((char)local_1168,(undefined1)local_1578)))
      ;
      uVar4 = CONCAT15(local_1168._2_1_,CONCAT14(local_1578._2_1_,uVar3));
      uVar40 = CONCAT17(local_1168._3_1_,CONCAT16(local_1578._3_1_,uVar4));
      uVar6 = CONCAT13(local_1168._5_1_,
                       CONCAT12(local_1578._5_1_,CONCAT11(local_1168._4_1_,local_1578._4_1_)));
      uVar7 = CONCAT15(local_1168._6_1_,CONCAT14(local_1578._6_1_,uVar6));
      uVar42 = CONCAT17(local_1168._7_1_,CONCAT16(local_1578._7_1_,uVar7));
      local_298._2_2_ = (short)((uint)uVar15 >> 0x10);
      local_298._4_2_ = (short)((uint6)uVar16 >> 0x20);
      local_298._6_2_ = (short)((ulong)uVar45 >> 0x30);
      uStack_290._2_2_ = (short)((uint)uVar19 >> 0x10);
      uStack_290._4_2_ = (short)((uint6)uVar20 >> 0x20);
      uStack_290._6_2_ = (short)((ulong)uVar48 >> 0x30);
      local_2a8._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_2a8._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_2a8._6_2_ = (short)((ulong)uVar40 >> 0x30);
      uStack_2a0._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_2a0._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_2a0._6_2_ = (short)((ulong)uVar42 >> 0x30);
      local_2c8 = CONCAT11((char)local_1168,(undefined1)local_1558) +
                  CONCAT11((char)local_1168,(undefined1)local_1578);
      sStack_2c6 = local_298._2_2_ + local_2a8._2_2_;
      sStack_2c4 = local_298._4_2_ + local_2a8._4_2_;
      sStack_2c2 = local_298._6_2_ + local_2a8._6_2_;
      sStack_2c0 = CONCAT11(local_1168._4_1_,local_1558._4_1_) +
                   CONCAT11(local_1168._4_1_,local_1578._4_1_);
      sStack_2be = uStack_290._2_2_ + uStack_2a0._2_2_;
      sStack_2bc = uStack_290._4_2_ + uStack_2a0._4_2_;
      sStack_2ba = uStack_290._6_2_ + uStack_2a0._6_2_;
      local_1b88._0_4_ = CONCAT22(sStack_2b6 + sStack_2c6,local_2b8 + local_2c8);
      local_1b88._0_6_ = CONCAT24(sStack_2b4 + sStack_2c4,(undefined4)local_1b88);
      local_1b88 = CONCAT26(sStack_2b2 + sStack_2c2,(undefined6)local_1b88);
      uStack_1b80._0_4_ = CONCAT22(sStack_2ae + sStack_2be,sStack_2b0 + sStack_2c0);
      uStack_1b80._0_6_ = CONCAT24(sStack_2ac + sStack_2bc,(undefined4)uStack_1b80);
      uStack_1b80 = CONCAT26(sStack_2aa + sStack_2ba,(undefined6)uStack_1b80);
      uVar3 = CONCAT13(local_1168._1_1_,
                       CONCAT12(local_1558._1_1_,CONCAT11((char)local_1168,(undefined1)local_1558)))
      ;
      uVar4 = CONCAT15(local_1168._2_1_,CONCAT14(local_1558._2_1_,uVar3));
      uVar46 = CONCAT17(local_1168._3_1_,CONCAT16(local_1558._3_1_,uVar4));
      uVar6 = CONCAT13(local_1168._5_1_,
                       CONCAT12(local_1558._5_1_,CONCAT11(local_1168._4_1_,local_1558._4_1_)));
      uVar7 = CONCAT15(local_1168._6_1_,CONCAT14(local_1558._6_1_,uVar6));
      uVar49 = CONCAT17(local_1168._7_1_,CONCAT16(local_1558._7_1_,uVar7));
      local_2e8 = local_1b88;
      lStack_2e0 = uStack_1b80;
      local_2d8._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_2d8._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_2d8._6_2_ = (short)((ulong)uVar46 >> 0x30);
      uStack_2d0._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_2d0._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_2d0._6_2_ = (short)((ulong)uVar49 >> 0x30);
      local_318 = CONCAT11((char)local_1168,(undefined1)local_1558) + local_2b8 + local_2c8;
      sStack_316 = local_2d8._2_2_ + sStack_2b6 + sStack_2c6;
      sStack_314 = local_2d8._4_2_ + sStack_2b4 + sStack_2c4;
      sStack_312 = local_2d8._6_2_ + sStack_2b2 + sStack_2c2;
      sStack_310 = CONCAT11(local_1168._4_1_,local_1558._4_1_) + sStack_2b0 + sStack_2c0;
      sStack_30e = uStack_2d0._2_2_ + sStack_2ae + sStack_2be;
      sStack_30c = uStack_2d0._4_2_ + sStack_2ac + sStack_2bc;
      sStack_30a = uStack_2d0._6_2_ + sStack_2aa + sStack_2ba;
      uVar15 = CONCAT13(local_1168._1_1_,
                        CONCAT12(local_1578._1_1_,CONCAT11((char)local_1168,(undefined1)local_1578))
                       );
      uVar16 = CONCAT15(local_1168._2_1_,CONCAT14(local_1578._2_1_,uVar15));
      uVar41 = CONCAT17(local_1168._3_1_,CONCAT16(local_1578._3_1_,uVar16));
      uVar19 = CONCAT13(local_1168._5_1_,
                        CONCAT12(local_1578._5_1_,CONCAT11(local_1168._4_1_,local_1578._4_1_)));
      uVar20 = CONCAT15(local_1168._6_1_,CONCAT14(local_1578._6_1_,uVar19));
      uVar43 = CONCAT17(local_1168._7_1_,CONCAT16(local_1578._7_1_,uVar20));
      uVar3 = CONCAT13(local_1168._1_1_,
                       CONCAT12(local_1598._1_1_,CONCAT11((char)local_1168,(undefined1)local_1598)))
      ;
      uVar4 = CONCAT15(local_1168._2_1_,CONCAT14(local_1598._2_1_,uVar3));
      uVar38 = CONCAT17(local_1168._3_1_,CONCAT16(local_1598._3_1_,uVar4));
      uVar6 = CONCAT13(local_1168._5_1_,
                       CONCAT12(local_1598._5_1_,CONCAT11(local_1168._4_1_,local_1598._4_1_)));
      uVar7 = CONCAT15(local_1168._6_1_,CONCAT14(local_1598._6_1_,uVar6));
      uVar39 = CONCAT17(local_1168._7_1_,CONCAT16(local_1598._7_1_,uVar7));
      local_2f8._2_2_ = (short)((uint)uVar15 >> 0x10);
      local_2f8._4_2_ = (short)((uint6)uVar16 >> 0x20);
      local_2f8._6_2_ = (short)((ulong)uVar41 >> 0x30);
      uStack_2f0._2_2_ = (short)((uint)uVar19 >> 0x10);
      uStack_2f0._4_2_ = (short)((uint6)uVar20 >> 0x20);
      uStack_2f0._6_2_ = (short)((ulong)uVar43 >> 0x30);
      local_308._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_308._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_308._6_2_ = (short)((ulong)uVar38 >> 0x30);
      uStack_300._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_300._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_300._6_2_ = (short)((ulong)uVar39 >> 0x30);
      local_328 = CONCAT11((char)local_1168,(undefined1)local_1578) +
                  CONCAT11((char)local_1168,(undefined1)local_1598);
      sStack_326 = local_2f8._2_2_ + local_308._2_2_;
      sStack_324 = local_2f8._4_2_ + local_308._4_2_;
      sStack_322 = local_2f8._6_2_ + local_308._6_2_;
      sStack_320 = CONCAT11(local_1168._4_1_,local_1578._4_1_) +
                   CONCAT11(local_1168._4_1_,local_1598._4_1_);
      sStack_31e = uStack_2f0._2_2_ + uStack_300._2_2_;
      sStack_31c = uStack_2f0._4_2_ + uStack_300._4_2_;
      sStack_31a = uStack_2f0._6_2_ + uStack_300._6_2_;
      local_1b88._0_4_ = CONCAT22(sStack_316 + sStack_326,local_318 + local_328);
      local_1b88._0_6_ = CONCAT24(sStack_314 + sStack_324,(undefined4)local_1b88);
      local_1b88 = CONCAT26(sStack_312 + sStack_322,(undefined6)local_1b88);
      uStack_1b80._0_4_ = CONCAT22(sStack_30e + sStack_31e,sStack_310 + sStack_320);
      uStack_1b80._0_6_ = CONCAT24(sStack_30c + sStack_31c,(undefined4)uStack_1b80);
      uStack_1b80 = CONCAT26(sStack_30a + sStack_31a,(undefined6)uStack_1b80);
      uVar15 = CONCAT13(local_1168._1_1_,
                        CONCAT12(local_15b8._1_1_,CONCAT11((char)local_1168,(undefined1)local_15b8))
                       );
      uVar16 = CONCAT15(local_1168._2_1_,CONCAT14(local_15b8._2_1_,uVar15));
      uVar36 = CONCAT17(local_1168._3_1_,CONCAT16(local_15b8._3_1_,uVar16));
      uVar19 = CONCAT13(local_1168._5_1_,
                        CONCAT12(local_15b8._5_1_,CONCAT11(local_1168._4_1_,local_15b8._4_1_)));
      uVar20 = CONCAT15(local_1168._6_1_,CONCAT14(local_15b8._6_1_,uVar19));
      uVar37 = CONCAT17(local_1168._7_1_,CONCAT16(local_15b8._7_1_,uVar20));
      uVar3 = CONCAT13(local_1168._1_1_,
                       CONCAT12(local_15d8._1_1_,CONCAT11((char)local_1168,(undefined1)local_15d8)))
      ;
      uVar4 = CONCAT15(local_1168._2_1_,CONCAT14(local_15d8._2_1_,uVar3));
      uVar34 = CONCAT17(local_1168._3_1_,CONCAT16(local_15d8._3_1_,uVar4));
      uVar6 = CONCAT13(local_1168._5_1_,
                       CONCAT12(local_15d8._5_1_,CONCAT11(local_1168._4_1_,local_15d8._4_1_)));
      uVar7 = CONCAT15(local_1168._6_1_,CONCAT14(local_15d8._6_1_,uVar6));
      uVar35 = CONCAT17(local_1168._7_1_,CONCAT16(local_15d8._7_1_,uVar7));
      local_338._2_2_ = (short)((uint)uVar15 >> 0x10);
      local_338._4_2_ = (short)((uint6)uVar16 >> 0x20);
      local_338._6_2_ = (short)((ulong)uVar36 >> 0x30);
      uStack_330._2_2_ = (short)((uint)uVar19 >> 0x10);
      uStack_330._4_2_ = (short)((uint6)uVar20 >> 0x20);
      uStack_330._6_2_ = (short)((ulong)uVar37 >> 0x30);
      local_348._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_348._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_348._6_2_ = (short)((ulong)uVar34 >> 0x30);
      uStack_340._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_340._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_340._6_2_ = (short)((ulong)uVar35 >> 0x30);
      local_358 = CONCAT11((char)local_1168,(undefined1)local_15b8) +
                  CONCAT11((char)local_1168,(undefined1)local_15d8);
      sStack_356 = local_338._2_2_ + local_348._2_2_;
      sStack_354 = local_338._4_2_ + local_348._4_2_;
      sStack_352 = local_338._6_2_ + local_348._6_2_;
      sStack_350 = CONCAT11(local_1168._4_1_,local_15b8._4_1_) +
                   CONCAT11(local_1168._4_1_,local_15d8._4_1_);
      sStack_34e = uStack_330._2_2_ + uStack_340._2_2_;
      sStack_34c = uStack_330._4_2_ + uStack_340._4_2_;
      sStack_34a = uStack_330._6_2_ + uStack_340._6_2_;
      local_368 = local_1b88;
      lStack_360 = uStack_1b80;
      local_1b88._0_4_ =
           CONCAT22(sStack_356 + sStack_316 + sStack_326,local_358 + local_318 + local_328);
      local_1b88._0_6_ = CONCAT24(sStack_354 + sStack_314 + sStack_324,(undefined4)local_1b88);
      local_1b88 = CONCAT26(sStack_352 + sStack_312 + sStack_322,(undefined6)local_1b88);
      uStack_1b80._0_4_ =
           CONCAT22(sStack_34e + sStack_30e + sStack_31e,sStack_350 + sStack_310 + sStack_320);
      uStack_1b80._0_6_ = CONCAT24(sStack_34c + sStack_30c + sStack_31c,(undefined4)uStack_1b80);
      uStack_1b80 = CONCAT26(sStack_34a + sStack_30a + sStack_31a,(undefined6)uStack_1b80);
      uVar3 = CONCAT13(uStack_1160._1_1_,
                       CONCAT12(uStack_670._1_1_,CONCAT11((char)uStack_1160,(undefined1)uStack_670))
                      );
      uVar4 = CONCAT15(uStack_1160._2_1_,CONCAT14(uStack_670._2_1_,uVar3));
      uVar28 = CONCAT17(uStack_1160._3_1_,CONCAT16(uStack_670._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_1160._5_1_,
                       CONCAT12(uStack_670._5_1_,CONCAT11(uStack_1160._4_1_,uStack_670._4_1_)));
      uVar7 = CONCAT15(uStack_1160._6_1_,CONCAT14(uStack_670._6_1_,uVar6));
      uVar31 = CONCAT17(uStack_1160._7_1_,CONCAT16(uStack_670._7_1_,uVar7));
      local_378._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_378._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_378._6_2_ = (short)((ulong)uVar28 >> 0x30);
      uStack_370._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_370._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_370._6_2_ = (short)((ulong)uVar31 >> 0x30);
      local_3b8 = CONCAT11((char)uStack_1160,(undefined1)uStack_670) + 4;
      sStack_3b6 = local_378._2_2_ + 4;
      sStack_3b4 = local_378._4_2_ + 4;
      sStack_3b2 = local_378._6_2_ + 4;
      sStack_3b0 = CONCAT11(uStack_1160._4_1_,uStack_670._4_1_) + 4;
      sStack_3ae = uStack_370._2_2_ + 4;
      sStack_3ac = uStack_370._4_2_ + 4;
      sStack_3aa = uStack_370._6_2_ + 4;
      uVar15 = CONCAT13(uStack_1160._1_1_,
                        CONCAT12(uStack_670._1_1_,CONCAT11((char)uStack_1160,(undefined1)uStack_670)
                                ));
      uVar16 = CONCAT15(uStack_1160._2_1_,CONCAT14(uStack_670._2_1_,uVar15));
      uVar29 = CONCAT17(uStack_1160._3_1_,CONCAT16(uStack_670._3_1_,uVar16));
      uVar19 = CONCAT13(uStack_1160._5_1_,
                        CONCAT12(uStack_670._5_1_,CONCAT11(uStack_1160._4_1_,uStack_670._4_1_)));
      uVar20 = CONCAT15(uStack_1160._6_1_,CONCAT14(uStack_670._6_1_,uVar19));
      uVar32 = CONCAT17(uStack_1160._7_1_,CONCAT16(uStack_670._7_1_,uVar20));
      uVar3 = CONCAT13(uStack_1160._1_1_,
                       CONCAT12(uStack_690._1_1_,CONCAT11((char)uStack_1160,(undefined1)uStack_690))
                      );
      uVar4 = CONCAT15(uStack_1160._2_1_,CONCAT14(uStack_690._2_1_,uVar3));
      uVar24 = CONCAT17(uStack_1160._3_1_,CONCAT16(uStack_690._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_1160._5_1_,
                       CONCAT12(uStack_690._5_1_,CONCAT11(uStack_1160._4_1_,uStack_690._4_1_)));
      uVar7 = CONCAT15(uStack_1160._6_1_,CONCAT14(uStack_690._6_1_,uVar6));
      uVar26 = CONCAT17(uStack_1160._7_1_,CONCAT16(uStack_690._7_1_,uVar7));
      local_398._2_2_ = (short)((uint)uVar15 >> 0x10);
      local_398._4_2_ = (short)((uint6)uVar16 >> 0x20);
      local_398._6_2_ = (short)((ulong)uVar29 >> 0x30);
      uStack_390._2_2_ = (short)((uint)uVar19 >> 0x10);
      uStack_390._4_2_ = (short)((uint6)uVar20 >> 0x20);
      uStack_390._6_2_ = (short)((ulong)uVar32 >> 0x30);
      local_3a8._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_3a8._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_3a8._6_2_ = (short)((ulong)uVar24 >> 0x30);
      uStack_3a0._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_3a0._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_3a0._6_2_ = (short)((ulong)uVar26 >> 0x30);
      local_3c8 = CONCAT11((char)uStack_1160,(undefined1)uStack_670) +
                  CONCAT11((char)uStack_1160,(undefined1)uStack_690);
      sStack_3c6 = local_398._2_2_ + local_3a8._2_2_;
      sStack_3c4 = local_398._4_2_ + local_3a8._4_2_;
      sStack_3c2 = local_398._6_2_ + local_3a8._6_2_;
      sStack_3c0 = CONCAT11(uStack_1160._4_1_,uStack_670._4_1_) +
                   CONCAT11(uStack_1160._4_1_,uStack_690._4_1_);
      sStack_3be = uStack_390._2_2_ + uStack_3a0._2_2_;
      sStack_3bc = uStack_390._4_2_ + uStack_3a0._4_2_;
      sStack_3ba = uStack_390._6_2_ + uStack_3a0._6_2_;
      local_1b98._0_4_ = CONCAT22(sStack_3b6 + sStack_3c6,local_3b8 + local_3c8);
      local_1b98._0_6_ = CONCAT24(sStack_3b4 + sStack_3c4,(undefined4)local_1b98);
      local_1b98 = CONCAT26(sStack_3b2 + sStack_3c2,(undefined6)local_1b98);
      uStack_1b90._0_4_ = CONCAT22(sStack_3ae + sStack_3be,sStack_3b0 + sStack_3c0);
      uStack_1b90._0_6_ = CONCAT24(sStack_3ac + sStack_3bc,(undefined4)uStack_1b90);
      uStack_1b90 = CONCAT26(sStack_3aa + sStack_3ba,(undefined6)uStack_1b90);
      uVar3 = CONCAT13(uStack_1160._1_1_,
                       CONCAT12(uStack_670._1_1_,CONCAT11((char)uStack_1160,(undefined1)uStack_670))
                      );
      uVar4 = CONCAT15(uStack_1160._2_1_,CONCAT14(uStack_670._2_1_,uVar3));
      uVar30 = CONCAT17(uStack_1160._3_1_,CONCAT16(uStack_670._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_1160._5_1_,
                       CONCAT12(uStack_670._5_1_,CONCAT11(uStack_1160._4_1_,uStack_670._4_1_)));
      uVar7 = CONCAT15(uStack_1160._6_1_,CONCAT14(uStack_670._6_1_,uVar6));
      uVar33 = CONCAT17(uStack_1160._7_1_,CONCAT16(uStack_670._7_1_,uVar7));
      local_3e8 = local_1b98;
      lStack_3e0 = uStack_1b90;
      local_3d8._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_3d8._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_3d8._6_2_ = (short)((ulong)uVar30 >> 0x30);
      uStack_3d0._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_3d0._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_3d0._6_2_ = (short)((ulong)uVar33 >> 0x30);
      local_418 = CONCAT11((char)uStack_1160,(undefined1)uStack_670) + local_3b8 + local_3c8;
      sStack_416 = local_3d8._2_2_ + sStack_3b6 + sStack_3c6;
      sStack_414 = local_3d8._4_2_ + sStack_3b4 + sStack_3c4;
      sStack_412 = local_3d8._6_2_ + sStack_3b2 + sStack_3c2;
      sStack_410 = CONCAT11(uStack_1160._4_1_,uStack_670._4_1_) + sStack_3b0 + sStack_3c0;
      sStack_40e = uStack_3d0._2_2_ + sStack_3ae + sStack_3be;
      sStack_40c = uStack_3d0._4_2_ + sStack_3ac + sStack_3bc;
      sStack_40a = uStack_3d0._6_2_ + sStack_3aa + sStack_3ba;
      uVar15 = CONCAT13(uStack_1160._1_1_,
                        CONCAT12(uStack_690._1_1_,CONCAT11((char)uStack_1160,(undefined1)uStack_690)
                                ));
      uVar16 = CONCAT15(uStack_1160._2_1_,CONCAT14(uStack_690._2_1_,uVar15));
      uVar25 = CONCAT17(uStack_1160._3_1_,CONCAT16(uStack_690._3_1_,uVar16));
      uVar19 = CONCAT13(uStack_1160._5_1_,
                        CONCAT12(uStack_690._5_1_,CONCAT11(uStack_1160._4_1_,uStack_690._4_1_)));
      uVar20 = CONCAT15(uStack_1160._6_1_,CONCAT14(uStack_690._6_1_,uVar19));
      uVar27 = CONCAT17(uStack_1160._7_1_,CONCAT16(uStack_690._7_1_,uVar20));
      uVar3 = CONCAT13(uStack_1160._1_1_,
                       CONCAT12(uStack_6b0._1_1_,CONCAT11((char)uStack_1160,(undefined1)uStack_6b0))
                      );
      uVar4 = CONCAT15(uStack_1160._2_1_,CONCAT14(uStack_6b0._2_1_,uVar3));
      uVar22 = CONCAT17(uStack_1160._3_1_,CONCAT16(uStack_6b0._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_1160._5_1_,
                       CONCAT12(uStack_6b0._5_1_,CONCAT11(uStack_1160._4_1_,uStack_6b0._4_1_)));
      uVar7 = CONCAT15(uStack_1160._6_1_,CONCAT14(uStack_6b0._6_1_,uVar6));
      uVar23 = CONCAT17(uStack_1160._7_1_,CONCAT16(uStack_6b0._7_1_,uVar7));
      local_3f8._2_2_ = (short)((uint)uVar15 >> 0x10);
      local_3f8._4_2_ = (short)((uint6)uVar16 >> 0x20);
      local_3f8._6_2_ = (short)((ulong)uVar25 >> 0x30);
      uStack_3f0._2_2_ = (short)((uint)uVar19 >> 0x10);
      uStack_3f0._4_2_ = (short)((uint6)uVar20 >> 0x20);
      uStack_3f0._6_2_ = (short)((ulong)uVar27 >> 0x30);
      local_408._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_408._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_408._6_2_ = (short)((ulong)uVar22 >> 0x30);
      uStack_400._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_400._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_400._6_2_ = (short)((ulong)uVar23 >> 0x30);
      local_428 = CONCAT11((char)uStack_1160,(undefined1)uStack_690) +
                  CONCAT11((char)uStack_1160,(undefined1)uStack_6b0);
      sStack_426 = local_3f8._2_2_ + local_408._2_2_;
      sStack_424 = local_3f8._4_2_ + local_408._4_2_;
      sStack_422 = local_3f8._6_2_ + local_408._6_2_;
      sStack_420 = CONCAT11(uStack_1160._4_1_,uStack_690._4_1_) +
                   CONCAT11(uStack_1160._4_1_,uStack_6b0._4_1_);
      sStack_41e = uStack_3f0._2_2_ + uStack_400._2_2_;
      sStack_41c = uStack_3f0._4_2_ + uStack_400._4_2_;
      sStack_41a = uStack_3f0._6_2_ + uStack_400._6_2_;
      local_1b98._0_4_ = CONCAT22(sStack_416 + sStack_426,local_418 + local_428);
      local_1b98._0_6_ = CONCAT24(sStack_414 + sStack_424,(undefined4)local_1b98);
      local_1b98 = CONCAT26(sStack_412 + sStack_422,(undefined6)local_1b98);
      uStack_1b90._0_4_ = CONCAT22(sStack_40e + sStack_41e,sStack_410 + sStack_420);
      uStack_1b90._0_6_ = CONCAT24(sStack_40c + sStack_41c,(undefined4)uStack_1b90);
      uStack_1b90 = CONCAT26(sStack_40a + sStack_41a,(undefined6)uStack_1b90);
      uVar15 = CONCAT13(uStack_1160._1_1_,
                        CONCAT12(uStack_6d0._1_1_,CONCAT11((char)uStack_1160,(undefined1)uStack_6d0)
                                ));
      uVar16 = CONCAT15(uStack_1160._2_1_,CONCAT14(uStack_6d0._2_1_,uVar15));
      uVar14 = CONCAT17(uStack_1160._3_1_,CONCAT16(uStack_6d0._3_1_,uVar16));
      uVar19 = CONCAT13(uStack_1160._5_1_,
                        CONCAT12(uStack_6d0._5_1_,CONCAT11(uStack_1160._4_1_,uStack_6d0._4_1_)));
      uVar20 = CONCAT15(uStack_1160._6_1_,CONCAT14(uStack_6d0._6_1_,uVar19));
      uVar18 = CONCAT17(uStack_1160._7_1_,CONCAT16(uStack_6d0._7_1_,uVar20));
      uVar3 = CONCAT13(uStack_1160._1_1_,
                       CONCAT12(uStack_6f0._1_1_,CONCAT11((char)uStack_1160,(undefined1)uStack_6f0))
                      );
      uVar4 = CONCAT15(uStack_1160._2_1_,CONCAT14(uStack_6f0._2_1_,uVar3));
      uVar10 = CONCAT17(uStack_1160._3_1_,CONCAT16(uStack_6f0._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_1160._5_1_,
                       CONCAT12(uStack_6f0._5_1_,CONCAT11(uStack_1160._4_1_,uStack_6f0._4_1_)));
      uVar7 = CONCAT15(uStack_1160._6_1_,CONCAT14(uStack_6f0._6_1_,uVar6));
      uVar12 = CONCAT17(uStack_1160._7_1_,CONCAT16(uStack_6f0._7_1_,uVar7));
      local_438._2_2_ = (short)((uint)uVar15 >> 0x10);
      local_438._4_2_ = (short)((uint6)uVar16 >> 0x20);
      local_438._6_2_ = (short)((ulong)uVar14 >> 0x30);
      uStack_430._2_2_ = (short)((uint)uVar19 >> 0x10);
      uStack_430._4_2_ = (short)((uint6)uVar20 >> 0x20);
      uStack_430._6_2_ = (short)((ulong)uVar18 >> 0x30);
      local_448._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_448._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_448._6_2_ = (short)((ulong)uVar10 >> 0x30);
      uStack_440._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_440._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_440._6_2_ = (short)((ulong)uVar12 >> 0x30);
      local_458 = CONCAT11((char)uStack_1160,(undefined1)uStack_6d0) +
                  CONCAT11((char)uStack_1160,(undefined1)uStack_6f0);
      sStack_456 = local_438._2_2_ + local_448._2_2_;
      sStack_454 = local_438._4_2_ + local_448._4_2_;
      sStack_452 = local_438._6_2_ + local_448._6_2_;
      sStack_450 = CONCAT11(uStack_1160._4_1_,uStack_6d0._4_1_) +
                   CONCAT11(uStack_1160._4_1_,uStack_6f0._4_1_);
      sStack_44e = uStack_430._2_2_ + uStack_440._2_2_;
      sStack_44c = uStack_430._4_2_ + uStack_440._4_2_;
      sStack_44a = uStack_430._6_2_ + uStack_440._6_2_;
      local_468 = local_1b98;
      lStack_460 = uStack_1b90;
      local_1b98._0_4_ =
           CONCAT22(sStack_456 + sStack_416 + sStack_426,local_458 + local_418 + local_428);
      local_1b98._0_6_ = CONCAT24(sStack_454 + sStack_414 + sStack_424,(undefined4)local_1b98);
      local_1b98 = CONCAT26(sStack_452 + sStack_412 + sStack_422,(undefined6)local_1b98);
      uStack_1b90._0_4_ =
           CONCAT22(sStack_44e + sStack_40e + sStack_41e,sStack_450 + sStack_410 + sStack_420);
      uStack_1b90._0_6_ = CONCAT24(sStack_44c + sStack_40c + sStack_41c,(undefined4)uStack_1b90);
      uStack_1b90 = CONCAT26(sStack_44a + sStack_40a + sStack_41a,(undefined6)uStack_1b90);
      local_1638 = lVar91;
      local_1618 = lVar92;
      local_15f8 = uVar128;
      local_15d8 = uVar129;
      local_15b8 = uVar93;
      local_1598 = uVar94;
      local_1578 = lVar95;
      local_1558 = lVar96;
      local_11b8 = uVar110;
      uStack_11b0 = uVar113;
      local_1198 = uVar97;
      uStack_1190 = uVar98;
      local_1188 = local_19b8;
      uStack_1180 = uStack_19b0;
      local_1178 = local_19b8;
      uStack_1170 = uStack_19b0;
      local_1168 = uVar2;
      uStack_1160 = uVar5;
      local_1158 = lVar87;
      uStack_1150 = lVar88;
      local_10a8 = lVar89;
      uStack_10a0 = lVar90;
      local_e78 = uVar8;
      uStack_e70 = uVar9;
      local_e58 = uVar11;
      uStack_e50 = uVar13;
      local_e38 = uVar17;
      uStack_e30 = uVar21;
      local_e08 = local_1a18;
      uStack_e00 = uStack_1a10;
      local_de8 = local_19d8;
      uStack_de0 = uStack_19d0;
      local_dc8 = local_19f8;
      uStack_dc0 = uStack_19f0;
      local_da8 = local_19e8;
      uStack_da0 = uStack_19e0;
      local_d88 = local_19f8;
      uStack_d80 = uStack_19f0;
      local_d68 = local_19e8;
      uStack_d60 = uStack_19e0;
      local_c08 = local_19d8;
      uStack_c00 = uStack_19d0;
      local_be8 = local_19d8;
      uStack_be0 = uStack_19d0;
      local_bc8 = local_19d8;
      uStack_bc0 = uStack_19d0;
      local_ba8 = local_19d8;
      uStack_ba0 = uStack_19d0;
      local_b68 = local_19d8;
      uStack_b60 = uStack_19d0;
      local_b48 = local_19d8;
      uStack_b40 = uStack_19d0;
      local_b28 = local_19d8;
      uStack_b20 = uStack_19d0;
      local_b08 = local_19d8;
      uStack_b00 = uStack_19d0;
      local_a48 = local_a68;
      uStack_a40 = uStack_a60;
      local_a38 = local_a88;
      uStack_a30 = uStack_a80;
      local_a18 = local_a98;
      uStack_a10 = uStack_a90;
      local_a08 = local_a28;
      uStack_a00 = uStack_a20;
      local_9f8 = local_1a08;
      uStack_9f0 = uStack_1a00;
      local_9e8 = local_a78;
      uStack_9e0 = uStack_a70;
      local_9c8 = local_a58;
      uStack_9c0 = uStack_a50;
      local_9b8 = local_19c8;
      uStack_9b0 = uStack_19c0;
      local_998 = local_19b8;
      uStack_990 = uStack_19b0;
      local_988 = local_9a8;
      uStack_980 = uStack_9a0;
      local_918 = uVar8;
      uStack_910 = uVar9;
      local_8f8 = uVar11;
      uStack_8f0 = uVar13;
      local_8d8 = uVar17;
      uStack_8d0 = uVar21;
      local_848 = local_d28;
      uStack_840 = uStack_d20;
      uStack_750 = lVar99;
      uStack_730 = lVar100;
      uStack_710 = uVar101;
      uStack_6f0 = uVar102;
      uStack_6d0 = uVar103;
      uStack_6b0 = uVar104;
      uStack_690 = lVar105;
      uStack_670 = lVar106;
      local_448 = uVar10;
      uStack_440 = uVar12;
      local_438 = uVar14;
      uStack_430 = uVar18;
      local_408 = uVar22;
      uStack_400 = uVar23;
      local_3f8 = uVar25;
      uStack_3f0 = uVar27;
      local_3d8 = uVar30;
      uStack_3d0 = uVar33;
      local_3a8 = uVar24;
      uStack_3a0 = uVar26;
      local_398 = uVar29;
      uStack_390 = uVar32;
      local_388 = local_1a78;
      uStack_380 = uStack_1a70;
      local_378 = uVar28;
      uStack_370 = uVar31;
      local_348 = uVar34;
      uStack_340 = uVar35;
      local_338 = uVar36;
      uStack_330 = uVar37;
      local_308 = uVar38;
      uStack_300 = uVar39;
      local_2f8 = uVar41;
      uStack_2f0 = uVar43;
      local_2d8 = uVar46;
      uStack_2d0 = uVar49;
      local_2a8 = uVar40;
      uStack_2a0 = uVar42;
      local_298 = uVar45;
      uStack_290 = uVar48;
      local_288 = local_1a78;
      uStack_280 = uStack_1a70;
      local_278 = uVar44;
      uStack_270 = uVar47;
      local_128 = local_19b8;
      uStack_120 = uStack_19b0;
      local_108 = local_19c8;
      uStack_100 = uStack_19c0;
      local_e8 = local_19d8;
      uStack_e0 = uStack_19d0;
      local_c8 = local_19e8;
      uStack_c0 = uStack_19e0;
      local_a8 = local_19f8;
      uStack_a0 = uStack_19f0;
      local_88 = local_1a08;
      uStack_80 = uStack_1a00;
      local_68 = local_1a18;
      uStack_60 = uStack_1a10;
      local_48 = local_1a78;
      uStack_40 = uStack_1a70;
      filter8_mask((__m128i *)local_17c8,(__m128i *)&local_1828,(__m128i *)&local_1b88,
                   (__m128i *)&local_1b98);
      local_18c8 = extraout_XMM0_Qa_17;
      lStack_18c0 = extraout_XMM0_Qb_17;
      filter_add2_sub2((__m128i *)&local_1b88,(__m128i *)&local_1ad8,(__m128i *)&local_1aa8,
                       (__m128i *)&local_1a98,(__m128i *)&local_1a88);
      filter_add2_sub2((__m128i *)&local_1b98,(__m128i *)&local_1b58,(__m128i *)&local_1b28,
                       (__m128i *)&local_1b18,(__m128i *)&local_1b08);
      filter8_mask((__m128i *)local_17c8,(__m128i *)&local_18d8,(__m128i *)&local_1b88,
                   (__m128i *)&local_1b98);
      local_18d8 = extraout_XMM0_Qa_18;
      uStack_18d0 = extraout_XMM0_Qb_18;
      filter_add2_sub2((__m128i *)&local_1b88,(__m128i *)&local_1ae8,(__m128i *)&local_1ab8,
                       (__m128i *)&local_1aa8,(__m128i *)&local_1a88);
      filter_add2_sub2((__m128i *)&local_1b98,(__m128i *)&local_1b68,(__m128i *)&local_1b38,
                       (__m128i *)&local_1b28,(__m128i *)&local_1b08);
      filter8_mask((__m128i *)local_17c8,(__m128i *)&local_18e8,(__m128i *)&local_1b88,
                   (__m128i *)&local_1b98);
      local_18e8 = extraout_XMM0_Qa_19;
      uStack_18e0 = extraout_XMM0_Qb_19;
      filter_add2_sub2((__m128i *)&local_1b88,(__m128i *)&local_1af8,(__m128i *)&local_1ac8,
                       (__m128i *)&local_1ab8,(__m128i *)&local_1a88);
      filter_add2_sub2((__m128i *)&local_1b98,(__m128i *)&local_1b78,(__m128i *)&local_1b48,
                       (__m128i *)&local_1b38,(__m128i *)&local_1b08);
      filter8_mask((__m128i *)local_17c8,(__m128i *)&local_18f8,(__m128i *)&local_1b88,
                   (__m128i *)&local_1b98);
      local_18f8 = extraout_XMM0_Qa_20;
      uStack_18f0 = extraout_XMM0_Qb_20;
      filter_add2_sub2((__m128i *)&local_1b88,(__m128i *)&local_1af8,(__m128i *)&local_1ad8,
                       (__m128i *)&local_1ac8,(__m128i *)&local_1a98);
      filter_add2_sub2((__m128i *)&local_1b98,(__m128i *)&local_1b78,(__m128i *)&local_1b58,
                       (__m128i *)&local_1b48,(__m128i *)&local_1b18);
      filter8_mask((__m128i *)local_17c8,(__m128i *)&local_1908,(__m128i *)&local_1b88,
                   (__m128i *)&local_1b98);
      local_1908 = extraout_XMM0_Qa_21;
      uStack_1900 = extraout_XMM0_Qb_21;
      filter_add2_sub2((__m128i *)&local_1b88,(__m128i *)&local_1af8,(__m128i *)&local_1ae8,
                       (__m128i *)&local_1ad8,(__m128i *)&local_1aa8);
      filter_add2_sub2((__m128i *)&local_1b98,(__m128i *)&local_1b78,(__m128i *)&local_1b68,
                       (__m128i *)&local_1b58,(__m128i *)&local_1b28);
      filter8_mask((__m128i *)local_17c8,(__m128i *)&local_1878,(__m128i *)&local_1b88,
                   (__m128i *)&local_1b98);
      local_11d8 = local_17d8;
      uVar110 = local_11d8;
      uStack_11d0 = uStack_17d0;
      uVar113 = uStack_11d0;
      local_11e8 = local_1758;
      uVar97 = local_11e8;
      uStack_11e0 = uStack_1750;
      uVar98 = uStack_11e0;
      local_11d8._0_1_ = (char)local_17d8;
      local_11d8._1_1_ = (char)(local_17d8 >> 8);
      local_11d8._2_1_ = (char)(local_17d8 >> 0x10);
      local_11d8._3_1_ = (char)(local_17d8 >> 0x18);
      local_11d8._4_1_ = (char)(local_17d8 >> 0x20);
      local_11d8._5_1_ = (char)(local_17d8 >> 0x28);
      local_11d8._6_1_ = (char)(local_17d8 >> 0x30);
      local_11d8._7_1_ = (char)(local_17d8 >> 0x38);
      uStack_11d0._0_1_ = (char)uStack_17d0;
      uStack_11d0._1_1_ = (char)(uStack_17d0 >> 8);
      uStack_11d0._2_1_ = (char)(uStack_17d0 >> 0x10);
      uStack_11d0._3_1_ = (char)(uStack_17d0 >> 0x18);
      uStack_11d0._4_1_ = (char)(uStack_17d0 >> 0x20);
      uStack_11d0._5_1_ = (char)(uStack_17d0 >> 0x28);
      uStack_11d0._6_1_ = (char)(uStack_17d0 >> 0x30);
      uStack_11d0._7_1_ = (char)(uStack_17d0 >> 0x38);
      local_11e8._0_1_ = (char)local_1758;
      local_11e8._1_1_ = (char)((ulong)local_1758 >> 8);
      local_11e8._2_1_ = (char)((ulong)local_1758 >> 0x10);
      local_11e8._3_1_ = (char)((ulong)local_1758 >> 0x18);
      local_11e8._4_1_ = (char)((ulong)local_1758 >> 0x20);
      local_11e8._5_1_ = (char)((ulong)local_1758 >> 0x28);
      local_11e8._6_1_ = (char)((ulong)local_1758 >> 0x30);
      local_11e8._7_1_ = (char)((ulong)local_1758 >> 0x38);
      uStack_11e0._0_1_ = (char)uStack_1750;
      uStack_11e0._1_1_ = (char)((ulong)uStack_1750 >> 8);
      uStack_11e0._2_1_ = (char)((ulong)uStack_1750 >> 0x10);
      uStack_11e0._3_1_ = (char)((ulong)uStack_1750 >> 0x18);
      uStack_11e0._4_1_ = (char)((ulong)uStack_1750 >> 0x20);
      uStack_11e0._5_1_ = (char)((ulong)uStack_1750 >> 0x28);
      uStack_11e0._6_1_ = (char)((ulong)uStack_1750 >> 0x30);
      uStack_11e0._7_1_ = (char)((ulong)uStack_1750 >> 0x38);
      local_ac8 = -((char)local_11d8 == (char)local_11e8);
      cStack_ac7 = -(local_11d8._1_1_ == local_11e8._1_1_);
      cStack_ac6 = -(local_11d8._2_1_ == local_11e8._2_1_);
      cStack_ac5 = -(local_11d8._3_1_ == local_11e8._3_1_);
      cStack_ac4 = -(local_11d8._4_1_ == local_11e8._4_1_);
      cStack_ac3 = -(local_11d8._5_1_ == local_11e8._5_1_);
      cStack_ac2 = -(local_11d8._6_1_ == local_11e8._6_1_);
      cStack_ac1 = -(local_11d8._7_1_ == local_11e8._7_1_);
      cStack_ac0 = -((char)uStack_11d0 == (char)uStack_11e0);
      cStack_abf = -(uStack_11d0._1_1_ == uStack_11e0._1_1_);
      cStack_abe = -(uStack_11d0._2_1_ == uStack_11e0._2_1_);
      cStack_abd = -(uStack_11d0._3_1_ == uStack_11e0._3_1_);
      cStack_abc = -(uStack_11d0._4_1_ == uStack_11e0._4_1_);
      cStack_abb = -(uStack_11d0._5_1_ == uStack_11e0._5_1_);
      cStack_aba = -(uStack_11d0._6_1_ == uStack_11e0._6_1_);
      bStack_ab9 = -(uStack_11d0._7_1_ == uStack_11e0._7_1_);
      auVar59[1] = cStack_ac7;
      auVar59[0] = local_ac8;
      auVar59[2] = cStack_ac6;
      auVar59[3] = cStack_ac5;
      auVar59[4] = cStack_ac4;
      auVar59[5] = cStack_ac3;
      auVar59[6] = cStack_ac2;
      auVar59[7] = cStack_ac1;
      auVar59[8] = cStack_ac0;
      auVar59[9] = cStack_abf;
      auVar59[10] = cStack_abe;
      auVar59[0xb] = cStack_abd;
      auVar59[0xc] = cStack_abc;
      auVar59[0xd] = cStack_abb;
      auVar59[0xe] = cStack_aba;
      auVar59[0xf] = bStack_ab9;
      if ((ushort)((ushort)(SUB161(auVar59 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar59 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar59 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar59 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar59 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar59 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar59 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar59 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar59 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_ab9 >> 7) << 0xf
                  ) == 0xffff) {
        plVar108 = (longlong *)((long)local_1720 - (long)(local_1724 * 3));
        *plVar108 = local_18c8;
        plVar108[1] = lStack_18c0;
        plVar108 = (longlong *)((long)local_1720 - (long)(local_1724 << 1));
        *plVar108 = local_18d8;
        plVar108[1] = uStack_18d0;
        *(longlong *)((long)local_1720 - (long)local_1724) = local_18e8;
        ((longlong *)((long)local_1720 - (long)local_1724))[1] = uStack_18e0;
        *local_1720 = local_18f8;
        local_1720[1] = uStack_18f0;
        *(longlong *)((long)local_1720 + (long)local_1724) = local_1908;
        ((longlong *)((long)local_1720 + (long)local_1724))[1] = uStack_1900;
        puVar107 = (undefined8 *)((long)local_1720 + (long)(local_1724 << 1));
        *puVar107 = extraout_XMM0_Qa_22;
        puVar107[1] = extraout_XMM0_Qb_22;
      }
      else {
        local_82c = 8;
        local_2 = 8;
        local_4 = 8;
        local_6 = 8;
        local_8 = 8;
        local_a = 8;
        local_c = 8;
        local_e = 8;
        local_10 = 8;
        local_1ba8 = 0x8000800080008;
        uStack_1ba0 = 0x8000800080008;
        local_1658 = local_17e8;
        uVar35 = local_1658;
        uStack_1650 = uStack_17e0;
        local_1668 = local_1758;
        uStack_1660 = uStack_1750;
        local_1658._0_1_ = (undefined1)local_17e8;
        local_1658._1_1_ = (undefined1)((ulong)local_17e8 >> 8);
        local_1658._2_1_ = (undefined1)((ulong)local_17e8 >> 0x10);
        local_1658._3_1_ = (undefined1)((ulong)local_17e8 >> 0x18);
        local_1658._4_1_ = (undefined1)((ulong)local_17e8 >> 0x20);
        local_1658._5_1_ = (undefined1)((ulong)local_17e8 >> 0x28);
        local_1658._6_1_ = (undefined1)((ulong)local_17e8 >> 0x30);
        local_1658._7_1_ = (undefined1)((ulong)local_17e8 >> 0x38);
        local_1bb8 = (undefined1)local_1658;
        cStack_1bb7 = (char)local_11e8;
        uStack_1bb6 = local_1658._1_1_;
        cStack_1bb5 = local_11e8._1_1_;
        uStack_1bb4 = local_1658._2_1_;
        cStack_1bb3 = local_11e8._2_1_;
        uStack_1bb2 = local_1658._3_1_;
        cStack_1bb1 = local_11e8._3_1_;
        uStack_1bb0 = local_1658._4_1_;
        cStack_1baf = local_11e8._4_1_;
        uStack_1bae = local_1658._5_1_;
        cStack_1bad = local_11e8._5_1_;
        uStack_1bac = local_1658._6_1_;
        cStack_1bab = local_11e8._6_1_;
        uStack_1baa = local_1658._7_1_;
        cStack_1ba9 = local_11e8._7_1_;
        local_1678 = local_17f8;
        lVar90 = local_1678;
        lStack_1670 = lStack_17f0;
        local_1688 = local_1758;
        uStack_1680 = uStack_1750;
        local_1678._0_1_ = (undefined1)local_17f8;
        local_1678._1_1_ = (undefined1)((ulong)local_17f8 >> 8);
        local_1678._2_1_ = (undefined1)((ulong)local_17f8 >> 0x10);
        local_1678._3_1_ = (undefined1)((ulong)local_17f8 >> 0x18);
        local_1678._4_1_ = (undefined1)((ulong)local_17f8 >> 0x20);
        local_1678._5_1_ = (undefined1)((ulong)local_17f8 >> 0x28);
        local_1678._6_1_ = (undefined1)((ulong)local_17f8 >> 0x30);
        local_1678._7_1_ = (undefined1)((ulong)local_17f8 >> 0x38);
        local_1bc8 = (undefined1)local_1678;
        cStack_1bc7 = (char)local_11e8;
        uStack_1bc6 = local_1678._1_1_;
        cStack_1bc5 = local_11e8._1_1_;
        uStack_1bc4 = local_1678._2_1_;
        cStack_1bc3 = local_11e8._2_1_;
        uStack_1bc2 = local_1678._3_1_;
        cStack_1bc1 = local_11e8._3_1_;
        uStack_1bc0 = local_1678._4_1_;
        cStack_1bbf = local_11e8._4_1_;
        uStack_1bbe = local_1678._5_1_;
        cStack_1bbd = local_11e8._5_1_;
        uStack_1bbc = local_1678._6_1_;
        cStack_1bbb = local_11e8._6_1_;
        uStack_1bba = local_1678._7_1_;
        cStack_1bb9 = local_11e8._7_1_;
        local_1698 = local_1808;
        lVar89 = local_1698;
        lStack_1690 = lStack_1800;
        local_16a8 = local_1758;
        uStack_16a0 = uStack_1750;
        local_1698._0_1_ = (undefined1)local_1808;
        local_1698._1_1_ = (undefined1)((ulong)local_1808 >> 8);
        local_1698._2_1_ = (undefined1)((ulong)local_1808 >> 0x10);
        local_1698._3_1_ = (undefined1)((ulong)local_1808 >> 0x18);
        local_1698._4_1_ = (undefined1)((ulong)local_1808 >> 0x20);
        local_1698._5_1_ = (undefined1)((ulong)local_1808 >> 0x28);
        local_1698._6_1_ = (undefined1)((ulong)local_1808 >> 0x30);
        local_1698._7_1_ = (undefined1)((ulong)local_1808 >> 0x38);
        local_1bd8 = (undefined1)local_1698;
        cStack_1bd7 = (char)local_11e8;
        uStack_1bd6 = local_1698._1_1_;
        cStack_1bd5 = local_11e8._1_1_;
        uStack_1bd4 = local_1698._2_1_;
        cStack_1bd3 = local_11e8._2_1_;
        uStack_1bd2 = local_1698._3_1_;
        cStack_1bd1 = local_11e8._3_1_;
        uStack_1bd0 = local_1698._4_1_;
        cStack_1bcf = local_11e8._4_1_;
        uStack_1bce = local_1698._5_1_;
        cStack_1bcd = local_11e8._5_1_;
        uStack_1bcc = local_1698._6_1_;
        cStack_1bcb = local_11e8._6_1_;
        uStack_1bca = local_1698._7_1_;
        cStack_1bc9 = local_11e8._7_1_;
        local_16b8 = local_1898;
        lVar88 = local_16b8;
        lStack_16b0 = lStack_1890;
        local_16c8 = local_1758;
        uStack_16c0 = uStack_1750;
        local_16b8._0_1_ = (undefined1)local_1898;
        local_16b8._1_1_ = (undefined1)((ulong)local_1898 >> 8);
        local_16b8._2_1_ = (undefined1)((ulong)local_1898 >> 0x10);
        local_16b8._3_1_ = (undefined1)((ulong)local_1898 >> 0x18);
        local_16b8._4_1_ = (undefined1)((ulong)local_1898 >> 0x20);
        local_16b8._5_1_ = (undefined1)((ulong)local_1898 >> 0x28);
        local_16b8._6_1_ = (undefined1)((ulong)local_1898 >> 0x30);
        local_16b8._7_1_ = (undefined1)((ulong)local_1898 >> 0x38);
        local_1be8 = (undefined1)local_16b8;
        cStack_1be7 = (char)local_11e8;
        uStack_1be6 = local_16b8._1_1_;
        cStack_1be5 = local_11e8._1_1_;
        uStack_1be4 = local_16b8._2_1_;
        cStack_1be3 = local_11e8._2_1_;
        uStack_1be2 = local_16b8._3_1_;
        cStack_1be1 = local_11e8._3_1_;
        uStack_1be0 = local_16b8._4_1_;
        cStack_1bdf = local_11e8._4_1_;
        uStack_1bde = local_16b8._5_1_;
        cStack_1bdd = local_11e8._5_1_;
        uStack_1bdc = local_16b8._6_1_;
        cStack_1bdb = local_11e8._6_1_;
        uStack_1bda = local_16b8._7_1_;
        cStack_1bd9 = local_11e8._7_1_;
        local_16d8 = local_18b8;
        lVar87 = local_16d8;
        lStack_16d0 = lStack_18b0;
        local_16e8 = local_1758;
        uStack_16e0 = uStack_1750;
        local_16d8._0_1_ = (undefined1)local_18b8;
        local_16d8._1_1_ = (undefined1)((ulong)local_18b8 >> 8);
        local_16d8._2_1_ = (undefined1)((ulong)local_18b8 >> 0x10);
        local_16d8._3_1_ = (undefined1)((ulong)local_18b8 >> 0x18);
        local_16d8._4_1_ = (undefined1)((ulong)local_18b8 >> 0x20);
        local_16d8._5_1_ = (undefined1)((ulong)local_18b8 >> 0x28);
        local_16d8._6_1_ = (undefined1)((ulong)local_18b8 >> 0x30);
        local_16d8._7_1_ = (undefined1)((ulong)local_18b8 >> 0x38);
        local_1bf8 = (undefined1)local_16d8;
        cStack_1bf7 = (char)local_11e8;
        uStack_1bf6 = local_16d8._1_1_;
        cStack_1bf5 = local_11e8._1_1_;
        uStack_1bf4 = local_16d8._2_1_;
        cStack_1bf3 = local_11e8._2_1_;
        uStack_1bf2 = local_16d8._3_1_;
        cStack_1bf1 = local_11e8._3_1_;
        uStack_1bf0 = local_16d8._4_1_;
        cStack_1bef = local_11e8._4_1_;
        uStack_1bee = local_16d8._5_1_;
        cStack_1bed = local_11e8._5_1_;
        uStack_1bec = local_16d8._6_1_;
        cStack_1beb = local_11e8._6_1_;
        uStack_1bea = local_16d8._7_1_;
        cStack_1be9 = local_11e8._7_1_;
        local_16f8 = local_18a8;
        uVar34 = local_16f8;
        uStack_16f0 = uStack_18a0;
        local_1708 = local_1758;
        uStack_1700 = uStack_1750;
        local_16f8._0_1_ = (undefined1)local_18a8;
        local_16f8._1_1_ = (undefined1)((ulong)local_18a8 >> 8);
        local_16f8._2_1_ = (undefined1)((ulong)local_18a8 >> 0x10);
        local_16f8._3_1_ = (undefined1)((ulong)local_18a8 >> 0x18);
        local_16f8._4_1_ = (undefined1)((ulong)local_18a8 >> 0x20);
        local_16f8._5_1_ = (undefined1)((ulong)local_18a8 >> 0x28);
        local_16f8._6_1_ = (undefined1)((ulong)local_18a8 >> 0x30);
        local_16f8._7_1_ = (undefined1)((ulong)local_18a8 >> 0x38);
        local_1c08 = (undefined1)local_16f8;
        cStack_1c07 = (char)local_11e8;
        uStack_1c06 = local_16f8._1_1_;
        cStack_1c05 = local_11e8._1_1_;
        uStack_1c04 = local_16f8._2_1_;
        cStack_1c03 = local_11e8._2_1_;
        uStack_1c02 = local_16f8._3_1_;
        cStack_1c01 = local_11e8._3_1_;
        uStack_1c00 = local_16f8._4_1_;
        cStack_1bff = local_11e8._4_1_;
        uStack_1bfe = local_16f8._5_1_;
        cStack_1bfd = local_11e8._5_1_;
        uStack_1bfc = local_16f8._6_1_;
        cStack_1bfb = local_11e8._6_1_;
        uStack_1bfa = local_16f8._7_1_;
        cStack_1bf9 = local_11e8._7_1_;
        local_778 = local_17e8;
        uStack_770 = uStack_17e0;
        uVar37 = uStack_770;
        local_788 = local_1758;
        uStack_780 = uStack_1750;
        uStack_770._0_1_ = (undefined1)uStack_17e0;
        uStack_770._1_1_ = (undefined1)((ulong)uStack_17e0 >> 8);
        uStack_770._2_1_ = (undefined1)((ulong)uStack_17e0 >> 0x10);
        uStack_770._3_1_ = (undefined1)((ulong)uStack_17e0 >> 0x18);
        uStack_770._4_1_ = (undefined1)((ulong)uStack_17e0 >> 0x20);
        uStack_770._5_1_ = (undefined1)((ulong)uStack_17e0 >> 0x28);
        uStack_770._6_1_ = (undefined1)((ulong)uStack_17e0 >> 0x30);
        uStack_770._7_1_ = (undefined1)((ulong)uStack_17e0 >> 0x38);
        local_1c18 = (undefined1)uStack_770;
        cStack_1c17 = (char)uStack_11e0;
        uStack_1c16 = uStack_770._1_1_;
        cStack_1c15 = uStack_11e0._1_1_;
        uStack_1c14 = uStack_770._2_1_;
        cStack_1c13 = uStack_11e0._2_1_;
        uStack_1c12 = uStack_770._3_1_;
        cStack_1c11 = uStack_11e0._3_1_;
        uStack_1c10 = uStack_770._4_1_;
        cStack_1c0f = uStack_11e0._4_1_;
        uStack_1c0e = uStack_770._5_1_;
        cStack_1c0d = uStack_11e0._5_1_;
        uStack_1c0c = uStack_770._6_1_;
        cStack_1c0b = uStack_11e0._6_1_;
        uStack_1c0a = uStack_770._7_1_;
        cStack_1c09 = uStack_11e0._7_1_;
        local_798 = local_17f8;
        uStack_790 = lStack_17f0;
        lVar96 = uStack_790;
        local_7a8 = local_1758;
        uStack_7a0 = uStack_1750;
        uStack_790._0_1_ = (undefined1)lStack_17f0;
        uStack_790._1_1_ = (undefined1)((ulong)lStack_17f0 >> 8);
        uStack_790._2_1_ = (undefined1)((ulong)lStack_17f0 >> 0x10);
        uStack_790._3_1_ = (undefined1)((ulong)lStack_17f0 >> 0x18);
        uStack_790._4_1_ = (undefined1)((ulong)lStack_17f0 >> 0x20);
        uStack_790._5_1_ = (undefined1)((ulong)lStack_17f0 >> 0x28);
        uStack_790._6_1_ = (undefined1)((ulong)lStack_17f0 >> 0x30);
        uStack_790._7_1_ = (undefined1)((ulong)lStack_17f0 >> 0x38);
        local_1c28 = (undefined1)uStack_790;
        cStack_1c27 = (char)uStack_11e0;
        uStack_1c26 = uStack_790._1_1_;
        cStack_1c25 = uStack_11e0._1_1_;
        uStack_1c24 = uStack_790._2_1_;
        cStack_1c23 = uStack_11e0._2_1_;
        uStack_1c22 = uStack_790._3_1_;
        cStack_1c21 = uStack_11e0._3_1_;
        uStack_1c20 = uStack_790._4_1_;
        cStack_1c1f = uStack_11e0._4_1_;
        uStack_1c1e = uStack_790._5_1_;
        cStack_1c1d = uStack_11e0._5_1_;
        uStack_1c1c = uStack_790._6_1_;
        cStack_1c1b = uStack_11e0._6_1_;
        uStack_1c1a = uStack_790._7_1_;
        cStack_1c19 = uStack_11e0._7_1_;
        local_7b8 = local_1808;
        uStack_7b0 = lStack_1800;
        lVar95 = uStack_7b0;
        local_7c8 = local_1758;
        uStack_7c0 = uStack_1750;
        uStack_7b0._0_1_ = (undefined1)lStack_1800;
        uStack_7b0._1_1_ = (undefined1)((ulong)lStack_1800 >> 8);
        uStack_7b0._2_1_ = (undefined1)((ulong)lStack_1800 >> 0x10);
        uStack_7b0._3_1_ = (undefined1)((ulong)lStack_1800 >> 0x18);
        uStack_7b0._4_1_ = (undefined1)((ulong)lStack_1800 >> 0x20);
        uStack_7b0._5_1_ = (undefined1)((ulong)lStack_1800 >> 0x28);
        uStack_7b0._6_1_ = (undefined1)((ulong)lStack_1800 >> 0x30);
        uStack_7b0._7_1_ = (undefined1)((ulong)lStack_1800 >> 0x38);
        local_1c38 = (undefined1)uStack_7b0;
        cStack_1c37 = (char)uStack_11e0;
        uStack_1c36 = uStack_7b0._1_1_;
        cStack_1c35 = uStack_11e0._1_1_;
        uStack_1c34 = uStack_7b0._2_1_;
        cStack_1c33 = uStack_11e0._2_1_;
        uStack_1c32 = uStack_7b0._3_1_;
        cStack_1c31 = uStack_11e0._3_1_;
        uStack_1c30 = uStack_7b0._4_1_;
        cStack_1c2f = uStack_11e0._4_1_;
        uStack_1c2e = uStack_7b0._5_1_;
        cStack_1c2d = uStack_11e0._5_1_;
        uStack_1c2c = uStack_7b0._6_1_;
        cStack_1c2b = uStack_11e0._6_1_;
        uStack_1c2a = uStack_7b0._7_1_;
        cStack_1c29 = uStack_11e0._7_1_;
        local_7d8 = local_1898;
        uStack_7d0 = lStack_1890;
        lVar92 = uStack_7d0;
        local_7e8 = local_1758;
        uStack_7e0 = uStack_1750;
        uStack_7d0._0_1_ = (undefined1)lStack_1890;
        uStack_7d0._1_1_ = (undefined1)((ulong)lStack_1890 >> 8);
        uStack_7d0._2_1_ = (undefined1)((ulong)lStack_1890 >> 0x10);
        uStack_7d0._3_1_ = (undefined1)((ulong)lStack_1890 >> 0x18);
        uStack_7d0._4_1_ = (undefined1)((ulong)lStack_1890 >> 0x20);
        uStack_7d0._5_1_ = (undefined1)((ulong)lStack_1890 >> 0x28);
        uStack_7d0._6_1_ = (undefined1)((ulong)lStack_1890 >> 0x30);
        uStack_7d0._7_1_ = (undefined1)((ulong)lStack_1890 >> 0x38);
        local_1c48 = (undefined1)uStack_7d0;
        cStack_1c47 = (char)uStack_11e0;
        uStack_1c46 = uStack_7d0._1_1_;
        cStack_1c45 = uStack_11e0._1_1_;
        uStack_1c44 = uStack_7d0._2_1_;
        cStack_1c43 = uStack_11e0._2_1_;
        uStack_1c42 = uStack_7d0._3_1_;
        cStack_1c41 = uStack_11e0._3_1_;
        uStack_1c40 = uStack_7d0._4_1_;
        cStack_1c3f = uStack_11e0._4_1_;
        uStack_1c3e = uStack_7d0._5_1_;
        cStack_1c3d = uStack_11e0._5_1_;
        uStack_1c3c = uStack_7d0._6_1_;
        cStack_1c3b = uStack_11e0._6_1_;
        uStack_1c3a = uStack_7d0._7_1_;
        cStack_1c39 = uStack_11e0._7_1_;
        local_7f8 = local_18b8;
        uStack_7f0 = lStack_18b0;
        lVar91 = uStack_7f0;
        local_808 = local_1758;
        uStack_800 = uStack_1750;
        uStack_7f0._0_1_ = (undefined1)lStack_18b0;
        uStack_7f0._1_1_ = (undefined1)((ulong)lStack_18b0 >> 8);
        uStack_7f0._2_1_ = (undefined1)((ulong)lStack_18b0 >> 0x10);
        uStack_7f0._3_1_ = (undefined1)((ulong)lStack_18b0 >> 0x18);
        uStack_7f0._4_1_ = (undefined1)((ulong)lStack_18b0 >> 0x20);
        uStack_7f0._5_1_ = (undefined1)((ulong)lStack_18b0 >> 0x28);
        uStack_7f0._6_1_ = (undefined1)((ulong)lStack_18b0 >> 0x30);
        uStack_7f0._7_1_ = (undefined1)((ulong)lStack_18b0 >> 0x38);
        local_1c58 = (undefined1)uStack_7f0;
        cStack_1c57 = (char)uStack_11e0;
        uStack_1c56 = uStack_7f0._1_1_;
        cStack_1c55 = uStack_11e0._1_1_;
        uStack_1c54 = uStack_7f0._2_1_;
        cStack_1c53 = uStack_11e0._2_1_;
        uStack_1c52 = uStack_7f0._3_1_;
        cStack_1c51 = uStack_11e0._3_1_;
        uStack_1c50 = uStack_7f0._4_1_;
        cStack_1c4f = uStack_11e0._4_1_;
        uStack_1c4e = uStack_7f0._5_1_;
        cStack_1c4d = uStack_11e0._5_1_;
        uStack_1c4c = uStack_7f0._6_1_;
        cStack_1c4b = uStack_11e0._6_1_;
        uStack_1c4a = uStack_7f0._7_1_;
        cStack_1c49 = uStack_11e0._7_1_;
        local_818 = local_18a8;
        uStack_810 = uStack_18a0;
        uVar36 = uStack_810;
        local_828 = local_1758;
        uStack_820 = uStack_1750;
        uStack_810._0_1_ = (undefined1)uStack_18a0;
        uStack_810._1_1_ = (undefined1)((ulong)uStack_18a0 >> 8);
        uStack_810._2_1_ = (undefined1)((ulong)uStack_18a0 >> 0x10);
        uStack_810._3_1_ = (undefined1)((ulong)uStack_18a0 >> 0x18);
        uStack_810._4_1_ = (undefined1)((ulong)uStack_18a0 >> 0x20);
        uStack_810._5_1_ = (undefined1)((ulong)uStack_18a0 >> 0x28);
        uStack_810._6_1_ = (undefined1)((ulong)uStack_18a0 >> 0x30);
        uStack_810._7_1_ = (undefined1)((ulong)uStack_18a0 >> 0x38);
        local_1c68 = (undefined1)uStack_810;
        cStack_1c67 = (char)uStack_11e0;
        uStack_1c66 = uStack_810._1_1_;
        cStack_1c65 = uStack_11e0._1_1_;
        uStack_1c64 = uStack_810._2_1_;
        cStack_1c63 = uStack_11e0._2_1_;
        uStack_1c62 = uStack_810._3_1_;
        cStack_1c61 = uStack_11e0._3_1_;
        uStack_1c60 = uStack_810._4_1_;
        cStack_1c5f = uStack_11e0._4_1_;
        uStack_1c5e = uStack_810._5_1_;
        cStack_1c5d = uStack_11e0._5_1_;
        uStack_1c5c = uStack_810._6_1_;
        cStack_1c5b = uStack_11e0._6_1_;
        uStack_1c5a = uStack_810._7_1_;
        cStack_1c59 = uStack_11e0._7_1_;
        local_178 = CONCAT17(local_11e8._3_1_,
                             CONCAT16(local_1658._3_1_,
                                      CONCAT15(local_11e8._2_1_,
                                               CONCAT14(local_1658._2_1_,
                                                        CONCAT13(local_11e8._1_1_,
                                                                 CONCAT12(local_1658._1_1_,
                                                                          CONCAT11((char)local_11e8,
                                                                                   (undefined1)
                                                                                   local_1658)))))))
        ;
        uStack_170 = CONCAT17(local_11e8._7_1_,
                              CONCAT16(local_1658._7_1_,
                                       CONCAT15(local_11e8._6_1_,
                                                CONCAT14(local_1658._6_1_,
                                                         CONCAT13(local_11e8._5_1_,
                                                                  CONCAT12(local_1658._5_1_,
                                                                           CONCAT11(local_11e8._4_1_
                                                                                    ,local_1658.
                                                                                     _4_1_)))))));
        local_17c = 3;
        auVar86._8_8_ = uStack_170;
        auVar86._0_8_ = local_178;
        local_238 = psllw(auVar86,ZEXT416(3));
        uVar3 = CONCAT13(local_11e8._1_1_,
                         CONCAT12(local_1658._1_1_,CONCAT11((char)local_11e8,(undefined1)local_1658)
                                 ));
        uVar4 = CONCAT15(local_11e8._2_1_,CONCAT14(local_1658._2_1_,uVar3));
        uVar8 = CONCAT17(local_11e8._3_1_,CONCAT16(local_1658._3_1_,uVar4));
        uVar6 = CONCAT13(local_11e8._5_1_,
                         CONCAT12(local_1658._5_1_,CONCAT11(local_11e8._4_1_,local_1658._4_1_)));
        uVar7 = CONCAT15(local_11e8._6_1_,CONCAT14(local_1658._6_1_,uVar6));
        uVar9 = CONCAT17(local_11e8._7_1_,CONCAT16(local_1658._7_1_,uVar7));
        local_248._2_2_ = (short)((uint)uVar3 >> 0x10);
        local_248._4_2_ = (short)((uint6)uVar4 >> 0x20);
        local_248._6_2_ = (short)((ulong)uVar8 >> 0x30);
        uStack_240._2_2_ = (short)((uint)uVar6 >> 0x10);
        uStack_240._4_2_ = (short)((uint6)uVar7 >> 0x20);
        uStack_240._6_2_ = (short)((ulong)uVar9 >> 0x30);
        local_4f8 = local_238._0_2_ - CONCAT11((char)local_11e8,(undefined1)local_1658);
        sStack_4f0 = local_238._8_2_ - CONCAT11(local_11e8._4_1_,local_1658._4_1_);
        local_1c78._0_4_ = CONCAT22(local_238._2_2_ - local_248._2_2_,local_4f8);
        local_1c78._0_6_ = CONCAT24(local_238._4_2_ - local_248._4_2_,(undefined4)local_1c78);
        local_1c78 = CONCAT26(local_238._6_2_ - local_248._6_2_,(undefined6)local_1c78);
        uStack_1c70._0_4_ = CONCAT22(local_238._10_2_ - uStack_240._2_2_,sStack_4f0);
        uStack_1c70._0_6_ = CONCAT24(local_238._12_2_ - uStack_240._4_2_,(undefined4)uStack_1c70);
        uStack_1c70 = CONCAT26(local_238._14_2_ - uStack_240._6_2_,(undefined6)uStack_1c70);
        local_198 = CONCAT17(local_11e8._3_1_,
                             CONCAT16(local_1678._3_1_,
                                      CONCAT15(local_11e8._2_1_,
                                               CONCAT14(local_1678._2_1_,
                                                        CONCAT13(local_11e8._1_1_,
                                                                 CONCAT12(local_1678._1_1_,
                                                                          CONCAT11((char)local_11e8,
                                                                                   (undefined1)
                                                                                   local_1678)))))))
        ;
        uStack_190 = CONCAT17(local_11e8._7_1_,
                              CONCAT16(local_1678._7_1_,
                                       CONCAT15(local_11e8._6_1_,
                                                CONCAT14(local_1678._6_1_,
                                                         CONCAT13(local_11e8._5_1_,
                                                                  CONCAT12(local_1678._5_1_,
                                                                           CONCAT11(local_11e8._4_1_
                                                                                    ,local_1678.
                                                                                     _4_1_)))))));
        local_19c = 1;
        auVar85._8_8_ = uStack_190;
        auVar85._0_8_ = local_198;
        local_478 = psllw(auVar85,ZEXT416(1));
        local_488 = local_1c78;
        lStack_480 = uStack_1c70;
        local_4f8 = local_478._0_2_ + local_4f8;
        sStack_4f6 = local_478._2_2_ + (local_238._2_2_ - local_248._2_2_);
        sStack_4f4 = local_478._4_2_ + (local_238._4_2_ - local_248._4_2_);
        sStack_4f2 = local_478._6_2_ + (local_238._6_2_ - local_248._6_2_);
        sStack_4f0 = local_478._8_2_ + sStack_4f0;
        sStack_4ee = local_478._10_2_ + (local_238._10_2_ - uStack_240._2_2_);
        sStack_4ec = local_478._12_2_ + (local_238._12_2_ - uStack_240._4_2_);
        sStack_4ea = local_478._14_2_ + (local_238._14_2_ - uStack_240._6_2_);
        local_1c78._0_4_ = CONCAT22(sStack_4f6,local_4f8);
        local_1c78._0_6_ = CONCAT24(sStack_4f4,(undefined4)local_1c78);
        local_1c78 = CONCAT26(sStack_4f2,(undefined6)local_1c78);
        uStack_1c70._0_4_ = CONCAT22(sStack_4ee,sStack_4f0);
        uStack_1c70._0_6_ = CONCAT24(sStack_4ec,(undefined4)uStack_1c70);
        uStack_1c70 = CONCAT26(sStack_4ea,(undefined6)uStack_1c70);
        local_1b8 = CONCAT17(local_11e8._3_1_,
                             CONCAT16(local_1698._3_1_,
                                      CONCAT15(local_11e8._2_1_,
                                               CONCAT14(local_1698._2_1_,
                                                        CONCAT13(local_11e8._1_1_,
                                                                 CONCAT12(local_1698._1_1_,
                                                                          CONCAT11((char)local_11e8,
                                                                                   (undefined1)
                                                                                   local_1698)))))))
        ;
        uStack_1b0 = CONCAT17(local_11e8._7_1_,
                              CONCAT16(local_1698._7_1_,
                                       CONCAT15(local_11e8._6_1_,
                                                CONCAT14(local_1698._6_1_,
                                                         CONCAT13(local_11e8._5_1_,
                                                                  CONCAT12(local_1698._5_1_,
                                                                           CONCAT11(local_11e8._4_1_
                                                                                    ,local_1698.
                                                                                     _4_1_)))))));
        local_1bc = 1;
        auVar84._8_8_ = uStack_1b0;
        auVar84._0_8_ = local_1b8;
        local_498 = psllw(auVar84,ZEXT416(1));
        local_4a8 = local_1c78;
        lStack_4a0 = uStack_1c70;
        local_4f8 = local_498._0_2_ + local_4f8;
        sStack_4f6 = local_498._2_2_ + sStack_4f6;
        sStack_4f4 = local_498._4_2_ + sStack_4f4;
        sStack_4f2 = local_498._6_2_ + sStack_4f2;
        sStack_4f0 = local_498._8_2_ + sStack_4f0;
        sStack_4ee = local_498._10_2_ + sStack_4ee;
        sStack_4ec = local_498._12_2_ + sStack_4ec;
        sStack_4ea = local_498._14_2_ + sStack_4ea;
        local_1c78._0_4_ = CONCAT22(sStack_4f6,local_4f8);
        local_1c78._0_6_ = CONCAT24(sStack_4f4,(undefined4)local_1c78);
        local_1c78 = CONCAT26(sStack_4f2,(undefined6)local_1c78);
        uStack_1c70._0_4_ = CONCAT22(sStack_4ee,sStack_4f0);
        uStack_1c70._0_6_ = CONCAT24(sStack_4ec,(undefined4)uStack_1c70);
        uStack_1c70 = CONCAT26(sStack_4ea,(undefined6)uStack_1c70);
        uVar3 = CONCAT13(cStack_1a85,CONCAT12(uStack_1a86,CONCAT11(cStack_1a87,local_1a88)));
        uVar4 = CONCAT15(cStack_1a83,CONCAT14(uStack_1a84,uVar3));
        uVar32 = CONCAT17(cStack_1a81,CONCAT16(uStack_1a82,uVar4));
        uVar6 = CONCAT13(cStack_1a7d,CONCAT12(uStack_1a7e,CONCAT11(cStack_1a7f,uStack_1a80)));
        uVar7 = CONCAT15(cStack_1a7b,CONCAT14(uStack_1a7c,uVar6));
        uVar33 = CONCAT17(cStack_1a79,CONCAT16(uStack_1a7a,uVar7));
        local_4c8 = local_1c78;
        lStack_4c0 = uStack_1c70;
        local_4b8._2_2_ = (short)((uint)uVar3 >> 0x10);
        local_4b8._4_2_ = (short)((uint6)uVar4 >> 0x20);
        local_4b8._6_2_ = (short)((ulong)uVar32 >> 0x30);
        uStack_4b0._2_2_ = (short)((uint)uVar6 >> 0x10);
        uStack_4b0._4_2_ = (short)((uint6)uVar7 >> 0x20);
        uStack_4b0._6_2_ = (short)((ulong)uVar33 >> 0x30);
        local_4f8 = CONCAT11(cStack_1a87,local_1a88) + local_4f8;
        sStack_4f6 = local_4b8._2_2_ + sStack_4f6;
        sStack_4f4 = local_4b8._4_2_ + sStack_4f4;
        sStack_4f2 = local_4b8._6_2_ + sStack_4f2;
        sStack_4f0 = CONCAT11(cStack_1a7f,uStack_1a80) + sStack_4f0;
        sStack_4ee = uStack_4b0._2_2_ + sStack_4ee;
        sStack_4ec = uStack_4b0._4_2_ + sStack_4ec;
        sStack_4ea = uStack_4b0._6_2_ + sStack_4ea;
        uVar15 = CONCAT13(cStack_1a95,CONCAT12(uStack_1a96,CONCAT11(cStack_1a97,local_1a98)));
        uVar16 = CONCAT15(cStack_1a93,CONCAT14(uStack_1a94,uVar15));
        uVar30 = CONCAT17(cStack_1a91,CONCAT16(uStack_1a92,uVar16));
        uVar19 = CONCAT13(cStack_1a8d,CONCAT12(uStack_1a8e,CONCAT11(cStack_1a8f,uStack_1a90)));
        uVar20 = CONCAT15(cStack_1a8b,CONCAT14(uStack_1a8c,uVar19));
        uVar31 = CONCAT17(cStack_1a89,CONCAT16(uStack_1a8a,uVar20));
        uVar3 = CONCAT13(cStack_1aa5,CONCAT12(uStack_1aa6,CONCAT11(cStack_1aa7,local_1aa8)));
        uVar4 = CONCAT15(cStack_1aa3,CONCAT14(uStack_1aa4,uVar3));
        uVar28 = CONCAT17(cStack_1aa1,CONCAT16(uStack_1aa2,uVar4));
        uVar6 = CONCAT13(cStack_1a9d,CONCAT12(uStack_1a9e,CONCAT11(cStack_1a9f,uStack_1aa0)));
        uVar7 = CONCAT15(cStack_1a9b,CONCAT14(uStack_1a9c,uVar6));
        uVar29 = CONCAT17(cStack_1a99,CONCAT16(uStack_1a9a,uVar7));
        local_4d8._2_2_ = (short)((uint)uVar15 >> 0x10);
        local_4d8._4_2_ = (short)((uint6)uVar16 >> 0x20);
        local_4d8._6_2_ = (short)((ulong)uVar30 >> 0x30);
        uStack_4d0._2_2_ = (short)((uint)uVar19 >> 0x10);
        uStack_4d0._4_2_ = (short)((uint6)uVar20 >> 0x20);
        uStack_4d0._6_2_ = (short)((ulong)uVar31 >> 0x30);
        local_4e8._2_2_ = (short)((uint)uVar3 >> 0x10);
        local_4e8._4_2_ = (short)((uint6)uVar4 >> 0x20);
        local_4e8._6_2_ = (short)((ulong)uVar28 >> 0x30);
        uStack_4e0._2_2_ = (short)((uint)uVar6 >> 0x10);
        uStack_4e0._4_2_ = (short)((uint6)uVar7 >> 0x20);
        uStack_4e0._6_2_ = (short)((ulong)uVar29 >> 0x30);
        local_508 = CONCAT11(cStack_1a97,local_1a98) + CONCAT11(cStack_1aa7,local_1aa8);
        sStack_506 = local_4d8._2_2_ + local_4e8._2_2_;
        sStack_504 = local_4d8._4_2_ + local_4e8._4_2_;
        sStack_502 = local_4d8._6_2_ + local_4e8._6_2_;
        sStack_500 = CONCAT11(cStack_1a8f,uStack_1a90) + CONCAT11(cStack_1a9f,uStack_1aa0);
        sStack_4fe = uStack_4d0._2_2_ + uStack_4e0._2_2_;
        sStack_4fc = uStack_4d0._4_2_ + uStack_4e0._4_2_;
        sStack_4fa = uStack_4d0._6_2_ + uStack_4e0._6_2_;
        local_1c78._0_4_ = CONCAT22(sStack_4f6 + sStack_506,local_4f8 + local_508);
        local_1c78._0_6_ = CONCAT24(sStack_4f4 + sStack_504,(undefined4)local_1c78);
        local_1c78 = CONCAT26(sStack_4f2 + sStack_502,(undefined6)local_1c78);
        uStack_1c70._0_4_ = CONCAT22(sStack_4ee + sStack_4fe,sStack_4f0 + sStack_500);
        uStack_1c70._0_6_ = CONCAT24(sStack_4ec + sStack_4fc,(undefined4)uStack_1c70);
        uStack_1c70 = CONCAT26(sStack_4ea + sStack_4fa,(undefined6)uStack_1c70);
        uVar15 = CONCAT13(cStack_1ab5,CONCAT12(uStack_1ab6,CONCAT11(cStack_1ab7,local_1ab8)));
        uVar16 = CONCAT15(cStack_1ab3,CONCAT14(uStack_1ab4,uVar15));
        uVar26 = CONCAT17(cStack_1ab1,CONCAT16(uStack_1ab2,uVar16));
        uVar19 = CONCAT13(cStack_1aad,CONCAT12(uStack_1aae,CONCAT11(cStack_1aaf,uStack_1ab0)));
        uVar20 = CONCAT15(cStack_1aab,CONCAT14(uStack_1aac,uVar19));
        uVar27 = CONCAT17(cStack_1aa9,CONCAT16(uStack_1aaa,uVar20));
        uVar3 = CONCAT13(cStack_1ac5,CONCAT12(uStack_1ac6,CONCAT11(cStack_1ac7,local_1ac8)));
        uVar4 = CONCAT15(cStack_1ac3,CONCAT14(uStack_1ac4,uVar3));
        uVar24 = CONCAT17(cStack_1ac1,CONCAT16(uStack_1ac2,uVar4));
        uVar6 = CONCAT13(cStack_1abd,CONCAT12(uStack_1abe,CONCAT11(cStack_1abf,uStack_1ac0)));
        uVar7 = CONCAT15(cStack_1abb,CONCAT14(uStack_1abc,uVar6));
        uVar25 = CONCAT17(cStack_1ab9,CONCAT16(uStack_1aba,uVar7));
        local_518._2_2_ = (short)((uint)uVar15 >> 0x10);
        local_518._4_2_ = (short)((uint6)uVar16 >> 0x20);
        local_518._6_2_ = (short)((ulong)uVar26 >> 0x30);
        uStack_510._2_2_ = (short)((uint)uVar19 >> 0x10);
        uStack_510._4_2_ = (short)((uint6)uVar20 >> 0x20);
        uStack_510._6_2_ = (short)((ulong)uVar27 >> 0x30);
        local_528._2_2_ = (short)((uint)uVar3 >> 0x10);
        local_528._4_2_ = (short)((uint6)uVar4 >> 0x20);
        local_528._6_2_ = (short)((ulong)uVar24 >> 0x30);
        uStack_520._2_2_ = (short)((uint)uVar6 >> 0x10);
        uStack_520._4_2_ = (short)((uint6)uVar7 >> 0x20);
        uStack_520._6_2_ = (short)((ulong)uVar25 >> 0x30);
        local_538 = CONCAT11(cStack_1ab7,local_1ab8) + CONCAT11(cStack_1ac7,local_1ac8);
        sStack_536 = local_518._2_2_ + local_528._2_2_;
        sStack_534 = local_518._4_2_ + local_528._4_2_;
        sStack_532 = local_518._6_2_ + local_528._6_2_;
        sStack_530 = CONCAT11(cStack_1aaf,uStack_1ab0) + CONCAT11(cStack_1abf,uStack_1ac0);
        sStack_52e = uStack_510._2_2_ + uStack_520._2_2_;
        sStack_52c = uStack_510._4_2_ + uStack_520._4_2_;
        sStack_52a = uStack_510._6_2_ + uStack_520._6_2_;
        local_548 = local_1c78;
        lStack_540 = uStack_1c70;
        sVar112 = local_538 + local_4f8 + local_508;
        sVar118 = sStack_536 + sStack_4f6 + sStack_506;
        sVar121 = sStack_534 + sStack_4f4 + sStack_504;
        sVar124 = sStack_532 + sStack_4f2 + sStack_502;
        sVar127 = sStack_530 + sStack_4f0 + sStack_500;
        sVar132 = sStack_52e + sStack_4ee + sStack_4fe;
        sVar135 = sStack_52c + sStack_4ec + sStack_4fc;
        sVar138 = sStack_52a + sStack_4ea + sStack_4fa;
        local_1c78._0_4_ = CONCAT22(sVar118,sVar112);
        local_1c78._0_6_ = CONCAT24(sVar121,(undefined4)local_1c78);
        local_1c78 = CONCAT26(sVar124,(undefined6)local_1c78);
        uStack_1c70._0_4_ = CONCAT22(sVar132,sVar127);
        uStack_1c70._0_6_ = CONCAT24(sVar135,(undefined4)uStack_1c70);
        uStack_1c70 = CONCAT26(sVar138,(undefined6)uStack_1c70);
        local_558 = local_1c78;
        lStack_550 = uStack_1c70;
        local_1c78._0_4_ = CONCAT22(sVar118 + 8,sVar112 + 8);
        local_1c78._0_6_ = CONCAT24(sVar121 + 8,(undefined4)local_1c78);
        local_1c78 = CONCAT26(sVar124 + 8,(undefined6)local_1c78);
        uStack_1c70._0_4_ = CONCAT22(sVar132 + 8,sVar127 + 8);
        uStack_1c70._0_6_ = CONCAT24(sVar135 + 8,(undefined4)uStack_1c70);
        uStack_1c70 = CONCAT26(sVar138 + 8,(undefined6)uStack_1c70);
        local_1d8 = CONCAT17(uStack_11e0._3_1_,
                             CONCAT16(uStack_770._3_1_,
                                      CONCAT15(uStack_11e0._2_1_,
                                               CONCAT14(uStack_770._2_1_,
                                                        CONCAT13(uStack_11e0._1_1_,
                                                                 CONCAT12(uStack_770._1_1_,
                                                                          CONCAT11((char)uStack_11e0
                                                                                   ,(undefined1)
                                                                                    uStack_770))))))
                            );
        uStack_1d0 = CONCAT17(uStack_11e0._7_1_,
                              CONCAT16(uStack_770._7_1_,
                                       CONCAT15(uStack_11e0._6_1_,
                                                CONCAT14(uStack_770._6_1_,
                                                         CONCAT13(uStack_11e0._5_1_,
                                                                  CONCAT12(uStack_770._5_1_,
                                                                           CONCAT11(uStack_11e0.
                                                                                    _4_1_,uStack_770
                                                                                          ._4_1_))))
                                               )));
        local_1dc = 3;
        auVar83._8_8_ = uStack_1d0;
        auVar83._0_8_ = local_1d8;
        local_258 = psllw(auVar83,ZEXT416(3));
        uVar3 = CONCAT13(uStack_11e0._1_1_,
                         CONCAT12(uStack_770._1_1_,
                                  CONCAT11((char)uStack_11e0,(undefined1)uStack_770)));
        uVar4 = CONCAT15(uStack_11e0._2_1_,CONCAT14(uStack_770._2_1_,uVar3));
        uVar2 = CONCAT17(uStack_11e0._3_1_,CONCAT16(uStack_770._3_1_,uVar4));
        uVar6 = CONCAT13(uStack_11e0._5_1_,
                         CONCAT12(uStack_770._5_1_,CONCAT11(uStack_11e0._4_1_,uStack_770._4_1_)));
        uVar7 = CONCAT15(uStack_11e0._6_1_,CONCAT14(uStack_770._6_1_,uVar6));
        uVar5 = CONCAT17(uStack_11e0._7_1_,CONCAT16(uStack_770._7_1_,uVar7));
        local_268._2_2_ = (short)((uint)uVar3 >> 0x10);
        local_268._4_2_ = (short)((uint6)uVar4 >> 0x20);
        local_268._6_2_ = (short)((ulong)uVar2 >> 0x30);
        uStack_260._2_2_ = (short)((uint)uVar6 >> 0x10);
        uStack_260._4_2_ = (short)((uint6)uVar7 >> 0x20);
        uStack_260._6_2_ = (short)((ulong)uVar5 >> 0x30);
        local_5f8 = local_258._0_2_ - CONCAT11((char)uStack_11e0,(undefined1)uStack_770);
        sStack_5f0 = local_258._8_2_ - CONCAT11(uStack_11e0._4_1_,uStack_770._4_1_);
        local_1c88._0_4_ = CONCAT22(local_258._2_2_ - local_268._2_2_,local_5f8);
        local_1c88._0_6_ = CONCAT24(local_258._4_2_ - local_268._4_2_,(undefined4)local_1c88);
        local_1c88 = CONCAT26(local_258._6_2_ - local_268._6_2_,(undefined6)local_1c88);
        uStack_1c80._0_4_ = CONCAT22(local_258._10_2_ - uStack_260._2_2_,sStack_5f0);
        uStack_1c80._0_6_ = CONCAT24(local_258._12_2_ - uStack_260._4_2_,(undefined4)uStack_1c80);
        uStack_1c80 = CONCAT26(local_258._14_2_ - uStack_260._6_2_,(undefined6)uStack_1c80);
        local_1f8 = CONCAT17(uStack_11e0._3_1_,
                             CONCAT16(uStack_790._3_1_,
                                      CONCAT15(uStack_11e0._2_1_,
                                               CONCAT14(uStack_790._2_1_,
                                                        CONCAT13(uStack_11e0._1_1_,
                                                                 CONCAT12(uStack_790._1_1_,
                                                                          CONCAT11((char)uStack_11e0
                                                                                   ,(undefined1)
                                                                                    uStack_790))))))
                            );
        uStack_1f0 = CONCAT17(uStack_11e0._7_1_,
                              CONCAT16(uStack_790._7_1_,
                                       CONCAT15(uStack_11e0._6_1_,
                                                CONCAT14(uStack_790._6_1_,
                                                         CONCAT13(uStack_11e0._5_1_,
                                                                  CONCAT12(uStack_790._5_1_,
                                                                           CONCAT11(uStack_11e0.
                                                                                    _4_1_,uStack_790
                                                                                          ._4_1_))))
                                               )));
        local_1fc = 1;
        auVar82._8_8_ = uStack_1f0;
        auVar82._0_8_ = local_1f8;
        local_578 = psllw(auVar82,ZEXT416(1));
        local_588 = local_1c88;
        lStack_580 = uStack_1c80;
        local_5f8 = local_578._0_2_ + local_5f8;
        sStack_5f6 = local_578._2_2_ + (local_258._2_2_ - local_268._2_2_);
        sStack_5f4 = local_578._4_2_ + (local_258._4_2_ - local_268._4_2_);
        sStack_5f2 = local_578._6_2_ + (local_258._6_2_ - local_268._6_2_);
        sStack_5f0 = local_578._8_2_ + sStack_5f0;
        sStack_5ee = local_578._10_2_ + (local_258._10_2_ - uStack_260._2_2_);
        sStack_5ec = local_578._12_2_ + (local_258._12_2_ - uStack_260._4_2_);
        sStack_5ea = local_578._14_2_ + (local_258._14_2_ - uStack_260._6_2_);
        local_1c88._0_4_ = CONCAT22(sStack_5f6,local_5f8);
        local_1c88._0_6_ = CONCAT24(sStack_5f4,(undefined4)local_1c88);
        local_1c88 = CONCAT26(sStack_5f2,(undefined6)local_1c88);
        uStack_1c80._0_4_ = CONCAT22(sStack_5ee,sStack_5f0);
        uStack_1c80._0_6_ = CONCAT24(sStack_5ec,(undefined4)uStack_1c80);
        uStack_1c80 = CONCAT26(sStack_5ea,(undefined6)uStack_1c80);
        local_218 = CONCAT17(uStack_11e0._3_1_,
                             CONCAT16(uStack_7b0._3_1_,
                                      CONCAT15(uStack_11e0._2_1_,
                                               CONCAT14(uStack_7b0._2_1_,
                                                        CONCAT13(uStack_11e0._1_1_,
                                                                 CONCAT12(uStack_7b0._1_1_,
                                                                          CONCAT11((char)uStack_11e0
                                                                                   ,(undefined1)
                                                                                    uStack_7b0))))))
                            );
        uStack_210 = CONCAT17(uStack_11e0._7_1_,
                              CONCAT16(uStack_7b0._7_1_,
                                       CONCAT15(uStack_11e0._6_1_,
                                                CONCAT14(uStack_7b0._6_1_,
                                                         CONCAT13(uStack_11e0._5_1_,
                                                                  CONCAT12(uStack_7b0._5_1_,
                                                                           CONCAT11(uStack_11e0.
                                                                                    _4_1_,uStack_7b0
                                                                                          ._4_1_))))
                                               )));
        local_21c = 1;
        auVar81._8_8_ = uStack_210;
        auVar81._0_8_ = local_218;
        local_598 = psllw(auVar81,ZEXT416(1));
        local_5a8 = local_1c88;
        lStack_5a0 = uStack_1c80;
        local_5f8 = local_598._0_2_ + local_5f8;
        sStack_5f6 = local_598._2_2_ + sStack_5f6;
        sStack_5f4 = local_598._4_2_ + sStack_5f4;
        sStack_5f2 = local_598._6_2_ + sStack_5f2;
        sStack_5f0 = local_598._8_2_ + sStack_5f0;
        sStack_5ee = local_598._10_2_ + sStack_5ee;
        sStack_5ec = local_598._12_2_ + sStack_5ec;
        sStack_5ea = local_598._14_2_ + sStack_5ea;
        local_1c88._0_4_ = CONCAT22(sStack_5f6,local_5f8);
        local_1c88._0_6_ = CONCAT24(sStack_5f4,(undefined4)local_1c88);
        local_1c88 = CONCAT26(sStack_5f2,(undefined6)local_1c88);
        uStack_1c80._0_4_ = CONCAT22(sStack_5ee,sStack_5f0);
        uStack_1c80._0_6_ = CONCAT24(sStack_5ec,(undefined4)uStack_1c80);
        uStack_1c80 = CONCAT26(sStack_5ea,(undefined6)uStack_1c80);
        uVar3 = CONCAT13(cStack_1b05,CONCAT12(uStack_1b06,CONCAT11(cStack_1b07,local_1b08)));
        uVar4 = CONCAT15(cStack_1b03,CONCAT14(uStack_1b04,uVar3));
        uVar22 = CONCAT17(cStack_1b01,CONCAT16(uStack_1b02,uVar4));
        uVar6 = CONCAT13(cStack_1afd,CONCAT12(uStack_1afe,CONCAT11(cStack_1aff,uStack_1b00)));
        uVar7 = CONCAT15(cStack_1afb,CONCAT14(uStack_1afc,uVar6));
        uVar23 = CONCAT17(cStack_1af9,CONCAT16(uStack_1afa,uVar7));
        local_5c8 = local_1c88;
        lStack_5c0 = uStack_1c80;
        local_5b8._2_2_ = (short)((uint)uVar3 >> 0x10);
        local_5b8._4_2_ = (short)((uint6)uVar4 >> 0x20);
        local_5b8._6_2_ = (short)((ulong)uVar22 >> 0x30);
        uStack_5b0._2_2_ = (short)((uint)uVar6 >> 0x10);
        uStack_5b0._4_2_ = (short)((uint6)uVar7 >> 0x20);
        uStack_5b0._6_2_ = (short)((ulong)uVar23 >> 0x30);
        local_5f8 = CONCAT11(cStack_1b07,local_1b08) + local_5f8;
        sStack_5f6 = local_5b8._2_2_ + sStack_5f6;
        sStack_5f4 = local_5b8._4_2_ + sStack_5f4;
        sStack_5f2 = local_5b8._6_2_ + sStack_5f2;
        sStack_5f0 = CONCAT11(cStack_1aff,uStack_1b00) + sStack_5f0;
        sStack_5ee = uStack_5b0._2_2_ + sStack_5ee;
        sStack_5ec = uStack_5b0._4_2_ + sStack_5ec;
        sStack_5ea = uStack_5b0._6_2_ + sStack_5ea;
        uVar15 = CONCAT13(cStack_1b15,CONCAT12(uStack_1b16,CONCAT11(cStack_1b17,local_1b18)));
        uVar16 = CONCAT15(cStack_1b13,CONCAT14(uStack_1b14,uVar15));
        uVar14 = CONCAT17(cStack_1b11,CONCAT16(uStack_1b12,uVar16));
        uVar19 = CONCAT13(cStack_1b0d,CONCAT12(uStack_1b0e,CONCAT11(cStack_1b0f,uStack_1b10)));
        uVar20 = CONCAT15(cStack_1b0b,CONCAT14(uStack_1b0c,uVar19));
        uVar18 = CONCAT17(cStack_1b09,CONCAT16(uStack_1b0a,uVar20));
        uVar3 = CONCAT13(cStack_1b25,CONCAT12(uStack_1b26,CONCAT11(cStack_1b27,local_1b28)));
        uVar4 = CONCAT15(cStack_1b23,CONCAT14(uStack_1b24,uVar3));
        uVar10 = CONCAT17(cStack_1b21,CONCAT16(uStack_1b22,uVar4));
        uVar6 = CONCAT13(cStack_1b1d,CONCAT12(uStack_1b1e,CONCAT11(cStack_1b1f,uStack_1b20)));
        uVar7 = CONCAT15(cStack_1b1b,CONCAT14(uStack_1b1c,uVar6));
        uVar12 = CONCAT17(cStack_1b19,CONCAT16(uStack_1b1a,uVar7));
        local_5d8._2_2_ = (short)((uint)uVar15 >> 0x10);
        local_5d8._4_2_ = (short)((uint6)uVar16 >> 0x20);
        local_5d8._6_2_ = (short)((ulong)uVar14 >> 0x30);
        uStack_5d0._2_2_ = (short)((uint)uVar19 >> 0x10);
        uStack_5d0._4_2_ = (short)((uint6)uVar20 >> 0x20);
        uStack_5d0._6_2_ = (short)((ulong)uVar18 >> 0x30);
        local_5e8._2_2_ = (short)((uint)uVar3 >> 0x10);
        local_5e8._4_2_ = (short)((uint6)uVar4 >> 0x20);
        local_5e8._6_2_ = (short)((ulong)uVar10 >> 0x30);
        uStack_5e0._2_2_ = (short)((uint)uVar6 >> 0x10);
        uStack_5e0._4_2_ = (short)((uint6)uVar7 >> 0x20);
        uStack_5e0._6_2_ = (short)((ulong)uVar12 >> 0x30);
        local_608 = CONCAT11(cStack_1b17,local_1b18) + CONCAT11(cStack_1b27,local_1b28);
        sStack_606 = local_5d8._2_2_ + local_5e8._2_2_;
        sStack_604 = local_5d8._4_2_ + local_5e8._4_2_;
        sStack_602 = local_5d8._6_2_ + local_5e8._6_2_;
        sStack_600 = CONCAT11(cStack_1b0f,uStack_1b10) + CONCAT11(cStack_1b1f,uStack_1b20);
        sStack_5fe = uStack_5d0._2_2_ + uStack_5e0._2_2_;
        sStack_5fc = uStack_5d0._4_2_ + uStack_5e0._4_2_;
        sStack_5fa = uStack_5d0._6_2_ + uStack_5e0._6_2_;
        local_1c88._0_4_ = CONCAT22(sStack_5f6 + sStack_606,local_5f8 + local_608);
        local_1c88._0_6_ = CONCAT24(sStack_5f4 + sStack_604,(undefined4)local_1c88);
        local_1c88 = CONCAT26(sStack_5f2 + sStack_602,(undefined6)local_1c88);
        uStack_1c80._0_4_ = CONCAT22(sStack_5ee + sStack_5fe,sStack_5f0 + sStack_600);
        uStack_1c80._0_6_ = CONCAT24(sStack_5ec + sStack_5fc,(undefined4)uStack_1c80);
        uStack_1c80 = CONCAT26(sStack_5ea + sStack_5fa,(undefined6)uStack_1c80);
        uVar15 = CONCAT13(cStack_1b35,CONCAT12(uStack_1b36,CONCAT11(cStack_1b37,local_1b38)));
        uVar16 = CONCAT15(cStack_1b33,CONCAT14(uStack_1b34,uVar15));
        uVar17 = CONCAT17(cStack_1b31,CONCAT16(uStack_1b32,uVar16));
        uVar19 = CONCAT13(cStack_1b2d,CONCAT12(uStack_1b2e,CONCAT11(cStack_1b2f,uStack_1b30)));
        uVar20 = CONCAT15(cStack_1b2b,CONCAT14(uStack_1b2c,uVar19));
        uVar21 = CONCAT17(cStack_1b29,CONCAT16(uStack_1b2a,uVar20));
        uVar3 = CONCAT13(cStack_1b45,CONCAT12(uStack_1b46,CONCAT11(cStack_1b47,local_1b48)));
        uVar4 = CONCAT15(cStack_1b43,CONCAT14(uStack_1b44,uVar3));
        uVar11 = CONCAT17(cStack_1b41,CONCAT16(uStack_1b42,uVar4));
        uVar6 = CONCAT13(cStack_1b3d,CONCAT12(uStack_1b3e,CONCAT11(cStack_1b3f,uStack_1b40)));
        uVar7 = CONCAT15(cStack_1b3b,CONCAT14(uStack_1b3c,uVar6));
        uVar13 = CONCAT17(cStack_1b39,CONCAT16(uStack_1b3a,uVar7));
        local_618._2_2_ = (short)((uint)uVar15 >> 0x10);
        local_618._4_2_ = (short)((uint6)uVar16 >> 0x20);
        local_618._6_2_ = (short)((ulong)uVar17 >> 0x30);
        uStack_610._2_2_ = (short)((uint)uVar19 >> 0x10);
        uStack_610._4_2_ = (short)((uint6)uVar20 >> 0x20);
        uStack_610._6_2_ = (short)((ulong)uVar21 >> 0x30);
        local_628._2_2_ = (short)((uint)uVar3 >> 0x10);
        local_628._4_2_ = (short)((uint6)uVar4 >> 0x20);
        local_628._6_2_ = (short)((ulong)uVar11 >> 0x30);
        uStack_620._2_2_ = (short)((uint)uVar6 >> 0x10);
        uStack_620._4_2_ = (short)((uint6)uVar7 >> 0x20);
        uStack_620._6_2_ = (short)((ulong)uVar13 >> 0x30);
        local_638 = CONCAT11(cStack_1b37,local_1b38) + CONCAT11(cStack_1b47,local_1b48);
        sStack_636 = local_618._2_2_ + local_628._2_2_;
        sStack_634 = local_618._4_2_ + local_628._4_2_;
        sStack_632 = local_618._6_2_ + local_628._6_2_;
        sStack_630 = CONCAT11(cStack_1b2f,uStack_1b30) + CONCAT11(cStack_1b3f,uStack_1b40);
        sStack_62e = uStack_610._2_2_ + uStack_620._2_2_;
        sStack_62c = uStack_610._4_2_ + uStack_620._4_2_;
        sStack_62a = uStack_610._6_2_ + uStack_620._6_2_;
        local_648 = local_1c88;
        lStack_640 = uStack_1c80;
        sVar112 = local_638 + local_5f8 + local_608;
        sVar118 = sStack_636 + sStack_5f6 + sStack_606;
        sVar121 = sStack_634 + sStack_5f4 + sStack_604;
        sVar124 = sStack_632 + sStack_5f2 + sStack_602;
        sVar127 = sStack_630 + sStack_5f0 + sStack_600;
        sVar132 = sStack_62e + sStack_5ee + sStack_5fe;
        sVar135 = sStack_62c + sStack_5ec + sStack_5fc;
        sVar138 = sStack_62a + sStack_5ea + sStack_5fa;
        local_1c88._0_4_ = CONCAT22(sVar118,sVar112);
        local_1c88._0_6_ = CONCAT24(sVar121,(undefined4)local_1c88);
        local_1c88 = CONCAT26(sVar124,(undefined6)local_1c88);
        uStack_1c80._0_4_ = CONCAT22(sVar132,sVar127);
        uStack_1c80._0_6_ = CONCAT24(sVar135,(undefined4)uStack_1c80);
        uStack_1c80 = CONCAT26(sVar138,(undefined6)uStack_1c80);
        local_658 = local_1c88;
        lStack_650 = uStack_1c80;
        local_1c88._0_4_ = CONCAT22(sVar118 + 8,sVar112 + 8);
        local_1c88._0_6_ = CONCAT24(sVar121 + 8,(undefined4)local_1c88);
        local_1c88 = CONCAT26(sVar124 + 8,(undefined6)local_1c88);
        uStack_1c80._0_4_ = CONCAT22(sVar132 + 8,sVar127 + 8);
        uStack_1c80._0_6_ = CONCAT24(sVar135 + 8,(undefined4)uStack_1c80);
        uStack_1c80 = CONCAT26(sVar138 + 8,(undefined6)uStack_1c80);
        local_16f8 = uVar34;
        local_16d8 = lVar87;
        local_16b8 = lVar88;
        local_1698 = lVar89;
        local_1678 = lVar90;
        local_1658 = uVar35;
        local_11e8 = uVar97;
        uStack_11e0 = uVar98;
        local_11d8 = uVar110;
        uStack_11d0 = uVar113;
        uStack_810 = uVar36;
        uStack_7f0 = lVar91;
        uStack_7d0 = lVar92;
        uStack_7b0 = lVar95;
        uStack_790 = lVar96;
        uStack_770 = uVar37;
        local_668 = local_1ba8;
        uStack_660 = uStack_1ba0;
        local_628 = uVar11;
        uStack_620 = uVar13;
        local_618 = uVar17;
        uStack_610 = uVar21;
        local_5e8 = uVar10;
        uStack_5e0 = uVar12;
        local_5d8 = uVar14;
        uStack_5d0 = uVar18;
        local_5b8 = uVar22;
        uStack_5b0 = uVar23;
        local_568 = local_1ba8;
        uStack_560 = uStack_1ba0;
        local_528 = uVar24;
        uStack_520 = uVar25;
        local_518 = uVar26;
        uStack_510 = uVar27;
        local_4e8 = uVar28;
        uStack_4e0 = uVar29;
        local_4d8 = uVar30;
        uStack_4d0 = uVar31;
        local_4b8 = uVar32;
        uStack_4b0 = uVar33;
        local_268 = uVar2;
        uStack_260 = uVar5;
        local_248 = uVar8;
        uStack_240 = uVar9;
        local_28 = local_1ba8;
        uStack_20 = uStack_1ba0;
        filter16_mask((__m128i *)&local_17d8,(__m128i *)&local_17f8,(__m128i *)&local_1c78,
                      (__m128i *)&local_1c88);
        local_1200 = (undefined8 *)((long)local_1720 - (long)(local_1724 * 6));
        *local_1200 = extraout_XMM0_Qa_23;
        local_1200[1] = extraout_XMM0_Qb_23;
        filter_add2_sub2((__m128i *)&local_1c78,(__m128i *)&local_1ad8,(__m128i *)&local_1a88,
                         (__m128i *)&local_1bb8,(__m128i *)&local_1bb8);
        filter_add2_sub2((__m128i *)&local_1c88,(__m128i *)&local_1b58,(__m128i *)&local_1b08,
                         (__m128i *)&local_1c18,(__m128i *)&local_1c18);
        filter16_mask((__m128i *)&local_17d8,(__m128i *)&local_1808,(__m128i *)&local_1c78,
                      (__m128i *)&local_1c88);
        local_1220 = (undefined8 *)((long)local_1720 - (long)(local_1724 * 5));
        *local_1220 = extraout_XMM0_Qa_24;
        local_1220[1] = extraout_XMM0_Qb_24;
        filter_add2_sub2((__m128i *)&local_1c78,(__m128i *)&local_1ae8,(__m128i *)&local_1a98,
                         (__m128i *)&local_1bb8,(__m128i *)&local_1bc8);
        filter_add2_sub2((__m128i *)&local_1c88,(__m128i *)&local_1b68,(__m128i *)&local_1b18,
                         (__m128i *)&local_1c18,(__m128i *)&local_1c28);
        filter16_mask((__m128i *)&local_17d8,(__m128i *)&local_1818,(__m128i *)&local_1c78,
                      (__m128i *)&local_1c88);
        local_1240 = (undefined8 *)((long)local_1720 - (long)(local_1724 << 2));
        *local_1240 = extraout_XMM0_Qa_25;
        local_1240[1] = extraout_XMM0_Qb_25;
        filter_add2_sub2((__m128i *)&local_1c78,(__m128i *)&local_1af8,(__m128i *)&local_1aa8,
                         (__m128i *)&local_1bb8,(__m128i *)&local_1bd8);
        filter_add2_sub2((__m128i *)&local_1c88,(__m128i *)&local_1b78,(__m128i *)&local_1b28,
                         (__m128i *)&local_1c18,(__m128i *)&local_1c38);
        filter16_mask((__m128i *)&local_17d8,(__m128i *)&local_18c8,(__m128i *)&local_1c78,
                      (__m128i *)&local_1c88);
        local_1260 = (undefined8 *)((long)local_1720 - (long)(local_1724 * 3));
        *local_1260 = extraout_XMM0_Qa_26;
        local_1260[1] = extraout_XMM0_Qb_26;
        filter_add2_sub2((__m128i *)&local_1c78,(__m128i *)&local_1be8,(__m128i *)&local_1ab8,
                         (__m128i *)&local_1bb8,(__m128i *)&local_1a88);
        filter_add2_sub2((__m128i *)&local_1c88,(__m128i *)&local_1c48,(__m128i *)&local_1b38,
                         (__m128i *)&local_1c18,(__m128i *)&local_1b08);
        filter16_mask((__m128i *)&local_17d8,(__m128i *)&local_18d8,(__m128i *)&local_1c78,
                      (__m128i *)&local_1c88);
        local_1280 = (undefined8 *)((long)local_1720 - (long)(local_1724 << 1));
        *local_1280 = extraout_XMM0_Qa_27;
        local_1280[1] = extraout_XMM0_Qb_27;
        filter_add2_sub2((__m128i *)&local_1c78,(__m128i *)&local_1bf8,(__m128i *)&local_1ac8,
                         (__m128i *)&local_1bb8,(__m128i *)&local_1a98);
        filter_add2_sub2((__m128i *)&local_1c88,(__m128i *)&local_1c58,(__m128i *)&local_1b48,
                         (__m128i *)&local_1c18,(__m128i *)&local_1b18);
        filter16_mask((__m128i *)&local_17d8,(__m128i *)&local_18e8,(__m128i *)&local_1c78,
                      (__m128i *)&local_1c88);
        local_12a0 = (undefined8 *)((long)local_1720 - (long)local_1724);
        *local_12a0 = extraout_XMM0_Qa_28;
        local_12a0[1] = extraout_XMM0_Qb_28;
        filter_add2_sub2((__m128i *)&local_1c78,(__m128i *)&local_1c08,(__m128i *)&local_1ad8,
                         (__m128i *)&local_1bb8,(__m128i *)&local_1aa8);
        filter_add2_sub2((__m128i *)&local_1c88,(__m128i *)&local_1c68,(__m128i *)&local_1b58,
                         (__m128i *)&local_1c18,(__m128i *)&local_1b28);
        filter16_mask((__m128i *)&local_17d8,(__m128i *)&local_18f8,(__m128i *)&local_1c78,
                      (__m128i *)&local_1c88);
        local_12c0 = local_1720;
        *local_1720 = extraout_XMM0_Qa_29;
        local_1720[1] = extraout_XMM0_Qb_29;
        filter_add2_sub2((__m128i *)&local_1c78,(__m128i *)&local_1c08,(__m128i *)&local_1ae8,
                         (__m128i *)&local_1bc8,(__m128i *)&local_1ab8);
        filter_add2_sub2((__m128i *)&local_1c88,(__m128i *)&local_1c68,(__m128i *)&local_1b68,
                         (__m128i *)&local_1c28,(__m128i *)&local_1b38);
        filter16_mask((__m128i *)&local_17d8,(__m128i *)&local_1908,(__m128i *)&local_1c78,
                      (__m128i *)&local_1c88);
        local_12e0 = (undefined8 *)((long)local_1720 + (long)local_1724);
        *local_12e0 = extraout_XMM0_Qa_30;
        local_12e0[1] = extraout_XMM0_Qb_30;
        filter_add2_sub2((__m128i *)&local_1c78,(__m128i *)&local_1c08,(__m128i *)&local_1af8,
                         (__m128i *)&local_1bd8,(__m128i *)&local_1ac8);
        filter_add2_sub2((__m128i *)&local_1c88,(__m128i *)&local_1c68,(__m128i *)&local_1b78,
                         (__m128i *)&local_1c38,(__m128i *)&local_1b48);
        filter16_mask((__m128i *)&local_17d8,&local_1918,(__m128i *)&local_1c78,
                      (__m128i *)&local_1c88);
        local_1300 = (undefined8 *)((long)local_1720 + (long)(local_1724 << 1));
        *local_1300 = extraout_XMM0_Qa_31;
        local_1300[1] = extraout_XMM0_Qb_31;
        filter_add2_sub2((__m128i *)&local_1c78,(__m128i *)&local_1c08,(__m128i *)&local_1be8,
                         (__m128i *)&local_1a88,(__m128i *)&local_1ad8);
        filter_add2_sub2((__m128i *)&local_1c88,(__m128i *)&local_1c68,(__m128i *)&local_1c48,
                         (__m128i *)&local_1b08,(__m128i *)&local_1b58);
        filter16_mask((__m128i *)&local_17d8,(__m128i *)&local_1888,(__m128i *)&local_1c78,
                      (__m128i *)&local_1c88);
        local_1320 = (undefined8 *)((long)local_1720 + (long)(local_1724 * 3));
        *local_1320 = extraout_XMM0_Qa_32;
        local_1320[1] = extraout_XMM0_Qb_32;
        filter_add2_sub2((__m128i *)&local_1c78,(__m128i *)&local_1c08,(__m128i *)&local_1bf8,
                         (__m128i *)&local_1a98,(__m128i *)&local_1ae8);
        filter_add2_sub2((__m128i *)&local_1c88,(__m128i *)&local_1c68,(__m128i *)&local_1c58,
                         (__m128i *)&local_1b18,(__m128i *)&local_1b68);
        filter16_mask((__m128i *)&local_17d8,(__m128i *)&local_1898,(__m128i *)&local_1c78,
                      (__m128i *)&local_1c88);
        local_1340 = (undefined8 *)((long)local_1720 + (long)(local_1724 << 2));
        *local_1340 = extraout_XMM0_Qa_33;
        local_1340[1] = extraout_XMM0_Qb_33;
        filter_add2_sub2((__m128i *)&local_1c78,(__m128i *)&local_1c08,(__m128i *)&local_1c08,
                         (__m128i *)&local_1aa8,(__m128i *)&local_1af8);
        filter_add2_sub2((__m128i *)&local_1c88,(__m128i *)&local_1c68,(__m128i *)&local_1c68,
                         (__m128i *)&local_1b28,(__m128i *)&local_1b78);
        filter16_mask((__m128i *)&local_17d8,(__m128i *)&local_18b8,(__m128i *)&local_1c78,
                      (__m128i *)&local_1c88);
        puVar107 = (undefined8 *)((long)local_1720 + (long)(local_1724 * 5));
        *puVar107 = extraout_XMM0_Qa_34;
        puVar107[1] = extraout_XMM0_Qb_34;
      }
    }
  }
  return;
}

Assistant:

void aom_lpf_horizontal_14_quad_sse2(unsigned char *s, int p,
                                     const unsigned char *_blimit0,
                                     const unsigned char *_limit0,
                                     const unsigned char *_thresh0) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi8(1);
  const __m128i blimit_v = _mm_load_si128((const __m128i *)_blimit0);
  const __m128i limit_v = _mm_load_si128((const __m128i *)_limit0);
  const __m128i thresh_v = _mm_load_si128((const __m128i *)_thresh0);
  __m128i mask, hev, flat, flat2;
  __m128i p6, p5;
  __m128i p4, p3, p2, p1, p0, q0, q1, q2, q3, q4;
  __m128i q6, q5;

  __m128i op2, op1, op0, oq0, oq1, oq2;

  __m128i max_abs_p1p0q1q0;

  p6 = _mm_loadu_si128((__m128i *)(s - 7 * p));
  p5 = _mm_loadu_si128((__m128i *)(s - 6 * p));
  p4 = _mm_loadu_si128((__m128i *)(s - 5 * p));
  p3 = _mm_loadu_si128((__m128i *)(s - 4 * p));
  p2 = _mm_loadu_si128((__m128i *)(s - 3 * p));
  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s - 0 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  q2 = _mm_loadu_si128((__m128i *)(s + 2 * p));
  q3 = _mm_loadu_si128((__m128i *)(s + 3 * p));
  q4 = _mm_loadu_si128((__m128i *)(s + 4 * p));
  q5 = _mm_loadu_si128((__m128i *)(s + 5 * p));
  q6 = _mm_loadu_si128((__m128i *)(s + 6 * p));

  {
    const __m128i abs_p1p0 = abs_diff(p1, p0);
    const __m128i abs_q1q0 = abs_diff(q1, q0);
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i ff = _mm_cmpeq_epi8(zero, zero);
    __m128i abs_p0q0 = abs_diff(p0, q0);
    __m128i abs_p1q1 = abs_diff(p1, q1);
    __m128i work;
    max_abs_p1p0q1q0 = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(max_abs_p1p0q1q0, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    work = _mm_max_epu8(abs_diff(p2, p1), abs_diff(p3, p2));
    mask = _mm_max_epu8(work, mask);
    work = _mm_max_epu8(abs_diff(q2, q1), abs_diff(q3, q2));
    mask = _mm_max_epu8(work, mask);
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  {
    __m128i work;
    work = _mm_max_epu8(abs_diff(p2, p0), abs_diff(q2, q0));
    flat = _mm_max_epu8(work, max_abs_p1p0q1q0);
    work = _mm_max_epu8(abs_diff(p3, p0), abs_diff(q3, q0));
    flat = _mm_max_epu8(work, flat);
    work = _mm_max_epu8(abs_diff(p4, p0), abs_diff(q4, q0));
    flat = _mm_subs_epu8(flat, one);
    flat = _mm_cmpeq_epi8(flat, zero);
    flat = _mm_and_si128(flat, mask);
    flat2 = _mm_max_epu8(abs_diff(p5, p0), abs_diff(q5, q0));
    flat2 = _mm_max_epu8(work, flat2);
    work = _mm_max_epu8(abs_diff(p6, p0), abs_diff(q6, q0));
    flat2 = _mm_max_epu8(work, flat2);
    flat2 = _mm_subs_epu8(flat2, one);
    flat2 = _mm_cmpeq_epi8(flat2, zero);
    flat2 = _mm_and_si128(flat2, flat);  // flat2 & flat & mask
  }

  // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
  // filter4
  {
    const __m128i t4 = _mm_set1_epi8(4);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t1 = _mm_set1_epi8(0x1);
    const __m128i t7f = _mm_set1_epi8(0x7f);
    const __m128i ff = _mm_cmpeq_epi8(t4, t4);

    __m128i filt;
    __m128i work_a;
    __m128i filter1, filter2;

    op1 = _mm_xor_si128(p1, t80);
    op0 = _mm_xor_si128(p0, t80);
    oq0 = _mm_xor_si128(q0, t80);
    oq1 = _mm_xor_si128(q1, t80);

    hev = _mm_subs_epu8(max_abs_p1p0q1q0, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);
    filt = _mm_and_si128(_mm_subs_epi8(op1, oq1), hev);

    work_a = _mm_subs_epi8(oq0, op0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);
    filter1 = _mm_adds_epi8(filt, t4);
    filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    oq0 = _mm_xor_si128(_mm_subs_epi8(oq0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    op0 = _mm_xor_si128(_mm_adds_epi8(op0, filter2), t80);

    filt = _mm_adds_epi8(filter1, t1);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    op1 = _mm_xor_si128(_mm_adds_epi8(op1, filt), t80);
    oq1 = _mm_xor_si128(_mm_subs_epi8(oq1, filt), t80);

    // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
    // filter8
    if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat, zero))) {
      const __m128i four = _mm_set1_epi16(4);
      const __m128i p3_lo = _mm_unpacklo_epi8(p3, zero);
      const __m128i p2_lo = _mm_unpacklo_epi8(p2, zero);
      const __m128i p1_lo = _mm_unpacklo_epi8(p1, zero);
      const __m128i p0_lo = _mm_unpacklo_epi8(p0, zero);
      const __m128i q0_lo = _mm_unpacklo_epi8(q0, zero);
      const __m128i q1_lo = _mm_unpacklo_epi8(q1, zero);
      const __m128i q2_lo = _mm_unpacklo_epi8(q2, zero);
      const __m128i q3_lo = _mm_unpacklo_epi8(q3, zero);

      const __m128i p3_hi = _mm_unpackhi_epi8(p3, zero);
      const __m128i p2_hi = _mm_unpackhi_epi8(p2, zero);
      const __m128i p1_hi = _mm_unpackhi_epi8(p1, zero);
      const __m128i p0_hi = _mm_unpackhi_epi8(p0, zero);
      const __m128i q0_hi = _mm_unpackhi_epi8(q0, zero);
      const __m128i q1_hi = _mm_unpackhi_epi8(q1, zero);
      const __m128i q2_hi = _mm_unpackhi_epi8(q2, zero);
      const __m128i q3_hi = _mm_unpackhi_epi8(q3, zero);
      __m128i f8_lo, f8_hi;

      f8_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, four),
                            _mm_add_epi16(p3_lo, p2_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, f8_lo),
                            _mm_add_epi16(p2_lo, p1_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p0_lo, q0_lo), f8_lo);

      f8_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, four),
                            _mm_add_epi16(p3_hi, p2_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, f8_hi),
                            _mm_add_epi16(p2_hi, p1_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p0_hi, q0_hi), f8_hi);

      op2 = filter8_mask(&flat, &p2, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q1_lo, &p1_lo, &p2_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q1_hi, &p1_hi, &p2_hi, &p3_hi);
      op1 = filter8_mask(&flat, &op1, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q2_lo, &p0_lo, &p1_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q2_hi, &p0_hi, &p1_hi, &p3_hi);
      op0 = filter8_mask(&flat, &op0, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q0_lo, &p0_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q0_hi, &p0_hi, &p3_hi);
      oq0 = filter8_mask(&flat, &oq0, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q1_lo, &q0_lo, &p2_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q1_hi, &q0_hi, &p2_hi);
      oq1 = filter8_mask(&flat, &oq1, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q2_lo, &q1_lo, &p1_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q2_hi, &q1_hi, &p1_hi);
      oq2 = filter8_mask(&flat, &q2, &f8_lo, &f8_hi);

      // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
      // wide flat calculations
      if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat2, zero))) {
        const __m128i eight = _mm_set1_epi16(8);
        const __m128i p6_lo = _mm_unpacklo_epi8(p6, zero);
        const __m128i p5_lo = _mm_unpacklo_epi8(p5, zero);
        const __m128i p4_lo = _mm_unpacklo_epi8(p4, zero);
        const __m128i q4_lo = _mm_unpacklo_epi8(q4, zero);
        const __m128i q5_lo = _mm_unpacklo_epi8(q5, zero);
        const __m128i q6_lo = _mm_unpacklo_epi8(q6, zero);

        const __m128i p6_hi = _mm_unpackhi_epi8(p6, zero);
        const __m128i p5_hi = _mm_unpackhi_epi8(p5, zero);
        const __m128i p4_hi = _mm_unpackhi_epi8(p4, zero);
        const __m128i q4_hi = _mm_unpackhi_epi8(q4, zero);
        const __m128i q5_hi = _mm_unpackhi_epi8(q5, zero);
        const __m128i q6_hi = _mm_unpackhi_epi8(q6, zero);

        __m128i f_lo;
        __m128i f_hi;

        f_lo = _mm_sub_epi16(_mm_slli_epi16(p6_lo, 3), p6_lo);
        f_lo = _mm_add_epi16(_mm_slli_epi16(p5_lo, 1), f_lo);
        f_lo = _mm_add_epi16(_mm_slli_epi16(p4_lo, 1), f_lo);
        f_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, f_lo),
                             _mm_add_epi16(p2_lo, p1_lo));
        f_lo = _mm_add_epi16(_mm_add_epi16(p0_lo, q0_lo), f_lo);
        f_lo = _mm_add_epi16(f_lo, eight);

        f_hi = _mm_sub_epi16(_mm_slli_epi16(p6_hi, 3), p6_hi);
        f_hi = _mm_add_epi16(_mm_slli_epi16(p5_hi, 1), f_hi);
        f_hi = _mm_add_epi16(_mm_slli_epi16(p4_hi, 1), f_hi);
        f_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, f_hi),
                             _mm_add_epi16(p2_hi, p1_hi));
        f_hi = _mm_add_epi16(_mm_add_epi16(p0_hi, q0_hi), f_hi);
        f_hi = _mm_add_epi16(f_hi, eight);

        p5 = filter16_mask(&flat2, &p5, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 6 * p), p5);

        f_lo = filter_add2_sub2(&f_lo, &q1_lo, &p3_lo, &p6_lo, &p6_lo);
        f_hi = filter_add2_sub2(&f_hi, &q1_hi, &p3_hi, &p6_hi, &p6_hi);
        p4 = filter16_mask(&flat2, &p4, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 5 * p), p4);

        f_lo = filter_add2_sub2(&f_lo, &q2_lo, &p2_lo, &p6_lo, &p5_lo);
        f_hi = filter_add2_sub2(&f_hi, &q2_hi, &p2_hi, &p6_hi, &p5_hi);
        p3 = filter16_mask(&flat2, &p3, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 4 * p), p3);

        f_lo = filter_add2_sub2(&f_lo, &q3_lo, &p1_lo, &p6_lo, &p4_lo);
        f_hi = filter_add2_sub2(&f_hi, &q3_hi, &p1_hi, &p6_hi, &p4_hi);
        op2 = filter16_mask(&flat2, &op2, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 3 * p), op2);

        f_lo = filter_add2_sub2(&f_lo, &q4_lo, &p0_lo, &p6_lo, &p3_lo);
        f_hi = filter_add2_sub2(&f_hi, &q4_hi, &p0_hi, &p6_hi, &p3_hi);
        op1 = filter16_mask(&flat2, &op1, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 2 * p), op1);

        f_lo = filter_add2_sub2(&f_lo, &q5_lo, &q0_lo, &p6_lo, &p2_lo);
        f_hi = filter_add2_sub2(&f_hi, &q5_hi, &q0_hi, &p6_hi, &p2_hi);
        op0 = filter16_mask(&flat2, &op0, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 1 * p), op0);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q1_lo, &p6_lo, &p1_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q1_hi, &p6_hi, &p1_hi);
        oq0 = filter16_mask(&flat2, &oq0, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q2_lo, &p5_lo, &p0_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q2_hi, &p5_hi, &p0_hi);
        oq1 = filter16_mask(&flat2, &oq1, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q3_lo, &p4_lo, &q0_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q3_hi, &p4_hi, &q0_hi);
        oq2 = filter16_mask(&flat2, &oq2, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 2 * p), oq2);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q4_lo, &p3_lo, &q1_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q4_hi, &p3_hi, &q1_hi);
        q3 = filter16_mask(&flat2, &q3, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 3 * p), q3);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q5_lo, &p2_lo, &q2_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q5_hi, &p2_hi, &q2_hi);
        q4 = filter16_mask(&flat2, &q4, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 4 * p), q4);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q6_lo, &p1_lo, &q3_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q6_hi, &p1_hi, &q3_hi);
        q5 = filter16_mask(&flat2, &q5, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 5 * p), q5);
      } else {
        _mm_storeu_si128((__m128i *)(s - 3 * p), op2);
        _mm_storeu_si128((__m128i *)(s - 2 * p), op1);
        _mm_storeu_si128((__m128i *)(s - 1 * p), op0);
        _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);
        _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);
        _mm_storeu_si128((__m128i *)(s + 2 * p), oq2);
      }
    } else {
      _mm_storeu_si128((__m128i *)(s - 2 * p), op1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), op0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);
    }
  }
}